

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

int secp256k1_ge_set_xquad(secp256k1_ge *r,secp256k1_fe *x)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [16];
  undefined1 auVar559 [16];
  undefined1 auVar560 [16];
  undefined1 auVar561 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  undefined1 auVar567 [16];
  undefined1 auVar568 [16];
  undefined1 auVar569 [16];
  undefined1 auVar570 [16];
  undefined1 auVar571 [16];
  undefined1 auVar572 [16];
  undefined1 auVar573 [16];
  undefined1 auVar574 [16];
  undefined1 auVar575 [16];
  undefined1 auVar576 [16];
  undefined1 auVar577 [16];
  undefined1 auVar578 [16];
  undefined1 auVar579 [16];
  undefined1 auVar580 [16];
  undefined1 auVar581 [16];
  undefined1 auVar582 [16];
  undefined1 auVar583 [16];
  undefined1 auVar584 [16];
  undefined1 auVar585 [16];
  undefined1 auVar586 [16];
  undefined1 auVar587 [16];
  undefined1 auVar588 [16];
  undefined1 auVar589 [16];
  undefined1 auVar590 [16];
  undefined1 auVar591 [16];
  undefined1 auVar592 [16];
  undefined1 auVar593 [16];
  undefined1 auVar594 [16];
  undefined1 auVar595 [16];
  undefined1 auVar596 [16];
  undefined1 auVar597 [16];
  undefined1 auVar598 [16];
  undefined1 auVar599 [16];
  undefined1 auVar600 [16];
  undefined1 auVar601 [16];
  undefined1 auVar602 [16];
  undefined1 auVar603 [16];
  undefined1 auVar604 [16];
  undefined1 auVar605 [16];
  undefined1 auVar606 [16];
  undefined1 auVar607 [16];
  undefined1 auVar608 [16];
  undefined1 auVar609 [16];
  undefined1 auVar610 [16];
  undefined1 auVar611 [16];
  undefined1 auVar612 [16];
  undefined1 auVar613 [16];
  undefined1 auVar614 [16];
  undefined1 auVar615 [16];
  undefined1 auVar616 [16];
  undefined1 auVar617 [16];
  undefined1 auVar618 [16];
  undefined1 auVar619 [16];
  undefined1 auVar620 [16];
  undefined1 auVar621 [16];
  undefined1 auVar622 [16];
  undefined1 auVar623 [16];
  undefined1 auVar624 [16];
  undefined1 auVar625 [16];
  undefined1 auVar626 [16];
  undefined1 auVar627 [16];
  undefined1 auVar628 [16];
  undefined1 auVar629 [16];
  undefined1 auVar630 [16];
  undefined1 auVar631 [16];
  undefined1 auVar632 [16];
  undefined1 auVar633 [16];
  undefined1 auVar634 [16];
  undefined1 auVar635 [16];
  undefined1 auVar636 [16];
  undefined1 auVar637 [16];
  undefined1 auVar638 [16];
  undefined1 auVar639 [16];
  undefined1 auVar640 [16];
  undefined1 auVar641 [16];
  undefined1 auVar642 [16];
  undefined1 auVar643 [16];
  undefined1 auVar644 [16];
  undefined1 auVar645 [16];
  undefined1 auVar646 [16];
  undefined1 auVar647 [16];
  undefined1 auVar648 [16];
  undefined1 auVar649 [16];
  undefined1 auVar650 [16];
  undefined1 auVar651 [16];
  undefined1 auVar652 [16];
  undefined1 auVar653 [16];
  undefined1 auVar654 [16];
  undefined1 auVar655 [16];
  undefined1 auVar656 [16];
  undefined1 auVar657 [16];
  undefined1 auVar658 [16];
  undefined1 auVar659 [16];
  undefined1 auVar660 [16];
  undefined1 auVar661 [16];
  undefined1 auVar662 [16];
  undefined1 auVar663 [16];
  undefined1 auVar664 [16];
  undefined1 auVar665 [16];
  undefined1 auVar666 [16];
  undefined1 auVar667 [16];
  undefined1 auVar668 [16];
  undefined1 auVar669 [16];
  undefined1 auVar670 [16];
  undefined1 auVar671 [16];
  undefined1 auVar672 [16];
  undefined1 auVar673 [16];
  undefined1 auVar674 [16];
  undefined1 auVar675 [16];
  undefined1 auVar676 [16];
  undefined1 auVar677 [16];
  undefined1 auVar678 [16];
  undefined1 auVar679 [16];
  undefined1 auVar680 [16];
  undefined1 auVar681 [16];
  undefined1 auVar682 [16];
  undefined1 auVar683 [16];
  undefined1 auVar684 [16];
  undefined1 auVar685 [16];
  undefined1 auVar686 [16];
  undefined1 auVar687 [16];
  undefined1 auVar688 [16];
  undefined1 auVar689 [16];
  undefined1 auVar690 [16];
  undefined1 auVar691 [16];
  undefined1 auVar692 [16];
  undefined1 auVar693 [16];
  undefined1 auVar694 [16];
  undefined1 auVar695 [16];
  undefined1 auVar696 [16];
  undefined1 auVar697 [16];
  undefined1 auVar698 [16];
  undefined1 auVar699 [16];
  undefined1 auVar700 [16];
  undefined1 auVar701 [16];
  undefined1 auVar702 [16];
  undefined1 auVar703 [16];
  undefined1 auVar704 [16];
  undefined1 auVar705 [16];
  undefined1 auVar706 [16];
  undefined1 auVar707 [16];
  undefined1 auVar708 [16];
  undefined1 auVar709 [16];
  undefined1 auVar710 [16];
  undefined1 auVar711 [16];
  undefined1 auVar712 [16];
  undefined1 auVar713 [16];
  undefined1 auVar714 [16];
  undefined1 auVar715 [16];
  undefined1 auVar716 [16];
  undefined1 auVar717 [16];
  undefined1 auVar718 [16];
  undefined1 auVar719 [16];
  undefined1 auVar720 [16];
  undefined1 auVar721 [16];
  undefined1 auVar722 [16];
  undefined1 auVar723 [16];
  undefined1 auVar724 [16];
  undefined1 auVar725 [16];
  undefined1 auVar726 [16];
  undefined1 auVar727 [16];
  undefined1 auVar728 [16];
  undefined1 auVar729 [16];
  undefined1 auVar730 [16];
  undefined1 auVar731 [16];
  undefined1 auVar732 [16];
  undefined1 auVar733 [16];
  undefined1 auVar734 [16];
  undefined1 auVar735 [16];
  undefined1 auVar736 [16];
  undefined1 auVar737 [16];
  undefined1 auVar738 [16];
  undefined1 auVar739 [16];
  undefined1 auVar740 [16];
  undefined1 auVar741 [16];
  undefined1 auVar742 [16];
  undefined1 auVar743 [16];
  undefined1 auVar744 [16];
  undefined1 auVar745 [16];
  undefined1 auVar746 [16];
  undefined1 auVar747 [16];
  undefined1 auVar748 [16];
  undefined1 auVar749 [16];
  undefined1 auVar750 [16];
  undefined1 auVar751 [16];
  undefined1 auVar752 [16];
  undefined1 auVar753 [16];
  undefined1 auVar754 [16];
  undefined1 auVar755 [16];
  undefined1 auVar756 [16];
  undefined1 auVar757 [16];
  undefined1 auVar758 [16];
  undefined1 auVar759 [16];
  undefined1 auVar760 [16];
  undefined1 auVar761 [16];
  undefined1 auVar762 [16];
  undefined1 auVar763 [16];
  undefined1 auVar764 [16];
  undefined1 auVar765 [16];
  undefined1 auVar766 [16];
  undefined1 auVar767 [16];
  undefined1 auVar768 [16];
  undefined1 auVar769 [16];
  undefined1 auVar770 [16];
  undefined1 auVar771 [16];
  undefined1 auVar772 [16];
  undefined1 auVar773 [16];
  undefined1 auVar774 [16];
  undefined1 auVar775 [16];
  undefined1 auVar776 [16];
  undefined1 auVar777 [16];
  undefined1 auVar778 [16];
  undefined1 auVar779 [16];
  undefined1 auVar780 [16];
  undefined1 auVar781 [16];
  undefined1 auVar782 [16];
  undefined1 auVar783 [16];
  undefined1 auVar784 [16];
  undefined1 auVar785 [16];
  undefined1 auVar786 [16];
  undefined1 auVar787 [16];
  undefined1 auVar788 [16];
  undefined1 auVar789 [16];
  undefined1 auVar790 [16];
  undefined1 auVar791 [16];
  undefined1 auVar792 [16];
  undefined1 auVar793 [16];
  undefined1 auVar794 [16];
  undefined1 auVar795 [16];
  undefined1 auVar796 [16];
  undefined1 auVar797 [16];
  undefined1 auVar798 [16];
  undefined1 auVar799 [16];
  undefined1 auVar800 [16];
  undefined1 auVar801 [16];
  undefined1 auVar802 [16];
  undefined1 auVar803 [16];
  undefined1 auVar804 [16];
  undefined1 auVar805 [16];
  undefined1 auVar806 [16];
  undefined1 auVar807 [16];
  undefined1 auVar808 [16];
  undefined1 auVar809 [16];
  undefined1 auVar810 [16];
  undefined1 auVar811 [16];
  undefined1 auVar812 [16];
  undefined1 auVar813 [16];
  undefined1 auVar814 [16];
  undefined1 auVar815 [16];
  undefined1 auVar816 [16];
  undefined1 auVar817 [16];
  undefined1 auVar818 [16];
  undefined1 auVar819 [16];
  undefined1 auVar820 [16];
  undefined1 auVar821 [16];
  undefined1 auVar822 [16];
  undefined1 auVar823 [16];
  undefined1 auVar824 [16];
  undefined1 auVar825 [16];
  undefined1 auVar826 [16];
  undefined1 auVar827 [16];
  undefined1 auVar828 [16];
  undefined1 auVar829 [16];
  undefined1 auVar830 [16];
  undefined1 auVar831 [16];
  undefined1 auVar832 [16];
  undefined1 auVar833 [16];
  undefined1 auVar834 [16];
  undefined1 auVar835 [16];
  undefined1 auVar836 [16];
  undefined1 auVar837 [16];
  undefined1 auVar838 [16];
  undefined1 auVar839 [16];
  undefined1 auVar840 [16];
  undefined1 auVar841 [16];
  undefined1 auVar842 [16];
  undefined1 auVar843 [16];
  undefined1 auVar844 [16];
  undefined1 auVar845 [16];
  undefined1 auVar846 [16];
  undefined1 auVar847 [16];
  undefined1 auVar848 [16];
  undefined1 auVar849 [16];
  undefined1 auVar850 [16];
  undefined1 auVar851 [16];
  undefined1 auVar852 [16];
  undefined1 auVar853 [16];
  undefined1 auVar854 [16];
  undefined1 auVar855 [16];
  undefined1 auVar856 [16];
  undefined1 auVar857 [16];
  undefined1 auVar858 [16];
  undefined1 auVar859 [16];
  undefined1 auVar860 [16];
  undefined1 auVar861 [16];
  undefined1 auVar862 [16];
  undefined1 auVar863 [16];
  undefined1 auVar864 [16];
  undefined1 auVar865 [16];
  undefined1 auVar866 [16];
  undefined1 auVar867 [16];
  undefined1 auVar868 [16];
  undefined1 auVar869 [16];
  undefined1 auVar870 [16];
  undefined1 auVar871 [16];
  undefined1 auVar872 [16];
  undefined1 auVar873 [16];
  undefined1 auVar874 [16];
  undefined1 auVar875 [16];
  undefined1 auVar876 [16];
  undefined1 auVar877 [16];
  undefined1 auVar878 [16];
  undefined1 auVar879 [16];
  undefined1 auVar880 [16];
  undefined1 auVar881 [16];
  undefined1 auVar882 [16];
  undefined1 auVar883 [16];
  undefined1 auVar884 [16];
  undefined1 auVar885 [16];
  undefined1 auVar886 [16];
  undefined1 auVar887 [16];
  undefined1 auVar888 [16];
  undefined1 auVar889 [16];
  undefined1 auVar890 [16];
  undefined1 auVar891 [16];
  undefined1 auVar892 [16];
  undefined1 auVar893 [16];
  undefined1 auVar894 [16];
  undefined1 auVar895 [16];
  undefined1 auVar896 [16];
  undefined1 auVar897 [16];
  undefined1 auVar898 [16];
  undefined1 auVar899 [16];
  undefined1 auVar900 [16];
  undefined1 auVar901 [16];
  undefined1 auVar902 [16];
  undefined1 auVar903 [16];
  int iVar904;
  uint uVar905;
  uint uVar906;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  uint uVar907;
  int iVar908;
  int extraout_EAX_04;
  int extraout_EAX_05;
  int extraout_EAX_06;
  int extraout_EAX_07;
  int extraout_EAX_08;
  int extraout_EAX_09;
  int extraout_EAX_10;
  ulong uVar909;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  secp256k1_gej *psVar910;
  secp256k1_gej *psVar911;
  void *pvVar912;
  secp256k1_gej *in_RCX;
  secp256k1_gej *psVar913;
  secp256k1_gej *psVar914;
  uint extraout_EDX;
  secp256k1_gej *extraout_RDX;
  secp256k1_gej *extraout_RDX_00;
  ulong extraout_RDX_01;
  secp256k1_ge *a;
  uint64_t uVar915;
  ulong uVar916;
  ulong uVar917;
  ulong uVar918;
  secp256k1_gej *psVar919;
  long lVar920;
  ulong uVar921;
  char cVar922;
  uint uVar923;
  secp256k1_gej *psVar924;
  secp256k1_gej *psVar925;
  secp256k1_gej *a_00;
  undefined8 *puVar926;
  secp256k1_gej *psVar927;
  ulong uVar928;
  secp256k1_fe *psVar929;
  undefined8 *puVar930;
  uint64_t *puVar931;
  secp256k1_gej *in_R8;
  ulong uVar932;
  ulong uVar933;
  ulong uVar934;
  ulong uVar935;
  uint64_t *in_R9;
  ulong unaff_R12;
  uint64_t uVar936;
  long lVar937;
  ulong unaff_R13;
  secp256k1_gej *unaff_R14;
  secp256k1_gej *unaff_R15;
  uint64_t uVar938;
  bool bVar939;
  byte bVar940;
  undefined1 auVar941 [16];
  uint64_t tmp3;
  uint64_t tmp2;
  secp256k1_fe x3;
  secp256k1_fe x2;
  undefined1 auStack_c08 [56];
  uint64_t uStack_bd0;
  uint64_t uStack_bc8;
  uint64_t uStack_bc0;
  uint64_t uStack_bb8;
  int iStack_bb0;
  undefined1 auStack_ba8 [56];
  uint64_t uStack_b70;
  uint64_t uStack_b68;
  uint64_t uStack_b60;
  uint64_t uStack_b58;
  int iStack_b50;
  int iStack_b4c;
  ulong uStack_b48;
  secp256k1_gej *psStack_b40;
  undefined1 auStack_b38 [152];
  uint64_t uStack_aa0;
  uint64_t uStack_a98;
  uint64_t uStack_a90;
  ulong uStack_a88;
  undefined8 uStack_a80;
  secp256k1_fe sStack_a78;
  undefined1 auStack_a48 [56];
  ulong uStack_a10;
  ulong uStack_a08;
  ulong uStack_a00;
  uint64_t uStack_9f8;
  undefined8 uStack_9f0;
  secp256k1_gej *psStack_9e0;
  secp256k1_gej *psStack_9d8;
  secp256k1_gej *psStack_9d0;
  secp256k1_gej *psStack_9c8;
  secp256k1_gej *psStack_9c0;
  secp256k1_gej *psStack_9b8;
  secp256k1_gej *psStack_9a8;
  secp256k1_gej *psStack_9a0;
  int iStack_994;
  secp256k1_gej *psStack_990;
  undefined1 auStack_988 [48];
  secp256k1_gej *psStack_958;
  secp256k1_gej *psStack_950;
  secp256k1_gej *psStack_948;
  secp256k1_gej *psStack_940;
  secp256k1_gej *psStack_938;
  bool bStack_921;
  secp256k1_gej *psStack_920;
  secp256k1_gej *psStack_918;
  secp256k1_gej *psStack_910;
  uint64_t *puStack_908;
  secp256k1_gej *psStack_900;
  long lStack_8f8;
  secp256k1_gej *psStack_8f0;
  undefined1 auStack_8e8 [56];
  uint64_t uStack_8b0;
  uint64_t uStack_8a8;
  uint64_t uStack_8a0;
  uint64_t uStack_898;
  undefined8 uStack_890;
  undefined1 auStack_880 [24];
  undefined1 auStack_868 [16];
  undefined8 uStack_858;
  undefined1 auStack_850 [16];
  undefined1 auStack_840 [16];
  undefined1 auStack_830 [32];
  secp256k1_scalar asStack_810 [16];
  secp256k1_gej asStack_600 [3];
  secp256k1_gej *psStack_3f8;
  ulong uStack_3f0;
  ulong uStack_3e8;
  secp256k1_gej *psStack_3e0;
  secp256k1_gej *psStack_3d8;
  secp256k1_gej *psStack_3d0;
  uint64_t uStack_3c0;
  uint64_t uStack_3b8;
  undefined1 auStack_3b0 [88];
  undefined8 uStack_358;
  secp256k1_gej *psStack_350;
  secp256k1_gej *psStack_348;
  ulong uStack_340;
  secp256k1_gej *psStack_338;
  undefined1 auStack_330 [24];
  ulong uStack_318;
  secp256k1_gej *psStack_310;
  uint64_t uStack_308;
  secp256k1_gej *psStack_2f8;
  undefined1 auStack_2f0 [24];
  ulong uStack_2d8;
  secp256k1_gej *psStack_2d0;
  uint64_t uStack_2c8;
  undefined1 auStack_2c0 [24];
  ulong uStack_2a8;
  secp256k1_gej *psStack_2a0;
  uint64_t uStack_298;
  undefined1 auStack_290 [24];
  ulong uStack_278;
  secp256k1_gej *psStack_270;
  uint64_t uStack_268;
  undefined1 auStack_260 [24];
  ulong uStack_248;
  secp256k1_gej *psStack_240;
  uint64_t uStack_238;
  undefined1 auStack_230 [24];
  ulong uStack_218;
  secp256k1_gej *psStack_210;
  uint64_t uStack_208;
  undefined1 auStack_200 [24];
  ulong uStack_1e8;
  secp256k1_gej *psStack_1e0;
  uint64_t uStack_1d8;
  undefined1 auStack_1d0 [24];
  ulong uStack_1b8;
  secp256k1_gej *psStack_1b0;
  uint64_t uStack_1a8;
  undefined1 auStack_1a0 [24];
  ulong uStack_188;
  secp256k1_gej *psStack_180;
  uint64_t uStack_178;
  undefined1 auStack_170 [24];
  ulong uStack_158;
  secp256k1_gej *psStack_150;
  uint64_t uStack_148;
  secp256k1_fe sStack_138;
  secp256k1_fe sStack_108;
  secp256k1_ge *psStack_d8;
  secp256k1_fe local_90;
  secp256k1_fe local_60;
  
  bVar940 = 0;
  psVar924 = (secp256k1_gej *)x;
  secp256k1_fe_verify(x);
  uVar915 = x->n[0];
  uVar936 = x->n[1];
  auVar1 = *(undefined1 (*) [16])(x->n + 2);
  iVar904 = x->magnitude;
  iVar908 = x->normalized;
  (r->x).n[4] = x->n[4];
  (r->x).magnitude = iVar904;
  (r->x).normalized = iVar908;
  *(undefined1 (*) [16])((r->x).n + 2) = auVar1;
  (r->x).n[0] = uVar915;
  (r->x).n[1] = uVar936;
  psVar919 = (secp256k1_gej *)x;
  secp256k1_fe_verify(x);
  if (x->magnitude < 9) {
    uVar917 = x->n[0];
    uVar933 = x->n[1];
    uVar934 = x->n[2];
    uVar935 = x->n[3];
    uVar918 = x->n[4];
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar917 * 2;
    auVar421._8_8_ = 0;
    auVar421._0_8_ = uVar935;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar933 * 2;
    auVar422._8_8_ = 0;
    auVar422._0_8_ = uVar934;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar918;
    auVar423._8_8_ = 0;
    auVar423._0_8_ = uVar918;
    uVar909 = SUB168(auVar3 * auVar423,0);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar909 & 0xfffffffffffff;
    auVar1 = auVar2 * auVar422 + auVar1 * auVar421 + auVar4 * ZEXT816(0x1000003d10);
    uVar916 = auVar1._0_8_;
    local_90.n[0] = uVar916 & 0xfffffffffffff;
    auVar757._8_8_ = 0;
    auVar757._0_8_ = uVar916 >> 0x34 | auVar1._8_8_ << 0xc;
    uVar918 = uVar918 * 2;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar917;
    auVar424._8_8_ = 0;
    auVar424._0_8_ = uVar918;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar933 * 2;
    auVar425._8_8_ = 0;
    auVar425._0_8_ = uVar935;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar934;
    auVar426._8_8_ = 0;
    auVar426._0_8_ = uVar934;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar909 >> 0x34 | SUB168(auVar3 * auVar423,8) << 0xc;
    auVar1 = auVar5 * auVar424 + auVar757 + auVar6 * auVar425 + auVar7 * auVar426 +
             auVar8 * ZEXT816(0x1000003d10);
    uVar909 = auVar1._0_8_;
    auVar758._8_8_ = 0;
    auVar758._0_8_ = uVar909 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar917;
    auVar427._8_8_ = 0;
    auVar427._0_8_ = uVar917;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar933;
    auVar428._8_8_ = 0;
    auVar428._0_8_ = uVar918;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar934 * 2;
    auVar429._8_8_ = 0;
    auVar429._0_8_ = uVar935;
    auVar1 = auVar10 * auVar428 + auVar758 + auVar11 * auVar429;
    uVar916 = auVar1._0_8_;
    auVar760._8_8_ = 0;
    auVar760._0_8_ = uVar916 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar430._8_8_ = 0;
    auVar430._0_8_ = (uVar916 & 0xfffffffffffff) << 4 | (uVar909 & 0xfffffffffffff) >> 0x30;
    auVar1 = auVar9 * auVar427 + ZEXT816(0x1000003d1) * auVar430;
    uVar916 = auVar1._0_8_;
    local_60.n[0] = uVar916 & 0xfffffffffffff;
    auVar759._8_8_ = 0;
    auVar759._0_8_ = uVar916 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar917 * 2;
    auVar431._8_8_ = 0;
    auVar431._0_8_ = uVar933;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar934;
    auVar432._8_8_ = 0;
    auVar432._0_8_ = uVar918;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar935;
    auVar433._8_8_ = 0;
    auVar433._0_8_ = uVar935;
    auVar2 = auVar13 * auVar432 + auVar760 + auVar14 * auVar433;
    uVar916 = auVar2._0_8_;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar916 & 0xfffffffffffff;
    auVar1 = auVar12 * auVar431 + auVar759 + auVar15 * ZEXT816(0x1000003d10);
    uVar932 = auVar1._0_8_;
    auVar762._8_8_ = 0;
    auVar762._0_8_ = uVar916 >> 0x34 | auVar2._8_8_ << 0xc;
    local_60.n[1] = uVar932 & 0xfffffffffffff;
    auVar761._8_8_ = 0;
    auVar761._0_8_ = uVar932 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar917 * 2;
    auVar434._8_8_ = 0;
    auVar434._0_8_ = uVar934;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar933;
    auVar435._8_8_ = 0;
    auVar435._0_8_ = uVar933;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar935;
    auVar436._8_8_ = 0;
    auVar436._0_8_ = uVar918;
    auVar762 = auVar18 * auVar436 + auVar762;
    uVar917 = auVar762._0_8_;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar917 & 0xfffffffffffff;
    auVar1 = auVar16 * auVar434 + auVar761 + auVar17 * auVar435 + auVar19 * ZEXT816(0x1000003d10);
    uVar933 = auVar1._0_8_;
    local_60.n[2] = uVar933 & 0xfffffffffffff;
    auVar763._8_8_ = 0;
    auVar763._0_8_ = (uVar933 >> 0x34 | auVar1._8_8_ << 0xc) + local_90.n[0];
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar917 >> 0x34 | auVar762._8_8_ << 0xc;
    auVar763 = auVar20 * ZEXT816(0x1000003d10) + auVar763;
    uVar917 = auVar763._0_8_;
    local_60.n[3] = uVar917 & 0xfffffffffffff;
    local_60.n[4] = (uVar917 >> 0x34 | auVar763._8_8_ << 0xc) + (uVar909 & 0xffffffffffff);
    local_60.magnitude = 1;
    local_60.normalized = 0;
    secp256k1_fe_verify(&local_60);
    secp256k1_fe_mul(&local_90,x,&local_60);
    r->infinity = 0;
    secp256k1_fe_verify(&local_90);
    local_90.n[0] = local_90.n[0] + 7;
    local_90.magnitude = local_90.magnitude + 1;
    local_90.normalized = 0;
    secp256k1_fe_verify(&local_90);
    iVar904 = secp256k1_fe_sqrt(&r->y,&local_90);
    return iVar904;
  }
  secp256k1_ge_set_xquad_cold_1();
  psStack_d8 = r;
  if (psVar919 == psVar924) goto LAB_0014f699;
  uStack_358._0_4_ = 0x14ccbe;
  uStack_358._4_4_ = 0;
  psVar925 = psVar924;
  psVar910 = psVar924;
  secp256k1_fe_verify(&psVar924->x);
  r = (secp256k1_ge *)psVar919;
  x = &psVar924->x;
  if (8 < (psVar924->x).magnitude) goto LAB_0014f69e;
  uStack_358._0_4_ = 0x14ccd0;
  uStack_358._4_4_ = 0;
  psVar910 = psVar924;
  secp256k1_fe_verify(&psVar924->x);
  if (8 < (psVar924->x).magnitude) goto LAB_0014f6a3;
  r = (secp256k1_ge *)&sStack_108;
  uVar917 = (psVar924->x).n[0];
  uVar933 = (psVar924->x).n[1];
  uVar934 = (psVar924->x).n[2];
  uVar935 = (psVar924->x).n[3];
  uVar918 = (psVar924->x).n[4];
  unaff_R15 = (secp256k1_gej *)0xfffffffffffff;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar917 * 2;
  auVar437._8_8_ = 0;
  auVar437._0_8_ = uVar935;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar933 * 2;
  auVar438._8_8_ = 0;
  auVar438._0_8_ = uVar934;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar918;
  auVar439._8_8_ = 0;
  auVar439._0_8_ = uVar918;
  uVar909 = SUB168(auVar23 * auVar439,0);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar909 & 0xfffffffffffff;
  auVar1 = auVar22 * auVar438 + auVar21 * auVar437 + auVar24 * ZEXT816(0x1000003d10);
  uVar916 = auVar1._0_8_;
  sStack_138.n[0] = uVar916 & 0xfffffffffffff;
  auVar764._8_8_ = 0;
  auVar764._0_8_ = uVar916 >> 0x34 | auVar1._8_8_ << 0xc;
  unaff_R14 = (secp256k1_gej *)(uVar918 * 2);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar917;
  auVar440._8_8_ = 0;
  auVar440._0_8_ = unaff_R14;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar933 * 2;
  auVar441._8_8_ = 0;
  auVar441._0_8_ = uVar935;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar934;
  auVar442._8_8_ = 0;
  auVar442._0_8_ = uVar934;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar909 >> 0x34 | SUB168(auVar23 * auVar439,8) << 0xc;
  auVar1 = auVar25 * auVar440 + auVar764 + auVar26 * auVar441 + auVar27 * auVar442 +
           auVar28 * ZEXT816(0x1000003d10);
  uVar918 = auVar1._0_8_;
  auVar765._8_8_ = 0;
  auVar765._0_8_ = uVar918 >> 0x34 | auVar1._8_8_ << 0xc;
  auStack_1a0._0_8_ = (uVar918 & 0xfffffffffffff) >> 0x30;
  auStack_170._0_8_ = uVar918 & 0xffffffffffff;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar917;
  auVar443._8_8_ = 0;
  auVar443._0_8_ = uVar917;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar933;
  auVar444._8_8_ = 0;
  auVar444._0_8_ = unaff_R14;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar934 * 2;
  auVar445._8_8_ = 0;
  auVar445._0_8_ = uVar935;
  auVar1 = auVar30 * auVar444 + auVar765 + auVar31 * auVar445;
  uVar918 = auVar1._0_8_;
  auVar767._8_8_ = 0;
  auVar767._0_8_ = uVar918 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar446._8_8_ = 0;
  auVar446._0_8_ = (uVar918 & 0xfffffffffffff) << 4 | auStack_1a0._0_8_;
  auVar1 = auVar29 * auVar443 + ZEXT816(0x1000003d1) * auVar446;
  uVar918 = auVar1._0_8_;
  sStack_108.n[0] = uVar918 & 0xfffffffffffff;
  auVar766._8_8_ = 0;
  auVar766._0_8_ = uVar918 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar917 * 2;
  auVar447._8_8_ = 0;
  auVar447._0_8_ = uVar933;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar934;
  auVar448._8_8_ = 0;
  auVar448._0_8_ = unaff_R14;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar935;
  auVar449._8_8_ = 0;
  auVar449._0_8_ = uVar935;
  auVar2 = auVar33 * auVar448 + auVar767 + auVar34 * auVar449;
  uVar918 = auVar2._0_8_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar918 & 0xfffffffffffff;
  auVar1 = auVar32 * auVar447 + auVar766 + auVar35 * ZEXT816(0x1000003d10);
  uVar909 = auVar1._0_8_;
  auVar769._8_8_ = 0;
  auVar769._0_8_ = uVar918 >> 0x34 | auVar2._8_8_ << 0xc;
  sStack_108.n[1] = uVar909 & 0xfffffffffffff;
  auVar768._8_8_ = 0;
  auVar768._0_8_ = uVar909 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar917 * 2;
  auVar450._8_8_ = 0;
  auVar450._0_8_ = uVar934;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar933;
  auVar451._8_8_ = 0;
  auVar451._0_8_ = uVar933;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar935;
  auVar452._8_8_ = 0;
  auVar452._0_8_ = unaff_R14;
  auVar769 = auVar38 * auVar452 + auVar769;
  uVar917 = auVar769._0_8_;
  in_RCX = auVar769._8_8_;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar917 & 0xfffffffffffff;
  auVar1 = auVar36 * auVar450 + auVar768 + auVar37 * auVar451 + auVar39 * ZEXT816(0x1000003d10);
  uVar933 = auVar1._0_8_;
  sStack_108.n[2] = uVar933 & 0xfffffffffffff;
  auVar770._8_8_ = 0;
  auVar770._0_8_ =
       (long)(((secp256k1_gej *)sStack_138.n[0])->x).n + (uVar933 >> 0x34 | auVar1._8_8_ << 0xc);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar917 >> 0x34 | (long)in_RCX << 0xc;
  auVar770 = auVar40 * ZEXT816(0x1000003d10) + auVar770;
  uVar917 = auVar770._0_8_;
  in_R9 = auVar770._8_8_;
  sStack_108.n[3] = uVar917 & 0xfffffffffffff;
  in_R8 = (secp256k1_gej *)
          ((long)(((secp256k1_gej *)auStack_170._0_8_)->x).n +
          (uVar917 >> 0x34 | (long)in_R9 << 0xc));
  sStack_108.magnitude = 1;
  sStack_108.normalized = 0;
  uStack_358._0_4_ = 0x14cf31;
  uStack_358._4_4_ = 0;
  psStack_2f8 = psVar919;
  sStack_108.n[4] = (uint64_t)in_R8;
  secp256k1_fe_verify((secp256k1_fe *)r);
  uStack_358._0_4_ = 0x14cf3f;
  uStack_358._4_4_ = 0;
  psVar925 = (secp256k1_gej *)r;
  secp256k1_fe_mul((secp256k1_fe *)r,(secp256k1_fe *)r,&psVar924->x);
  uStack_358._0_4_ = 0x14cf47;
  uStack_358._4_4_ = 0;
  psVar910 = (secp256k1_gej *)r;
  secp256k1_fe_verify((secp256k1_fe *)r);
  unaff_R13 = sStack_108.n[3];
  unaff_R12 = sStack_108.n[2];
  if (8 < sStack_108.magnitude) goto LAB_0014f6a8;
  psVar919 = (secp256k1_gej *)&sStack_138;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = sStack_108.n[0] * 2;
  auVar453._8_8_ = 0;
  auVar453._0_8_ = sStack_108.n[3];
  auVar42._8_8_ = 0;
  auVar42._0_8_ = sStack_108.n[1] * 2;
  auVar454._8_8_ = 0;
  auVar454._0_8_ = sStack_108.n[2];
  auVar43._8_8_ = 0;
  auVar43._0_8_ = sStack_108.n[4];
  auVar455._8_8_ = 0;
  auVar455._0_8_ = sStack_108.n[4];
  uVar917 = SUB168(auVar43 * auVar455,0);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar917 & 0xfffffffffffff;
  auVar1 = auVar42 * auVar454 + auVar41 * auVar453 + auVar44 * ZEXT816(0x1000003d10);
  uVar933 = auVar1._0_8_;
  auStack_170._0_8_ = uVar933 & 0xfffffffffffff;
  auVar771._8_8_ = 0;
  auVar771._0_8_ = uVar933 >> 0x34 | auVar1._8_8_ << 0xc;
  unaff_R14 = (secp256k1_gej *)(sStack_108.n[4] * 2);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = sStack_108.n[0];
  auVar456._8_8_ = 0;
  auVar456._0_8_ = unaff_R14;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = sStack_108.n[1] * 2;
  auVar457._8_8_ = 0;
  auVar457._0_8_ = sStack_108.n[3];
  auVar47._8_8_ = 0;
  auVar47._0_8_ = sStack_108.n[2];
  auVar458._8_8_ = 0;
  auVar458._0_8_ = sStack_108.n[2];
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar917 >> 0x34 | SUB168(auVar43 * auVar455,8) << 0xc;
  auVar1 = auVar45 * auVar456 + auVar771 + auVar46 * auVar457 + auVar47 * auVar458 +
           auVar48 * ZEXT816(0x1000003d10);
  uVar917 = auVar1._0_8_;
  auVar772._8_8_ = 0;
  auVar772._0_8_ = uVar917 >> 0x34 | auVar1._8_8_ << 0xc;
  auStack_260._0_8_ = (uVar917 & 0xfffffffffffff) >> 0x30;
  auStack_1a0._0_8_ = uVar917 & 0xffffffffffff;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = sStack_108.n[0];
  auVar459._8_8_ = 0;
  auVar459._0_8_ = sStack_108.n[0];
  auVar50._8_8_ = 0;
  auVar50._0_8_ = sStack_108.n[1];
  auVar460._8_8_ = 0;
  auVar460._0_8_ = unaff_R14;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = sStack_108.n[2] * 2;
  auVar461._8_8_ = 0;
  auVar461._0_8_ = sStack_108.n[3];
  auVar1 = auVar50 * auVar460 + auVar772 + auVar51 * auVar461;
  uVar917 = auVar1._0_8_;
  auVar774._8_8_ = 0;
  auVar774._0_8_ = uVar917 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar462._8_8_ = 0;
  auVar462._0_8_ = (uVar917 & 0xfffffffffffff) << 4 | auStack_260._0_8_;
  auVar1 = auVar49 * auVar459 + ZEXT816(0x1000003d1) * auVar462;
  uVar917 = auVar1._0_8_;
  sStack_138.n[0] = uVar917 & 0xfffffffffffff;
  auVar773._8_8_ = 0;
  auVar773._0_8_ = uVar917 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = sStack_108.n[0] * 2;
  auVar463._8_8_ = 0;
  auVar463._0_8_ = sStack_108.n[1];
  auVar53._8_8_ = 0;
  auVar53._0_8_ = sStack_108.n[2];
  auVar464._8_8_ = 0;
  auVar464._0_8_ = unaff_R14;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = sStack_108.n[3];
  auVar465._8_8_ = 0;
  auVar465._0_8_ = sStack_108.n[3];
  auVar2 = auVar53 * auVar464 + auVar774 + auVar54 * auVar465;
  uVar917 = auVar2._0_8_;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uVar917 & 0xfffffffffffff;
  auVar1 = auVar52 * auVar463 + auVar773 + auVar55 * ZEXT816(0x1000003d10);
  uVar933 = auVar1._0_8_;
  auVar776._8_8_ = 0;
  auVar776._0_8_ = uVar917 >> 0x34 | auVar2._8_8_ << 0xc;
  sStack_138.n[1] = uVar933 & 0xfffffffffffff;
  auVar775._8_8_ = 0;
  auVar775._0_8_ = uVar933 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = sStack_108.n[0] * 2;
  auVar466._8_8_ = 0;
  auVar466._0_8_ = sStack_108.n[2];
  auVar57._8_8_ = 0;
  auVar57._0_8_ = sStack_108.n[1];
  auVar467._8_8_ = 0;
  auVar467._0_8_ = sStack_108.n[1];
  auVar58._8_8_ = 0;
  auVar58._0_8_ = sStack_108.n[3];
  auVar468._8_8_ = 0;
  auVar468._0_8_ = unaff_R14;
  auVar776 = auVar58 * auVar468 + auVar776;
  uVar917 = auVar776._0_8_;
  in_RCX = auVar776._8_8_;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar917 & 0xfffffffffffff;
  auVar1 = auVar56 * auVar466 + auVar775 + auVar57 * auVar467 + auVar59 * ZEXT816(0x1000003d10);
  uVar933 = auVar1._0_8_;
  sStack_138.n[2] = uVar933 & 0xfffffffffffff;
  auVar777._8_8_ = 0;
  auVar777._0_8_ = (uVar933 >> 0x34 | auVar1._8_8_ << 0xc) + auStack_170._0_8_;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar917 >> 0x34 | (long)in_RCX << 0xc;
  auVar777 = auVar60 * ZEXT816(0x1000003d10) + auVar777;
  uVar917 = auVar777._0_8_;
  in_R9 = auVar777._8_8_;
  sStack_138.n[3] = uVar917 & 0xfffffffffffff;
  in_R8 = (secp256k1_gej *)
          ((long)(((secp256k1_gej *)auStack_1a0._0_8_)->x).n +
          (uVar917 >> 0x34 | (long)in_R9 << 0xc));
  sStack_138.magnitude = 1;
  sStack_138.normalized = 0;
  uStack_358._0_4_ = 0x14d1a8;
  uStack_358._4_4_ = 0;
  psStack_338 = psVar924;
  sStack_138.n[4] = (uint64_t)in_R8;
  secp256k1_fe_verify((secp256k1_fe *)psVar919);
  uStack_358._0_4_ = 0x14d1b8;
  uStack_358._4_4_ = 0;
  secp256k1_fe_mul((secp256k1_fe *)psVar919,(secp256k1_fe *)psVar919,&psStack_338->x);
  uStack_158 = sStack_138.n[3];
  auStack_170._16_8_ = sStack_138.n[2];
  psStack_150 = (secp256k1_gej *)sStack_138.n[4];
  uStack_148._0_4_ = sStack_138.magnitude;
  uStack_148._4_4_ = sStack_138.normalized;
  auStack_170._0_8_ = sStack_138.n[0];
  auStack_170._8_8_ = sStack_138.n[1];
  x = (secp256k1_fe *)0x3;
  psVar924 = psVar919;
  do {
    r = (secp256k1_ge *)auStack_170;
    uStack_358._0_4_ = 0x14d1e4;
    uStack_358._4_4_ = 0;
    psVar919 = (secp256k1_gej *)r;
    secp256k1_fe_verify((secp256k1_fe *)r);
    if (8 < (int)uStack_148) {
      uStack_358._0_4_ = 0x14f667;
      uStack_358._4_4_ = 0;
      secp256k1_fe_sqrt_cold_16();
      goto LAB_0014f667;
    }
    unaff_R12 = auStack_170._16_8_;
    unaff_R13 = uStack_158;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = auStack_170._0_8_ * 2;
    auVar469._8_8_ = 0;
    auVar469._0_8_ = uStack_158;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = auStack_170._8_8_ * 2;
    auVar470._8_8_ = 0;
    auVar470._0_8_ = auStack_170._16_8_;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = psStack_150;
    auVar471._8_8_ = 0;
    auVar471._0_8_ = psStack_150;
    uVar917 = SUB168(auVar63 * auVar471,0);
    auVar64._8_8_ = 0;
    auVar64._0_8_ = uVar917 & 0xfffffffffffff;
    auVar1 = auVar62 * auVar470 + auVar61 * auVar469 + auVar64 * ZEXT816(0x1000003d10);
    uVar933 = auVar1._0_8_;
    auStack_1a0._0_8_ = uVar933 & 0xfffffffffffff;
    auVar778._8_8_ = 0;
    auVar778._0_8_ = uVar933 >> 0x34 | auVar1._8_8_ << 0xc;
    unaff_R14 = (secp256k1_gej *)((long)psStack_150 * 2);
    auVar65._8_8_ = 0;
    auVar65._0_8_ = auStack_170._0_8_;
    auVar472._8_8_ = 0;
    auVar472._0_8_ = unaff_R14;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = auStack_170._8_8_ * 2;
    auVar473._8_8_ = 0;
    auVar473._0_8_ = uStack_158;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = auStack_170._16_8_;
    auVar474._8_8_ = 0;
    auVar474._0_8_ = auStack_170._16_8_;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = uVar917 >> 0x34 | SUB168(auVar63 * auVar471,8) << 0xc;
    auVar1 = auVar65 * auVar472 + auVar778 + auVar66 * auVar473 + auVar67 * auVar474 +
             auVar68 * ZEXT816(0x1000003d10);
    uVar917 = auVar1._0_8_;
    auVar779._8_8_ = 0;
    auVar779._0_8_ = uVar917 >> 0x34 | auVar1._8_8_ << 0xc;
    auStack_2c0._0_8_ = (uVar917 & 0xfffffffffffff) >> 0x30;
    psVar924 = (secp256k1_gej *)(uVar917 & 0xffffffffffff);
    auVar69._8_8_ = 0;
    auVar69._0_8_ = auStack_170._0_8_;
    auVar475._8_8_ = 0;
    auVar475._0_8_ = auStack_170._0_8_;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = auStack_170._8_8_;
    auVar476._8_8_ = 0;
    auVar476._0_8_ = unaff_R14;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = auStack_170._16_8_ * 2;
    auVar477._8_8_ = 0;
    auVar477._0_8_ = uStack_158;
    auVar1 = auVar70 * auVar476 + auVar779 + auVar71 * auVar477;
    uVar917 = auVar1._0_8_;
    auVar781._8_8_ = 0;
    auVar781._0_8_ = uVar917 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar478._8_8_ = 0;
    auVar478._0_8_ = (uVar917 & 0xfffffffffffff) << 4 | auStack_2c0._0_8_;
    auVar1 = auVar69 * auVar475 + ZEXT816(0x1000003d1) * auVar478;
    uVar933 = auVar1._0_8_;
    auVar780._8_8_ = 0;
    auVar780._0_8_ = uVar933 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = auStack_170._0_8_ * 2;
    auVar479._8_8_ = 0;
    auVar479._0_8_ = auStack_170._8_8_;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = auStack_170._16_8_;
    auVar480._8_8_ = 0;
    auVar480._0_8_ = unaff_R14;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = uStack_158;
    auVar481._8_8_ = 0;
    auVar481._0_8_ = uStack_158;
    auVar2 = auVar73 * auVar480 + auVar781 + auVar74 * auVar481;
    uVar917 = auVar2._0_8_;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = uVar917 & 0xfffffffffffff;
    auVar1 = auVar72 * auVar479 + auVar780 + auVar75 * ZEXT816(0x1000003d10);
    uVar934 = auVar1._0_8_;
    auVar783._8_8_ = 0;
    auVar783._0_8_ = uVar917 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar782._8_8_ = 0;
    auVar782._0_8_ = uVar934 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = auStack_170._0_8_ * 2;
    auVar482._8_8_ = 0;
    auVar482._0_8_ = auStack_170._16_8_;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = auStack_170._8_8_;
    auVar483._8_8_ = 0;
    auVar483._0_8_ = auStack_170._8_8_;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = uStack_158;
    auVar484._8_8_ = 0;
    auVar484._0_8_ = unaff_R14;
    auVar783 = auVar78 * auVar484 + auVar783;
    uVar917 = auVar783._0_8_;
    in_RCX = auVar783._8_8_;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = uVar917 & 0xfffffffffffff;
    auVar1 = auVar76 * auVar482 + auVar782 + auVar77 * auVar483 + auVar79 * ZEXT816(0x1000003d10);
    uVar935 = auVar1._0_8_;
    auVar784._8_8_ = 0;
    auVar784._0_8_ =
         (long)(((secp256k1_gej *)auStack_1a0._0_8_)->x).n + (uVar935 >> 0x34 | auVar1._8_8_ << 0xc)
    ;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = uVar917 >> 0x34 | (long)in_RCX << 0xc;
    auVar784 = auVar80 * ZEXT816(0x1000003d10) + auVar784;
    uVar917 = auVar784._0_8_;
    in_R9 = auVar784._8_8_;
    uStack_158 = uVar917 & 0xfffffffffffff;
    auStack_170._16_8_ = uVar935 & 0xfffffffffffff;
    in_R8 = (secp256k1_gej *)((long)(psVar924->x).n + (uVar917 >> 0x34 | (long)in_R9 << 0xc));
    uStack_148 = 1;
    uStack_358._0_4_ = 0x14d44b;
    uStack_358._4_4_ = 0;
    auStack_260._0_8_ = psVar924;
    auStack_170._0_8_ = (secp256k1_gej *)(uVar933 & 0xfffffffffffff);
    auStack_170._8_8_ = uVar934 & 0xfffffffffffff;
    psStack_150 = in_R8;
    secp256k1_fe_verify((secp256k1_fe *)auStack_170);
    uVar923 = (int)x - 1;
    x = (secp256k1_fe *)(ulong)uVar923;
  } while (uVar923 != 0);
  psVar924 = (secp256k1_gej *)auStack_170;
  uStack_358._0_4_ = 0x14d46e;
  uStack_358._4_4_ = 0;
  secp256k1_fe_mul((secp256k1_fe *)psVar924,(secp256k1_fe *)psVar924,&sStack_138);
  psStack_180 = psStack_150;
  uStack_178 = uStack_148;
  stack0xfffffffffffffe70 = stack0xfffffffffffffea0;
  auStack_1a0._0_8_ = auStack_170._0_8_;
  auStack_1a0._8_8_ = auStack_170._8_8_;
  x = (secp256k1_fe *)0x3;
  do {
    r = (secp256k1_ge *)auStack_1a0;
    uStack_358._0_4_ = 0x14d499;
    uStack_358._4_4_ = 0;
    psVar919 = (secp256k1_gej *)r;
    secp256k1_fe_verify((secp256k1_fe *)r);
    if (8 < (int)uStack_178) goto LAB_0014f667;
    unaff_R12 = auStack_1a0._16_8_;
    unaff_R13 = uStack_188;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = auStack_1a0._0_8_ * 2;
    auVar485._8_8_ = 0;
    auVar485._0_8_ = uStack_188;
    auVar82._8_8_ = 0;
    auVar82._0_8_ = auStack_1a0._8_8_ * 2;
    auVar486._8_8_ = 0;
    auVar486._0_8_ = auStack_1a0._16_8_;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = psStack_180;
    auVar487._8_8_ = 0;
    auVar487._0_8_ = psStack_180;
    uVar917 = SUB168(auVar83 * auVar487,0);
    auVar84._8_8_ = 0;
    auVar84._0_8_ = uVar917 & 0xfffffffffffff;
    auVar1 = auVar82 * auVar486 + auVar81 * auVar485 + auVar84 * ZEXT816(0x1000003d10);
    uVar933 = auVar1._0_8_;
    auStack_260._0_8_ = uVar933 & 0xfffffffffffff;
    auVar785._8_8_ = 0;
    auVar785._0_8_ = uVar933 >> 0x34 | auVar1._8_8_ << 0xc;
    unaff_R14 = (secp256k1_gej *)((long)psStack_180 * 2);
    auVar85._8_8_ = 0;
    auVar85._0_8_ = auStack_1a0._0_8_;
    auVar488._8_8_ = 0;
    auVar488._0_8_ = unaff_R14;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = auStack_1a0._8_8_ * 2;
    auVar489._8_8_ = 0;
    auVar489._0_8_ = uStack_188;
    auVar87._8_8_ = 0;
    auVar87._0_8_ = auStack_1a0._16_8_;
    auVar490._8_8_ = 0;
    auVar490._0_8_ = auStack_1a0._16_8_;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = uVar917 >> 0x34 | SUB168(auVar83 * auVar487,8) << 0xc;
    auVar1 = auVar85 * auVar488 + auVar785 + auVar86 * auVar489 + auVar87 * auVar490 +
             auVar88 * ZEXT816(0x1000003d10);
    uVar917 = auVar1._0_8_;
    auVar786._8_8_ = 0;
    auVar786._0_8_ = uVar917 >> 0x34 | auVar1._8_8_ << 0xc;
    auStack_2f0._0_8_ = (uVar917 & 0xfffffffffffff) >> 0x30;
    psVar924 = (secp256k1_gej *)(uVar917 & 0xffffffffffff);
    auVar89._8_8_ = 0;
    auVar89._0_8_ = auStack_1a0._0_8_;
    auVar491._8_8_ = 0;
    auVar491._0_8_ = auStack_1a0._0_8_;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = auStack_1a0._8_8_;
    auVar492._8_8_ = 0;
    auVar492._0_8_ = unaff_R14;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = auStack_1a0._16_8_ * 2;
    auVar493._8_8_ = 0;
    auVar493._0_8_ = uStack_188;
    auVar1 = auVar90 * auVar492 + auVar786 + auVar91 * auVar493;
    uVar917 = auVar1._0_8_;
    auVar788._8_8_ = 0;
    auVar788._0_8_ = uVar917 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar494._8_8_ = 0;
    auVar494._0_8_ = (uVar917 & 0xfffffffffffff) << 4 | auStack_2f0._0_8_;
    auVar1 = auVar89 * auVar491 + ZEXT816(0x1000003d1) * auVar494;
    uVar933 = auVar1._0_8_;
    auVar787._8_8_ = 0;
    auVar787._0_8_ = uVar933 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar92._8_8_ = 0;
    auVar92._0_8_ = auStack_1a0._0_8_ * 2;
    auVar495._8_8_ = 0;
    auVar495._0_8_ = auStack_1a0._8_8_;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = auStack_1a0._16_8_;
    auVar496._8_8_ = 0;
    auVar496._0_8_ = unaff_R14;
    auVar94._8_8_ = 0;
    auVar94._0_8_ = uStack_188;
    auVar497._8_8_ = 0;
    auVar497._0_8_ = uStack_188;
    auVar2 = auVar93 * auVar496 + auVar788 + auVar94 * auVar497;
    uVar917 = auVar2._0_8_;
    auVar95._8_8_ = 0;
    auVar95._0_8_ = uVar917 & 0xfffffffffffff;
    auVar1 = auVar92 * auVar495 + auVar787 + auVar95 * ZEXT816(0x1000003d10);
    uVar934 = auVar1._0_8_;
    auVar790._8_8_ = 0;
    auVar790._0_8_ = uVar917 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar789._8_8_ = 0;
    auVar789._0_8_ = uVar934 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar96._8_8_ = 0;
    auVar96._0_8_ = auStack_1a0._0_8_ * 2;
    auVar498._8_8_ = 0;
    auVar498._0_8_ = auStack_1a0._16_8_;
    auVar97._8_8_ = 0;
    auVar97._0_8_ = auStack_1a0._8_8_;
    auVar499._8_8_ = 0;
    auVar499._0_8_ = auStack_1a0._8_8_;
    auVar98._8_8_ = 0;
    auVar98._0_8_ = uStack_188;
    auVar500._8_8_ = 0;
    auVar500._0_8_ = unaff_R14;
    auVar790 = auVar98 * auVar500 + auVar790;
    uVar917 = auVar790._0_8_;
    in_RCX = auVar790._8_8_;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = uVar917 & 0xfffffffffffff;
    auVar1 = auVar96 * auVar498 + auVar789 + auVar97 * auVar499 + auVar99 * ZEXT816(0x1000003d10);
    uVar935 = auVar1._0_8_;
    auVar791._8_8_ = 0;
    auVar791._0_8_ =
         (long)(((secp256k1_gej *)auStack_260._0_8_)->x).n + (uVar935 >> 0x34 | auVar1._8_8_ << 0xc)
    ;
    auVar100._8_8_ = 0;
    auVar100._0_8_ = uVar917 >> 0x34 | (long)in_RCX << 0xc;
    auVar791 = auVar100 * ZEXT816(0x1000003d10) + auVar791;
    uVar917 = auVar791._0_8_;
    in_R9 = auVar791._8_8_;
    uStack_188 = uVar917 & 0xfffffffffffff;
    auStack_1a0._16_8_ = uVar935 & 0xfffffffffffff;
    in_R8 = (secp256k1_gej *)((long)(psVar924->x).n + (uVar917 >> 0x34 | (long)in_R9 << 0xc));
    uStack_178 = 1;
    uStack_358._0_4_ = 0x14d6fa;
    uStack_358._4_4_ = 0;
    auStack_2c0._0_8_ = psVar924;
    auStack_1a0._0_8_ = (secp256k1_gej *)(uVar933 & 0xfffffffffffff);
    auStack_1a0._8_8_ = uVar934 & 0xfffffffffffff;
    psStack_180 = in_R8;
    secp256k1_fe_verify((secp256k1_fe *)auStack_1a0);
    uVar923 = (int)x - 1;
    x = (secp256k1_fe *)(ulong)uVar923;
  } while (uVar923 != 0);
  psVar924 = (secp256k1_gej *)auStack_1a0;
  uStack_358._0_4_ = 0x14d71d;
  uStack_358._4_4_ = 0;
  secp256k1_fe_mul((secp256k1_fe *)psVar924,(secp256k1_fe *)psVar924,&sStack_138);
  psStack_240 = psStack_180;
  uStack_238 = uStack_178;
  stack0xfffffffffffffdb0 = stack0xfffffffffffffe70;
  auStack_260._0_8_ = auStack_1a0._0_8_;
  auStack_260._8_8_ = auStack_1a0._8_8_;
  x = (secp256k1_fe *)0x1;
  do {
    r = (secp256k1_ge *)auStack_260;
    uStack_358._0_4_ = 0x14d746;
    uStack_358._4_4_ = 0;
    psVar919 = (secp256k1_gej *)r;
    secp256k1_fe_verify((secp256k1_fe *)r);
    if (8 < (int)uStack_238) goto LAB_0014f66c;
    unaff_R12 = auStack_260._16_8_;
    unaff_R13 = uStack_248;
    auVar101._8_8_ = 0;
    auVar101._0_8_ = auStack_260._0_8_ * 2;
    auVar501._8_8_ = 0;
    auVar501._0_8_ = uStack_248;
    auVar102._8_8_ = 0;
    auVar102._0_8_ = auStack_260._8_8_ * 2;
    auVar502._8_8_ = 0;
    auVar502._0_8_ = auStack_260._16_8_;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = psStack_240;
    auVar503._8_8_ = 0;
    auVar503._0_8_ = psStack_240;
    uVar917 = SUB168(auVar103 * auVar503,0);
    auVar104._8_8_ = 0;
    auVar104._0_8_ = uVar917 & 0xfffffffffffff;
    auVar1 = auVar102 * auVar502 + auVar101 * auVar501 + auVar104 * ZEXT816(0x1000003d10);
    uVar933 = auVar1._0_8_;
    auStack_2c0._0_8_ = uVar933 & 0xfffffffffffff;
    auVar792._8_8_ = 0;
    auVar792._0_8_ = uVar933 >> 0x34 | auVar1._8_8_ << 0xc;
    unaff_R14 = (secp256k1_gej *)((long)psStack_240 * 2);
    auVar105._8_8_ = 0;
    auVar105._0_8_ = auStack_260._0_8_;
    auVar504._8_8_ = 0;
    auVar504._0_8_ = unaff_R14;
    auVar106._8_8_ = 0;
    auVar106._0_8_ = auStack_260._8_8_ * 2;
    auVar505._8_8_ = 0;
    auVar505._0_8_ = uStack_248;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = auStack_260._16_8_;
    auVar506._8_8_ = 0;
    auVar506._0_8_ = auStack_260._16_8_;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = uVar917 >> 0x34 | SUB168(auVar103 * auVar503,8) << 0xc;
    auVar1 = auVar105 * auVar504 + auVar792 + auVar106 * auVar505 + auVar107 * auVar506 +
             auVar108 * ZEXT816(0x1000003d10);
    uVar917 = auVar1._0_8_;
    auVar793._8_8_ = 0;
    auVar793._0_8_ = uVar917 >> 0x34 | auVar1._8_8_ << 0xc;
    auStack_290._0_8_ = (uVar917 & 0xfffffffffffff) >> 0x30;
    psVar924 = (secp256k1_gej *)(uVar917 & 0xffffffffffff);
    auVar109._8_8_ = 0;
    auVar109._0_8_ = auStack_260._0_8_;
    auVar507._8_8_ = 0;
    auVar507._0_8_ = auStack_260._0_8_;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = auStack_260._8_8_;
    auVar508._8_8_ = 0;
    auVar508._0_8_ = unaff_R14;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = auStack_260._16_8_ * 2;
    auVar509._8_8_ = 0;
    auVar509._0_8_ = uStack_248;
    auVar1 = auVar110 * auVar508 + auVar793 + auVar111 * auVar509;
    uVar917 = auVar1._0_8_;
    auVar795._8_8_ = 0;
    auVar795._0_8_ = uVar917 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar510._8_8_ = 0;
    auVar510._0_8_ = (uVar917 & 0xfffffffffffff) << 4 | auStack_290._0_8_;
    auVar1 = auVar109 * auVar507 + ZEXT816(0x1000003d1) * auVar510;
    uVar933 = auVar1._0_8_;
    auVar794._8_8_ = 0;
    auVar794._0_8_ = uVar933 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar112._8_8_ = 0;
    auVar112._0_8_ = auStack_260._0_8_ * 2;
    auVar511._8_8_ = 0;
    auVar511._0_8_ = auStack_260._8_8_;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = auStack_260._16_8_;
    auVar512._8_8_ = 0;
    auVar512._0_8_ = unaff_R14;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = uStack_248;
    auVar513._8_8_ = 0;
    auVar513._0_8_ = uStack_248;
    auVar2 = auVar113 * auVar512 + auVar795 + auVar114 * auVar513;
    uVar917 = auVar2._0_8_;
    auVar115._8_8_ = 0;
    auVar115._0_8_ = uVar917 & 0xfffffffffffff;
    auVar1 = auVar112 * auVar511 + auVar794 + auVar115 * ZEXT816(0x1000003d10);
    uVar934 = auVar1._0_8_;
    auVar797._8_8_ = 0;
    auVar797._0_8_ = uVar917 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar796._8_8_ = 0;
    auVar796._0_8_ = uVar934 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = auStack_260._0_8_ * 2;
    auVar514._8_8_ = 0;
    auVar514._0_8_ = auStack_260._16_8_;
    auVar117._8_8_ = 0;
    auVar117._0_8_ = auStack_260._8_8_;
    auVar515._8_8_ = 0;
    auVar515._0_8_ = auStack_260._8_8_;
    auVar118._8_8_ = 0;
    auVar118._0_8_ = uStack_248;
    auVar516._8_8_ = 0;
    auVar516._0_8_ = unaff_R14;
    auVar797 = auVar118 * auVar516 + auVar797;
    uVar917 = auVar797._0_8_;
    in_RCX = auVar797._8_8_;
    auVar119._8_8_ = 0;
    auVar119._0_8_ = uVar917 & 0xfffffffffffff;
    auVar1 = auVar116 * auVar514 + auVar796 + auVar117 * auVar515 + auVar119 * ZEXT816(0x1000003d10)
    ;
    uVar935 = auVar1._0_8_;
    auVar798._8_8_ = 0;
    auVar798._0_8_ =
         (long)(((secp256k1_gej *)auStack_2c0._0_8_)->x).n + (uVar935 >> 0x34 | auVar1._8_8_ << 0xc)
    ;
    auVar120._8_8_ = 0;
    auVar120._0_8_ = uVar917 >> 0x34 | (long)in_RCX << 0xc;
    auVar798 = auVar120 * ZEXT816(0x1000003d10) + auVar798;
    uVar917 = auVar798._0_8_;
    in_R9 = auVar798._8_8_;
    uStack_248 = uVar917 & 0xfffffffffffff;
    auStack_260._16_8_ = uVar935 & 0xfffffffffffff;
    in_R8 = (secp256k1_gej *)((long)(psVar924->x).n + (uVar917 >> 0x34 | (long)in_R9 << 0xc));
    uStack_238 = 1;
    uStack_358._0_4_ = 0x14d9a7;
    uStack_358._4_4_ = 0;
    auStack_2f0._0_8_ = psVar924;
    auStack_260._0_8_ = (secp256k1_gej *)(uVar933 & 0xfffffffffffff);
    auStack_260._8_8_ = uVar934 & 0xfffffffffffff;
    psStack_240 = in_R8;
    secp256k1_fe_verify((secp256k1_fe *)auStack_260);
    cVar922 = (char)x;
    x = (secp256k1_fe *)0x0;
  } while (cVar922 != '\0');
  psVar924 = (secp256k1_gej *)auStack_260;
  uStack_358._0_4_ = 0x14d9d1;
  uStack_358._4_4_ = 0;
  secp256k1_fe_mul((secp256k1_fe *)psVar924,(secp256k1_fe *)psVar924,&sStack_108);
  psStack_2a0 = psStack_240;
  uStack_298 = uStack_238;
  stack0xfffffffffffffd50 = stack0xfffffffffffffdb0;
  auStack_2c0._0_8_ = auStack_260._0_8_;
  auStack_2c0._8_8_ = auStack_260._8_8_;
  x = (secp256k1_fe *)0xb;
  do {
    r = (secp256k1_ge *)auStack_2c0;
    uStack_358._0_4_ = 0x14d9fc;
    uStack_358._4_4_ = 0;
    psVar919 = (secp256k1_gej *)r;
    secp256k1_fe_verify((secp256k1_fe *)r);
    if (8 < (int)uStack_298) goto LAB_0014f671;
    unaff_R12 = auStack_2c0._16_8_;
    unaff_R13 = uStack_2a8;
    auVar121._8_8_ = 0;
    auVar121._0_8_ = auStack_2c0._0_8_ * 2;
    auVar517._8_8_ = 0;
    auVar517._0_8_ = uStack_2a8;
    auVar122._8_8_ = 0;
    auVar122._0_8_ = auStack_2c0._8_8_ * 2;
    auVar518._8_8_ = 0;
    auVar518._0_8_ = auStack_2c0._16_8_;
    auVar123._8_8_ = 0;
    auVar123._0_8_ = psStack_2a0;
    auVar519._8_8_ = 0;
    auVar519._0_8_ = psStack_2a0;
    uVar917 = SUB168(auVar123 * auVar519,0);
    auVar124._8_8_ = 0;
    auVar124._0_8_ = uVar917 & 0xfffffffffffff;
    auVar1 = auVar122 * auVar518 + auVar121 * auVar517 + auVar124 * ZEXT816(0x1000003d10);
    uVar933 = auVar1._0_8_;
    auStack_2f0._0_8_ = uVar933 & 0xfffffffffffff;
    auVar799._8_8_ = 0;
    auVar799._0_8_ = uVar933 >> 0x34 | auVar1._8_8_ << 0xc;
    unaff_R14 = (secp256k1_gej *)((long)psStack_2a0 * 2);
    auVar125._8_8_ = 0;
    auVar125._0_8_ = auStack_2c0._0_8_;
    auVar520._8_8_ = 0;
    auVar520._0_8_ = unaff_R14;
    auVar126._8_8_ = 0;
    auVar126._0_8_ = auStack_2c0._8_8_ * 2;
    auVar521._8_8_ = 0;
    auVar521._0_8_ = uStack_2a8;
    auVar127._8_8_ = 0;
    auVar127._0_8_ = auStack_2c0._16_8_;
    auVar522._8_8_ = 0;
    auVar522._0_8_ = auStack_2c0._16_8_;
    auVar128._8_8_ = 0;
    auVar128._0_8_ = uVar917 >> 0x34 | SUB168(auVar123 * auVar519,8) << 0xc;
    auVar1 = auVar125 * auVar520 + auVar799 + auVar126 * auVar521 + auVar127 * auVar522 +
             auVar128 * ZEXT816(0x1000003d10);
    uVar917 = auVar1._0_8_;
    auVar800._8_8_ = 0;
    auVar800._0_8_ = uVar917 >> 0x34 | auVar1._8_8_ << 0xc;
    auStack_1d0._0_8_ = (uVar917 & 0xfffffffffffff) >> 0x30;
    psVar924 = (secp256k1_gej *)(uVar917 & 0xffffffffffff);
    auVar129._8_8_ = 0;
    auVar129._0_8_ = auStack_2c0._0_8_;
    auVar523._8_8_ = 0;
    auVar523._0_8_ = auStack_2c0._0_8_;
    auVar130._8_8_ = 0;
    auVar130._0_8_ = auStack_2c0._8_8_;
    auVar524._8_8_ = 0;
    auVar524._0_8_ = unaff_R14;
    auVar131._8_8_ = 0;
    auVar131._0_8_ = auStack_2c0._16_8_ * 2;
    auVar525._8_8_ = 0;
    auVar525._0_8_ = uStack_2a8;
    auVar1 = auVar130 * auVar524 + auVar800 + auVar131 * auVar525;
    uVar917 = auVar1._0_8_;
    auVar802._8_8_ = 0;
    auVar802._0_8_ = uVar917 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar526._8_8_ = 0;
    auVar526._0_8_ = (uVar917 & 0xfffffffffffff) << 4 | auStack_1d0._0_8_;
    auVar1 = auVar129 * auVar523 + ZEXT816(0x1000003d1) * auVar526;
    uVar933 = auVar1._0_8_;
    auVar801._8_8_ = 0;
    auVar801._0_8_ = uVar933 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar132._8_8_ = 0;
    auVar132._0_8_ = auStack_2c0._0_8_ * 2;
    auVar527._8_8_ = 0;
    auVar527._0_8_ = auStack_2c0._8_8_;
    auVar133._8_8_ = 0;
    auVar133._0_8_ = auStack_2c0._16_8_;
    auVar528._8_8_ = 0;
    auVar528._0_8_ = unaff_R14;
    auVar134._8_8_ = 0;
    auVar134._0_8_ = uStack_2a8;
    auVar529._8_8_ = 0;
    auVar529._0_8_ = uStack_2a8;
    auVar2 = auVar133 * auVar528 + auVar802 + auVar134 * auVar529;
    uVar917 = auVar2._0_8_;
    auVar135._8_8_ = 0;
    auVar135._0_8_ = uVar917 & 0xfffffffffffff;
    auVar1 = auVar132 * auVar527 + auVar801 + auVar135 * ZEXT816(0x1000003d10);
    uVar934 = auVar1._0_8_;
    auVar804._8_8_ = 0;
    auVar804._0_8_ = uVar917 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar803._8_8_ = 0;
    auVar803._0_8_ = uVar934 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar136._8_8_ = 0;
    auVar136._0_8_ = auStack_2c0._0_8_ * 2;
    auVar530._8_8_ = 0;
    auVar530._0_8_ = auStack_2c0._16_8_;
    auVar137._8_8_ = 0;
    auVar137._0_8_ = auStack_2c0._8_8_;
    auVar531._8_8_ = 0;
    auVar531._0_8_ = auStack_2c0._8_8_;
    auVar138._8_8_ = 0;
    auVar138._0_8_ = uStack_2a8;
    auVar532._8_8_ = 0;
    auVar532._0_8_ = unaff_R14;
    auVar804 = auVar138 * auVar532 + auVar804;
    uVar917 = auVar804._0_8_;
    in_RCX = auVar804._8_8_;
    auVar139._8_8_ = 0;
    auVar139._0_8_ = uVar917 & 0xfffffffffffff;
    auVar1 = auVar136 * auVar530 + auVar803 + auVar137 * auVar531 + auVar139 * ZEXT816(0x1000003d10)
    ;
    uVar935 = auVar1._0_8_;
    auVar805._8_8_ = 0;
    auVar805._0_8_ =
         (long)(((secp256k1_gej *)auStack_2f0._0_8_)->x).n + (uVar935 >> 0x34 | auVar1._8_8_ << 0xc)
    ;
    auVar140._8_8_ = 0;
    auVar140._0_8_ = uVar917 >> 0x34 | (long)in_RCX << 0xc;
    auVar805 = auVar140 * ZEXT816(0x1000003d10) + auVar805;
    uVar917 = auVar805._0_8_;
    in_R9 = auVar805._8_8_;
    uStack_2a8 = uVar917 & 0xfffffffffffff;
    auStack_2c0._16_8_ = uVar935 & 0xfffffffffffff;
    in_R8 = (secp256k1_gej *)((long)(psVar924->x).n + (uVar917 >> 0x34 | (long)in_R9 << 0xc));
    uStack_298 = 1;
    uStack_358._0_4_ = 0x14dc5d;
    uStack_358._4_4_ = 0;
    auStack_2c0._0_8_ = (secp256k1_gej *)(uVar933 & 0xfffffffffffff);
    auStack_2c0._8_8_ = uVar934 & 0xfffffffffffff;
    psStack_2a0 = in_R8;
    auStack_290._0_8_ = psVar924;
    secp256k1_fe_verify((secp256k1_fe *)auStack_2c0);
    uVar923 = (int)x - 1;
    x = (secp256k1_fe *)(ulong)uVar923;
  } while (uVar923 != 0);
  psVar924 = (secp256k1_gej *)auStack_2c0;
  uStack_358._0_4_ = 0x14dc80;
  uStack_358._4_4_ = 0;
  secp256k1_fe_mul((secp256k1_fe *)psVar924,(secp256k1_fe *)psVar924,(secp256k1_fe *)auStack_260);
  psStack_2d0 = psStack_2a0;
  uStack_2c8 = uStack_298;
  stack0xfffffffffffffd20 = stack0xfffffffffffffd50;
  auStack_2f0._0_8_ = auStack_2c0._0_8_;
  auStack_2f0._8_8_ = auStack_2c0._8_8_;
  x = (secp256k1_fe *)0x16;
  do {
    r = (secp256k1_ge *)auStack_2f0;
    uStack_358._0_4_ = 0x14dca8;
    uStack_358._4_4_ = 0;
    psVar919 = (secp256k1_gej *)r;
    secp256k1_fe_verify((secp256k1_fe *)r);
    if (8 < (int)uStack_2c8) goto LAB_0014f676;
    unaff_R12 = auStack_2f0._16_8_;
    unaff_R13 = uStack_2d8;
    auVar141._8_8_ = 0;
    auVar141._0_8_ = auStack_2f0._0_8_ * 2;
    auVar533._8_8_ = 0;
    auVar533._0_8_ = uStack_2d8;
    auVar142._8_8_ = 0;
    auVar142._0_8_ = auStack_2f0._8_8_ * 2;
    auVar534._8_8_ = 0;
    auVar534._0_8_ = auStack_2f0._16_8_;
    auVar143._8_8_ = 0;
    auVar143._0_8_ = psStack_2d0;
    auVar535._8_8_ = 0;
    auVar535._0_8_ = psStack_2d0;
    uVar917 = SUB168(auVar143 * auVar535,0);
    auVar144._8_8_ = 0;
    auVar144._0_8_ = uVar917 & 0xfffffffffffff;
    auVar1 = auVar142 * auVar534 + auVar141 * auVar533 + auVar144 * ZEXT816(0x1000003d10);
    uVar933 = auVar1._0_8_;
    auStack_290._0_8_ = uVar933 & 0xfffffffffffff;
    auVar806._8_8_ = 0;
    auVar806._0_8_ = uVar933 >> 0x34 | auVar1._8_8_ << 0xc;
    unaff_R14 = (secp256k1_gej *)((long)psStack_2d0 * 2);
    auVar145._8_8_ = 0;
    auVar145._0_8_ = auStack_2f0._0_8_;
    auVar536._8_8_ = 0;
    auVar536._0_8_ = unaff_R14;
    auVar146._8_8_ = 0;
    auVar146._0_8_ = auStack_2f0._8_8_ * 2;
    auVar537._8_8_ = 0;
    auVar537._0_8_ = uStack_2d8;
    auVar147._8_8_ = 0;
    auVar147._0_8_ = auStack_2f0._16_8_;
    auVar538._8_8_ = 0;
    auVar538._0_8_ = auStack_2f0._16_8_;
    auVar148._8_8_ = 0;
    auVar148._0_8_ = uVar917 >> 0x34 | SUB168(auVar143 * auVar535,8) << 0xc;
    auVar1 = auVar145 * auVar536 + auVar806 + auVar146 * auVar537 + auVar147 * auVar538 +
             auVar148 * ZEXT816(0x1000003d10);
    uVar917 = auVar1._0_8_;
    auVar807._8_8_ = 0;
    auVar807._0_8_ = uVar917 >> 0x34 | auVar1._8_8_ << 0xc;
    auStack_200._0_8_ = (uVar917 & 0xfffffffffffff) >> 0x30;
    psVar924 = (secp256k1_gej *)(uVar917 & 0xffffffffffff);
    auVar149._8_8_ = 0;
    auVar149._0_8_ = auStack_2f0._0_8_;
    auVar539._8_8_ = 0;
    auVar539._0_8_ = auStack_2f0._0_8_;
    auVar150._8_8_ = 0;
    auVar150._0_8_ = auStack_2f0._8_8_;
    auVar540._8_8_ = 0;
    auVar540._0_8_ = unaff_R14;
    auVar151._8_8_ = 0;
    auVar151._0_8_ = auStack_2f0._16_8_ * 2;
    auVar541._8_8_ = 0;
    auVar541._0_8_ = uStack_2d8;
    auVar1 = auVar150 * auVar540 + auVar807 + auVar151 * auVar541;
    uVar917 = auVar1._0_8_;
    auVar809._8_8_ = 0;
    auVar809._0_8_ = uVar917 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar542._8_8_ = 0;
    auVar542._0_8_ = (uVar917 & 0xfffffffffffff) << 4 | auStack_200._0_8_;
    auVar1 = auVar149 * auVar539 + ZEXT816(0x1000003d1) * auVar542;
    uVar933 = auVar1._0_8_;
    auVar808._8_8_ = 0;
    auVar808._0_8_ = uVar933 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar152._8_8_ = 0;
    auVar152._0_8_ = auStack_2f0._0_8_ * 2;
    auVar543._8_8_ = 0;
    auVar543._0_8_ = auStack_2f0._8_8_;
    auVar153._8_8_ = 0;
    auVar153._0_8_ = auStack_2f0._16_8_;
    auVar544._8_8_ = 0;
    auVar544._0_8_ = unaff_R14;
    auVar154._8_8_ = 0;
    auVar154._0_8_ = uStack_2d8;
    auVar545._8_8_ = 0;
    auVar545._0_8_ = uStack_2d8;
    auVar2 = auVar153 * auVar544 + auVar809 + auVar154 * auVar545;
    uVar917 = auVar2._0_8_;
    auVar155._8_8_ = 0;
    auVar155._0_8_ = uVar917 & 0xfffffffffffff;
    auVar1 = auVar152 * auVar543 + auVar808 + auVar155 * ZEXT816(0x1000003d10);
    uVar934 = auVar1._0_8_;
    auVar811._8_8_ = 0;
    auVar811._0_8_ = uVar917 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar810._8_8_ = 0;
    auVar810._0_8_ = uVar934 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar156._8_8_ = 0;
    auVar156._0_8_ = auStack_2f0._0_8_ * 2;
    auVar546._8_8_ = 0;
    auVar546._0_8_ = auStack_2f0._16_8_;
    auVar157._8_8_ = 0;
    auVar157._0_8_ = auStack_2f0._8_8_;
    auVar547._8_8_ = 0;
    auVar547._0_8_ = auStack_2f0._8_8_;
    auVar158._8_8_ = 0;
    auVar158._0_8_ = uStack_2d8;
    auVar548._8_8_ = 0;
    auVar548._0_8_ = unaff_R14;
    auVar811 = auVar158 * auVar548 + auVar811;
    uVar917 = auVar811._0_8_;
    in_RCX = auVar811._8_8_;
    auVar159._8_8_ = 0;
    auVar159._0_8_ = uVar917 & 0xfffffffffffff;
    auVar1 = auVar156 * auVar546 + auVar810 + auVar157 * auVar547 + auVar159 * ZEXT816(0x1000003d10)
    ;
    uVar935 = auVar1._0_8_;
    auVar812._8_8_ = 0;
    auVar812._0_8_ =
         (long)(((secp256k1_gej *)auStack_290._0_8_)->x).n + (uVar935 >> 0x34 | auVar1._8_8_ << 0xc)
    ;
    auVar160._8_8_ = 0;
    auVar160._0_8_ = uVar917 >> 0x34 | (long)in_RCX << 0xc;
    auVar812 = auVar160 * ZEXT816(0x1000003d10) + auVar812;
    uVar917 = auVar812._0_8_;
    in_R9 = auVar812._8_8_;
    uStack_2d8 = uVar917 & 0xfffffffffffff;
    auStack_2f0._16_8_ = uVar935 & 0xfffffffffffff;
    in_R8 = (secp256k1_gej *)((long)(psVar924->x).n + (uVar917 >> 0x34 | (long)in_R9 << 0xc));
    uStack_2c8 = 1;
    uStack_358._0_4_ = 0x14df0c;
    uStack_358._4_4_ = 0;
    auStack_2f0._0_8_ = (secp256k1_gej *)(uVar933 & 0xfffffffffffff);
    auStack_2f0._8_8_ = uVar934 & 0xfffffffffffff;
    psStack_2d0 = in_R8;
    auStack_1d0._0_8_ = psVar924;
    secp256k1_fe_verify((secp256k1_fe *)auStack_2f0);
    uVar923 = (int)x - 1;
    x = (secp256k1_fe *)(ulong)uVar923;
  } while (uVar923 != 0);
  psVar924 = (secp256k1_gej *)auStack_2f0;
  uStack_358._0_4_ = 0x14df2c;
  uStack_358._4_4_ = 0;
  secp256k1_fe_mul((secp256k1_fe *)psVar924,(secp256k1_fe *)psVar924,(secp256k1_fe *)auStack_2c0);
  psStack_270 = psStack_2d0;
  uStack_268 = uStack_2c8;
  stack0xfffffffffffffd80 = stack0xfffffffffffffd20;
  auStack_290._0_8_ = auStack_2f0._0_8_;
  auStack_290._8_8_ = auStack_2f0._8_8_;
  x = (secp256k1_fe *)0x2c;
  do {
    r = (secp256k1_ge *)auStack_290;
    uStack_358._0_4_ = 0x14df57;
    uStack_358._4_4_ = 0;
    psVar919 = (secp256k1_gej *)r;
    secp256k1_fe_verify((secp256k1_fe *)r);
    if (8 < (int)uStack_268) goto LAB_0014f67b;
    unaff_R12 = auStack_290._16_8_;
    unaff_R13 = uStack_278;
    auVar161._8_8_ = 0;
    auVar161._0_8_ = auStack_290._0_8_ * 2;
    auVar549._8_8_ = 0;
    auVar549._0_8_ = uStack_278;
    auVar162._8_8_ = 0;
    auVar162._0_8_ = auStack_290._8_8_ * 2;
    auVar550._8_8_ = 0;
    auVar550._0_8_ = auStack_290._16_8_;
    auVar163._8_8_ = 0;
    auVar163._0_8_ = psStack_270;
    auVar551._8_8_ = 0;
    auVar551._0_8_ = psStack_270;
    uVar917 = SUB168(auVar163 * auVar551,0);
    auVar164._8_8_ = 0;
    auVar164._0_8_ = uVar917 & 0xfffffffffffff;
    auVar1 = auVar162 * auVar550 + auVar161 * auVar549 + auVar164 * ZEXT816(0x1000003d10);
    uVar933 = auVar1._0_8_;
    auStack_1d0._0_8_ = uVar933 & 0xfffffffffffff;
    auVar813._8_8_ = 0;
    auVar813._0_8_ = uVar933 >> 0x34 | auVar1._8_8_ << 0xc;
    unaff_R14 = (secp256k1_gej *)((long)psStack_270 * 2);
    auVar165._8_8_ = 0;
    auVar165._0_8_ = auStack_290._0_8_;
    auVar552._8_8_ = 0;
    auVar552._0_8_ = unaff_R14;
    auVar166._8_8_ = 0;
    auVar166._0_8_ = auStack_290._8_8_ * 2;
    auVar553._8_8_ = 0;
    auVar553._0_8_ = uStack_278;
    auVar167._8_8_ = 0;
    auVar167._0_8_ = auStack_290._16_8_;
    auVar554._8_8_ = 0;
    auVar554._0_8_ = auStack_290._16_8_;
    auVar168._8_8_ = 0;
    auVar168._0_8_ = uVar917 >> 0x34 | SUB168(auVar163 * auVar551,8) << 0xc;
    auVar1 = auVar165 * auVar552 + auVar813 + auVar166 * auVar553 + auVar167 * auVar554 +
             auVar168 * ZEXT816(0x1000003d10);
    uVar917 = auVar1._0_8_;
    auVar814._8_8_ = 0;
    auVar814._0_8_ = uVar917 >> 0x34 | auVar1._8_8_ << 0xc;
    auStack_230._0_8_ = (uVar917 & 0xfffffffffffff) >> 0x30;
    psVar924 = (secp256k1_gej *)(uVar917 & 0xffffffffffff);
    auVar169._8_8_ = 0;
    auVar169._0_8_ = auStack_290._0_8_;
    auVar555._8_8_ = 0;
    auVar555._0_8_ = auStack_290._0_8_;
    auVar170._8_8_ = 0;
    auVar170._0_8_ = auStack_290._8_8_;
    auVar556._8_8_ = 0;
    auVar556._0_8_ = unaff_R14;
    auVar171._8_8_ = 0;
    auVar171._0_8_ = auStack_290._16_8_ * 2;
    auVar557._8_8_ = 0;
    auVar557._0_8_ = uStack_278;
    auVar1 = auVar170 * auVar556 + auVar814 + auVar171 * auVar557;
    uVar917 = auVar1._0_8_;
    auVar816._8_8_ = 0;
    auVar816._0_8_ = uVar917 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar558._8_8_ = 0;
    auVar558._0_8_ = (uVar917 & 0xfffffffffffff) << 4 | auStack_230._0_8_;
    auVar1 = auVar169 * auVar555 + ZEXT816(0x1000003d1) * auVar558;
    uVar933 = auVar1._0_8_;
    auVar815._8_8_ = 0;
    auVar815._0_8_ = uVar933 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar172._8_8_ = 0;
    auVar172._0_8_ = auStack_290._0_8_ * 2;
    auVar559._8_8_ = 0;
    auVar559._0_8_ = auStack_290._8_8_;
    auVar173._8_8_ = 0;
    auVar173._0_8_ = auStack_290._16_8_;
    auVar560._8_8_ = 0;
    auVar560._0_8_ = unaff_R14;
    auVar174._8_8_ = 0;
    auVar174._0_8_ = uStack_278;
    auVar561._8_8_ = 0;
    auVar561._0_8_ = uStack_278;
    auVar2 = auVar173 * auVar560 + auVar816 + auVar174 * auVar561;
    uVar917 = auVar2._0_8_;
    auVar175._8_8_ = 0;
    auVar175._0_8_ = uVar917 & 0xfffffffffffff;
    auVar1 = auVar172 * auVar559 + auVar815 + auVar175 * ZEXT816(0x1000003d10);
    uVar934 = auVar1._0_8_;
    auVar818._8_8_ = 0;
    auVar818._0_8_ = uVar917 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar817._8_8_ = 0;
    auVar817._0_8_ = uVar934 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar176._8_8_ = 0;
    auVar176._0_8_ = auStack_290._0_8_ * 2;
    auVar562._8_8_ = 0;
    auVar562._0_8_ = auStack_290._16_8_;
    auVar177._8_8_ = 0;
    auVar177._0_8_ = auStack_290._8_8_;
    auVar563._8_8_ = 0;
    auVar563._0_8_ = auStack_290._8_8_;
    auVar178._8_8_ = 0;
    auVar178._0_8_ = uStack_278;
    auVar564._8_8_ = 0;
    auVar564._0_8_ = unaff_R14;
    auVar818 = auVar178 * auVar564 + auVar818;
    uVar917 = auVar818._0_8_;
    in_RCX = auVar818._8_8_;
    auVar179._8_8_ = 0;
    auVar179._0_8_ = uVar917 & 0xfffffffffffff;
    auVar1 = auVar176 * auVar562 + auVar817 + auVar177 * auVar563 + auVar179 * ZEXT816(0x1000003d10)
    ;
    uVar935 = auVar1._0_8_;
    auVar819._8_8_ = 0;
    auVar819._0_8_ =
         (long)(((secp256k1_gej *)auStack_1d0._0_8_)->x).n + (uVar935 >> 0x34 | auVar1._8_8_ << 0xc)
    ;
    auVar180._8_8_ = 0;
    auVar180._0_8_ = uVar917 >> 0x34 | (long)in_RCX << 0xc;
    auVar819 = auVar180 * ZEXT816(0x1000003d10) + auVar819;
    uVar917 = auVar819._0_8_;
    in_R9 = auVar819._8_8_;
    uStack_278 = uVar917 & 0xfffffffffffff;
    auStack_290._16_8_ = uVar935 & 0xfffffffffffff;
    in_R8 = (secp256k1_gej *)((long)(psVar924->x).n + (uVar917 >> 0x34 | (long)in_R9 << 0xc));
    uStack_268 = 1;
    uStack_358._0_4_ = 0x14e1be;
    uStack_358._4_4_ = 0;
    auStack_290._0_8_ = (secp256k1_gej *)(uVar933 & 0xfffffffffffff);
    auStack_290._8_8_ = uVar934 & 0xfffffffffffff;
    psStack_270 = in_R8;
    auStack_200._0_8_ = psVar924;
    secp256k1_fe_verify((secp256k1_fe *)auStack_290);
    uVar923 = (int)x - 1;
    x = (secp256k1_fe *)(ulong)uVar923;
  } while (uVar923 != 0);
  psVar924 = (secp256k1_gej *)auStack_290;
  uStack_358._0_4_ = 0x14e1de;
  uStack_358._4_4_ = 0;
  secp256k1_fe_mul((secp256k1_fe *)psVar924,(secp256k1_fe *)psVar924,(secp256k1_fe *)auStack_2f0);
  psStack_1b0 = psStack_270;
  uStack_1a8 = uStack_268;
  stack0xfffffffffffffe40 = stack0xfffffffffffffd80;
  auStack_1d0._0_8_ = auStack_290._0_8_;
  auStack_1d0._8_8_ = auStack_290._8_8_;
  x = (secp256k1_fe *)0x58;
  do {
    r = (secp256k1_ge *)auStack_1d0;
    uStack_358._0_4_ = 0x14e209;
    uStack_358._4_4_ = 0;
    psVar919 = (secp256k1_gej *)r;
    secp256k1_fe_verify((secp256k1_fe *)r);
    if (8 < (int)uStack_1a8) goto LAB_0014f680;
    unaff_R12 = auStack_1d0._16_8_;
    unaff_R13 = uStack_1b8;
    auVar181._8_8_ = 0;
    auVar181._0_8_ = auStack_1d0._0_8_ * 2;
    auVar565._8_8_ = 0;
    auVar565._0_8_ = uStack_1b8;
    auVar182._8_8_ = 0;
    auVar182._0_8_ = auStack_1d0._8_8_ * 2;
    auVar566._8_8_ = 0;
    auVar566._0_8_ = auStack_1d0._16_8_;
    auVar183._8_8_ = 0;
    auVar183._0_8_ = psStack_1b0;
    auVar567._8_8_ = 0;
    auVar567._0_8_ = psStack_1b0;
    uVar917 = SUB168(auVar183 * auVar567,0);
    auVar184._8_8_ = 0;
    auVar184._0_8_ = uVar917 & 0xfffffffffffff;
    auVar1 = auVar182 * auVar566 + auVar181 * auVar565 + auVar184 * ZEXT816(0x1000003d10);
    uVar933 = auVar1._0_8_;
    auStack_200._0_8_ = uVar933 & 0xfffffffffffff;
    auVar820._8_8_ = 0;
    auVar820._0_8_ = uVar933 >> 0x34 | auVar1._8_8_ << 0xc;
    unaff_R14 = (secp256k1_gej *)((long)psStack_1b0 * 2);
    auVar185._8_8_ = 0;
    auVar185._0_8_ = auStack_1d0._0_8_;
    auVar568._8_8_ = 0;
    auVar568._0_8_ = unaff_R14;
    auVar186._8_8_ = 0;
    auVar186._0_8_ = auStack_1d0._8_8_ * 2;
    auVar569._8_8_ = 0;
    auVar569._0_8_ = uStack_1b8;
    auVar187._8_8_ = 0;
    auVar187._0_8_ = auStack_1d0._16_8_;
    auVar570._8_8_ = 0;
    auVar570._0_8_ = auStack_1d0._16_8_;
    auVar188._8_8_ = 0;
    auVar188._0_8_ = uVar917 >> 0x34 | SUB168(auVar183 * auVar567,8) << 0xc;
    auVar1 = auVar185 * auVar568 + auVar820 + auVar186 * auVar569 + auVar187 * auVar570 +
             auVar188 * ZEXT816(0x1000003d10);
    uVar917 = auVar1._0_8_;
    auVar821._8_8_ = 0;
    auVar821._0_8_ = uVar917 >> 0x34 | auVar1._8_8_ << 0xc;
    auStack_330._0_8_ = (uVar917 & 0xfffffffffffff) >> 0x30;
    psVar924 = (secp256k1_gej *)(uVar917 & 0xffffffffffff);
    auVar189._8_8_ = 0;
    auVar189._0_8_ = auStack_1d0._0_8_;
    auVar571._8_8_ = 0;
    auVar571._0_8_ = auStack_1d0._0_8_;
    auVar190._8_8_ = 0;
    auVar190._0_8_ = auStack_1d0._8_8_;
    auVar572._8_8_ = 0;
    auVar572._0_8_ = unaff_R14;
    auVar191._8_8_ = 0;
    auVar191._0_8_ = auStack_1d0._16_8_ * 2;
    auVar573._8_8_ = 0;
    auVar573._0_8_ = uStack_1b8;
    auVar1 = auVar190 * auVar572 + auVar821 + auVar191 * auVar573;
    uVar917 = auVar1._0_8_;
    auVar823._8_8_ = 0;
    auVar823._0_8_ = uVar917 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar574._8_8_ = 0;
    auVar574._0_8_ = (uVar917 & 0xfffffffffffff) << 4 | auStack_330._0_8_;
    auVar1 = auVar189 * auVar571 + ZEXT816(0x1000003d1) * auVar574;
    uVar933 = auVar1._0_8_;
    auVar822._8_8_ = 0;
    auVar822._0_8_ = uVar933 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar192._8_8_ = 0;
    auVar192._0_8_ = auStack_1d0._0_8_ * 2;
    auVar575._8_8_ = 0;
    auVar575._0_8_ = auStack_1d0._8_8_;
    auVar193._8_8_ = 0;
    auVar193._0_8_ = auStack_1d0._16_8_;
    auVar576._8_8_ = 0;
    auVar576._0_8_ = unaff_R14;
    auVar194._8_8_ = 0;
    auVar194._0_8_ = uStack_1b8;
    auVar577._8_8_ = 0;
    auVar577._0_8_ = uStack_1b8;
    auVar2 = auVar193 * auVar576 + auVar823 + auVar194 * auVar577;
    uVar917 = auVar2._0_8_;
    auVar195._8_8_ = 0;
    auVar195._0_8_ = uVar917 & 0xfffffffffffff;
    auVar1 = auVar192 * auVar575 + auVar822 + auVar195 * ZEXT816(0x1000003d10);
    uVar934 = auVar1._0_8_;
    auVar825._8_8_ = 0;
    auVar825._0_8_ = uVar917 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar824._8_8_ = 0;
    auVar824._0_8_ = uVar934 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar196._8_8_ = 0;
    auVar196._0_8_ = auStack_1d0._0_8_ * 2;
    auVar578._8_8_ = 0;
    auVar578._0_8_ = auStack_1d0._16_8_;
    auVar197._8_8_ = 0;
    auVar197._0_8_ = auStack_1d0._8_8_;
    auVar579._8_8_ = 0;
    auVar579._0_8_ = auStack_1d0._8_8_;
    auVar198._8_8_ = 0;
    auVar198._0_8_ = uStack_1b8;
    auVar580._8_8_ = 0;
    auVar580._0_8_ = unaff_R14;
    auVar825 = auVar198 * auVar580 + auVar825;
    uVar917 = auVar825._0_8_;
    in_RCX = auVar825._8_8_;
    auVar199._8_8_ = 0;
    auVar199._0_8_ = uVar917 & 0xfffffffffffff;
    auVar1 = auVar196 * auVar578 + auVar824 + auVar197 * auVar579 + auVar199 * ZEXT816(0x1000003d10)
    ;
    uVar935 = auVar1._0_8_;
    auVar826._8_8_ = 0;
    auVar826._0_8_ =
         (long)(((secp256k1_gej *)auStack_200._0_8_)->x).n + (uVar935 >> 0x34 | auVar1._8_8_ << 0xc)
    ;
    auVar200._8_8_ = 0;
    auVar200._0_8_ = uVar917 >> 0x34 | (long)in_RCX << 0xc;
    auVar826 = auVar200 * ZEXT816(0x1000003d10) + auVar826;
    uVar917 = auVar826._0_8_;
    in_R9 = auVar826._8_8_;
    uStack_1b8 = uVar917 & 0xfffffffffffff;
    auStack_1d0._16_8_ = uVar935 & 0xfffffffffffff;
    in_R8 = (secp256k1_gej *)((long)(psVar924->x).n + (uVar917 >> 0x34 | (long)in_R9 << 0xc));
    uStack_1a8 = 1;
    uStack_358._0_4_ = 0x14e46a;
    uStack_358._4_4_ = 0;
    auStack_230._0_8_ = psVar924;
    auStack_1d0._0_8_ = (secp256k1_gej *)(uVar933 & 0xfffffffffffff);
    auStack_1d0._8_8_ = uVar934 & 0xfffffffffffff;
    psStack_1b0 = in_R8;
    secp256k1_fe_verify((secp256k1_fe *)auStack_1d0);
    uVar923 = (int)x - 1;
    x = (secp256k1_fe *)(ulong)uVar923;
  } while (uVar923 != 0);
  psVar924 = (secp256k1_gej *)auStack_1d0;
  uStack_358._0_4_ = 0x14e48d;
  uStack_358._4_4_ = 0;
  secp256k1_fe_mul((secp256k1_fe *)psVar924,(secp256k1_fe *)psVar924,(secp256k1_fe *)auStack_290);
  psStack_1e0 = psStack_1b0;
  uStack_1d8 = uStack_1a8;
  stack0xfffffffffffffe10 = stack0xfffffffffffffe40;
  auStack_200._0_8_ = auStack_1d0._0_8_;
  auStack_200._8_8_ = auStack_1d0._8_8_;
  x = (secp256k1_fe *)0x2c;
  do {
    r = (secp256k1_ge *)auStack_200;
    uStack_358._0_4_ = 0x14e4b8;
    uStack_358._4_4_ = 0;
    psVar919 = (secp256k1_gej *)r;
    secp256k1_fe_verify((secp256k1_fe *)r);
    if (8 < (int)uStack_1d8) goto LAB_0014f685;
    unaff_R12 = auStack_200._16_8_;
    unaff_R13 = uStack_1e8;
    auVar201._8_8_ = 0;
    auVar201._0_8_ = auStack_200._0_8_ * 2;
    auVar581._8_8_ = 0;
    auVar581._0_8_ = uStack_1e8;
    auVar202._8_8_ = 0;
    auVar202._0_8_ = auStack_200._8_8_ * 2;
    auVar582._8_8_ = 0;
    auVar582._0_8_ = auStack_200._16_8_;
    auVar203._8_8_ = 0;
    auVar203._0_8_ = psStack_1e0;
    auVar583._8_8_ = 0;
    auVar583._0_8_ = psStack_1e0;
    uVar917 = SUB168(auVar203 * auVar583,0);
    auVar204._8_8_ = 0;
    auVar204._0_8_ = uVar917 & 0xfffffffffffff;
    auVar1 = auVar202 * auVar582 + auVar201 * auVar581 + auVar204 * ZEXT816(0x1000003d10);
    uVar933 = auVar1._0_8_;
    auStack_230._0_8_ = uVar933 & 0xfffffffffffff;
    auVar827._8_8_ = 0;
    auVar827._0_8_ = uVar933 >> 0x34 | auVar1._8_8_ << 0xc;
    unaff_R14 = (secp256k1_gej *)((long)psStack_1e0 * 2);
    auVar205._8_8_ = 0;
    auVar205._0_8_ = auStack_200._0_8_;
    auVar584._8_8_ = 0;
    auVar584._0_8_ = unaff_R14;
    auVar206._8_8_ = 0;
    auVar206._0_8_ = auStack_200._8_8_ * 2;
    auVar585._8_8_ = 0;
    auVar585._0_8_ = uStack_1e8;
    auVar207._8_8_ = 0;
    auVar207._0_8_ = auStack_200._16_8_;
    auVar586._8_8_ = 0;
    auVar586._0_8_ = auStack_200._16_8_;
    auVar208._8_8_ = 0;
    auVar208._0_8_ = uVar917 >> 0x34 | SUB168(auVar203 * auVar583,8) << 0xc;
    auVar1 = auVar205 * auVar584 + auVar827 + auVar206 * auVar585 + auVar207 * auVar586 +
             auVar208 * ZEXT816(0x1000003d10);
    uVar917 = auVar1._0_8_;
    auVar828._8_8_ = 0;
    auVar828._0_8_ = uVar917 >> 0x34 | auVar1._8_8_ << 0xc;
    psStack_350 = (secp256k1_gej *)((uVar917 & 0xfffffffffffff) >> 0x30);
    psVar924 = (secp256k1_gej *)(uVar917 & 0xffffffffffff);
    auVar209._8_8_ = 0;
    auVar209._0_8_ = auStack_200._0_8_;
    auVar587._8_8_ = 0;
    auVar587._0_8_ = auStack_200._0_8_;
    auVar210._8_8_ = 0;
    auVar210._0_8_ = auStack_200._8_8_;
    auVar588._8_8_ = 0;
    auVar588._0_8_ = unaff_R14;
    auVar211._8_8_ = 0;
    auVar211._0_8_ = auStack_200._16_8_ * 2;
    auVar589._8_8_ = 0;
    auVar589._0_8_ = uStack_1e8;
    auVar1 = auVar210 * auVar588 + auVar828 + auVar211 * auVar589;
    uVar917 = auVar1._0_8_;
    auVar830._8_8_ = 0;
    auVar830._0_8_ = uVar917 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar590._8_8_ = 0;
    auVar590._0_8_ = (uVar917 & 0xfffffffffffff) << 4 | (ulong)psStack_350;
    auVar1 = auVar209 * auVar587 + ZEXT816(0x1000003d1) * auVar590;
    uVar933 = auVar1._0_8_;
    auVar829._8_8_ = 0;
    auVar829._0_8_ = uVar933 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar212._8_8_ = 0;
    auVar212._0_8_ = auStack_200._0_8_ * 2;
    auVar591._8_8_ = 0;
    auVar591._0_8_ = auStack_200._8_8_;
    auVar213._8_8_ = 0;
    auVar213._0_8_ = auStack_200._16_8_;
    auVar592._8_8_ = 0;
    auVar592._0_8_ = unaff_R14;
    auVar214._8_8_ = 0;
    auVar214._0_8_ = uStack_1e8;
    auVar593._8_8_ = 0;
    auVar593._0_8_ = uStack_1e8;
    auVar2 = auVar213 * auVar592 + auVar830 + auVar214 * auVar593;
    uVar917 = auVar2._0_8_;
    auVar215._8_8_ = 0;
    auVar215._0_8_ = uVar917 & 0xfffffffffffff;
    auVar1 = auVar212 * auVar591 + auVar829 + auVar215 * ZEXT816(0x1000003d10);
    uVar934 = auVar1._0_8_;
    auVar832._8_8_ = 0;
    auVar832._0_8_ = uVar917 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar831._8_8_ = 0;
    auVar831._0_8_ = uVar934 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar216._8_8_ = 0;
    auVar216._0_8_ = auStack_200._0_8_ * 2;
    auVar594._8_8_ = 0;
    auVar594._0_8_ = auStack_200._16_8_;
    auVar217._8_8_ = 0;
    auVar217._0_8_ = auStack_200._8_8_;
    auVar595._8_8_ = 0;
    auVar595._0_8_ = auStack_200._8_8_;
    auVar218._8_8_ = 0;
    auVar218._0_8_ = uStack_1e8;
    auVar596._8_8_ = 0;
    auVar596._0_8_ = unaff_R14;
    auVar832 = auVar218 * auVar596 + auVar832;
    uVar917 = auVar832._0_8_;
    in_RCX = auVar832._8_8_;
    auVar219._8_8_ = 0;
    auVar219._0_8_ = uVar917 & 0xfffffffffffff;
    auVar1 = auVar216 * auVar594 + auVar831 + auVar217 * auVar595 + auVar219 * ZEXT816(0x1000003d10)
    ;
    uVar935 = auVar1._0_8_;
    auVar833._8_8_ = 0;
    auVar833._0_8_ =
         (long)(((secp256k1_gej *)auStack_230._0_8_)->x).n + (uVar935 >> 0x34 | auVar1._8_8_ << 0xc)
    ;
    auVar220._8_8_ = 0;
    auVar220._0_8_ = uVar917 >> 0x34 | (long)in_RCX << 0xc;
    auVar833 = auVar220 * ZEXT816(0x1000003d10) + auVar833;
    uVar917 = auVar833._0_8_;
    in_R9 = auVar833._8_8_;
    uStack_1e8 = uVar917 & 0xfffffffffffff;
    auStack_200._16_8_ = uVar935 & 0xfffffffffffff;
    in_R8 = (secp256k1_gej *)((long)(psVar924->x).n + (uVar917 >> 0x34 | (long)in_R9 << 0xc));
    uStack_1d8 = 1;
    uStack_358._0_4_ = 0x14e711;
    uStack_358._4_4_ = 0;
    auStack_330._0_8_ = psVar924;
    auStack_200._0_8_ = (secp256k1_gej *)(uVar933 & 0xfffffffffffff);
    auStack_200._8_8_ = uVar934 & 0xfffffffffffff;
    psStack_1e0 = in_R8;
    secp256k1_fe_verify((secp256k1_fe *)auStack_200);
    uVar923 = (int)x - 1;
    x = (secp256k1_fe *)(ulong)uVar923;
  } while (uVar923 != 0);
  psVar924 = (secp256k1_gej *)auStack_200;
  uStack_358._0_4_ = 0x14e731;
  uStack_358._4_4_ = 0;
  secp256k1_fe_mul((secp256k1_fe *)psVar924,(secp256k1_fe *)psVar924,(secp256k1_fe *)auStack_2f0);
  psStack_210 = psStack_1e0;
  uStack_208 = uStack_1d8;
  stack0xfffffffffffffde0 = stack0xfffffffffffffe10;
  auStack_230._0_8_ = auStack_200._0_8_;
  auStack_230._8_8_ = auStack_200._8_8_;
  x = (secp256k1_fe *)0x3;
  do {
    r = (secp256k1_ge *)auStack_230;
    uStack_358._0_4_ = 0x14e75c;
    uStack_358._4_4_ = 0;
    psVar919 = (secp256k1_gej *)r;
    secp256k1_fe_verify((secp256k1_fe *)r);
    if (8 < (int)uStack_208) goto LAB_0014f68a;
    unaff_R12 = auStack_230._16_8_;
    unaff_R13 = uStack_218;
    auVar221._8_8_ = 0;
    auVar221._0_8_ = auStack_230._0_8_ * 2;
    auVar597._8_8_ = 0;
    auVar597._0_8_ = uStack_218;
    auVar222._8_8_ = 0;
    auVar222._0_8_ = auStack_230._8_8_ * 2;
    auVar598._8_8_ = 0;
    auVar598._0_8_ = auStack_230._16_8_;
    auVar223._8_8_ = 0;
    auVar223._0_8_ = psStack_210;
    auVar599._8_8_ = 0;
    auVar599._0_8_ = psStack_210;
    uVar917 = SUB168(auVar223 * auVar599,0);
    auVar224._8_8_ = 0;
    auVar224._0_8_ = uVar917 & 0xfffffffffffff;
    auVar1 = auVar222 * auVar598 + auVar221 * auVar597 + auVar224 * ZEXT816(0x1000003d10);
    uVar933 = auVar1._0_8_;
    auStack_330._0_8_ = uVar933 & 0xfffffffffffff;
    auVar834._8_8_ = 0;
    auVar834._0_8_ = uVar933 >> 0x34 | auVar1._8_8_ << 0xc;
    unaff_R14 = (secp256k1_gej *)((long)psStack_210 * 2);
    auVar225._8_8_ = 0;
    auVar225._0_8_ = auStack_230._0_8_;
    auVar600._8_8_ = 0;
    auVar600._0_8_ = unaff_R14;
    auVar226._8_8_ = 0;
    auVar226._0_8_ = auStack_230._8_8_ * 2;
    auVar601._8_8_ = 0;
    auVar601._0_8_ = uStack_218;
    auVar227._8_8_ = 0;
    auVar227._0_8_ = auStack_230._16_8_;
    auVar602._8_8_ = 0;
    auVar602._0_8_ = auStack_230._16_8_;
    auVar228._8_8_ = 0;
    auVar228._0_8_ = uVar917 >> 0x34 | SUB168(auVar223 * auVar599,8) << 0xc;
    auVar1 = auVar225 * auVar600 + auVar834 + auVar226 * auVar601 + auVar227 * auVar602 +
             auVar228 * ZEXT816(0x1000003d10);
    uVar917 = auVar1._0_8_;
    auVar835._8_8_ = 0;
    auVar835._0_8_ = uVar917 >> 0x34 | auVar1._8_8_ << 0xc;
    psStack_348 = (secp256k1_gej *)((uVar917 & 0xfffffffffffff) >> 0x30);
    psVar924 = (secp256k1_gej *)(uVar917 & 0xffffffffffff);
    auVar229._8_8_ = 0;
    auVar229._0_8_ = auStack_230._0_8_;
    auVar603._8_8_ = 0;
    auVar603._0_8_ = auStack_230._0_8_;
    auVar230._8_8_ = 0;
    auVar230._0_8_ = auStack_230._8_8_;
    auVar604._8_8_ = 0;
    auVar604._0_8_ = unaff_R14;
    auVar231._8_8_ = 0;
    auVar231._0_8_ = auStack_230._16_8_ * 2;
    auVar605._8_8_ = 0;
    auVar605._0_8_ = uStack_218;
    auVar1 = auVar230 * auVar604 + auVar835 + auVar231 * auVar605;
    uVar917 = auVar1._0_8_;
    auVar837._8_8_ = 0;
    auVar837._0_8_ = uVar917 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar606._8_8_ = 0;
    auVar606._0_8_ = (uVar917 & 0xfffffffffffff) << 4 | (ulong)psStack_348;
    auVar1 = auVar229 * auVar603 + ZEXT816(0x1000003d1) * auVar606;
    uVar933 = auVar1._0_8_;
    auVar836._8_8_ = 0;
    auVar836._0_8_ = uVar933 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar232._8_8_ = 0;
    auVar232._0_8_ = auStack_230._0_8_ * 2;
    auVar607._8_8_ = 0;
    auVar607._0_8_ = auStack_230._8_8_;
    auVar233._8_8_ = 0;
    auVar233._0_8_ = auStack_230._16_8_;
    auVar608._8_8_ = 0;
    auVar608._0_8_ = unaff_R14;
    auVar234._8_8_ = 0;
    auVar234._0_8_ = uStack_218;
    auVar609._8_8_ = 0;
    auVar609._0_8_ = uStack_218;
    auVar2 = auVar233 * auVar608 + auVar837 + auVar234 * auVar609;
    uVar917 = auVar2._0_8_;
    auVar235._8_8_ = 0;
    auVar235._0_8_ = uVar917 & 0xfffffffffffff;
    auVar1 = auVar232 * auVar607 + auVar836 + auVar235 * ZEXT816(0x1000003d10);
    uVar934 = auVar1._0_8_;
    auVar839._8_8_ = 0;
    auVar839._0_8_ = uVar917 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar838._8_8_ = 0;
    auVar838._0_8_ = uVar934 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar236._8_8_ = 0;
    auVar236._0_8_ = auStack_230._0_8_ * 2;
    auVar610._8_8_ = 0;
    auVar610._0_8_ = auStack_230._16_8_;
    auVar237._8_8_ = 0;
    auVar237._0_8_ = auStack_230._8_8_;
    auVar611._8_8_ = 0;
    auVar611._0_8_ = auStack_230._8_8_;
    auVar238._8_8_ = 0;
    auVar238._0_8_ = uStack_218;
    auVar612._8_8_ = 0;
    auVar612._0_8_ = unaff_R14;
    auVar839 = auVar238 * auVar612 + auVar839;
    uVar917 = auVar839._0_8_;
    in_RCX = auVar839._8_8_;
    auVar239._8_8_ = 0;
    auVar239._0_8_ = uVar917 & 0xfffffffffffff;
    auVar1 = auVar236 * auVar610 + auVar838 + auVar237 * auVar611 + auVar239 * ZEXT816(0x1000003d10)
    ;
    uVar935 = auVar1._0_8_;
    auVar840._8_8_ = 0;
    auVar840._0_8_ =
         (long)(((secp256k1_gej *)auStack_330._0_8_)->x).n + (uVar935 >> 0x34 | auVar1._8_8_ << 0xc)
    ;
    auVar240._8_8_ = 0;
    auVar240._0_8_ = uVar917 >> 0x34 | (long)in_RCX << 0xc;
    auVar840 = auVar240 * ZEXT816(0x1000003d10) + auVar840;
    uVar917 = auVar840._0_8_;
    in_R9 = auVar840._8_8_;
    uStack_218 = uVar917 & 0xfffffffffffff;
    auStack_230._16_8_ = uVar935 & 0xfffffffffffff;
    in_R8 = (secp256k1_gej *)((long)(psVar924->x).n + (uVar917 >> 0x34 | (long)in_R9 << 0xc));
    uStack_208 = 1;
    uStack_358._0_4_ = 0x14e9af;
    uStack_358._4_4_ = 0;
    psStack_350 = psVar924;
    auStack_230._0_8_ = (secp256k1_gej *)(uVar933 & 0xfffffffffffff);
    auStack_230._8_8_ = uVar934 & 0xfffffffffffff;
    psStack_210 = in_R8;
    secp256k1_fe_verify((secp256k1_fe *)auStack_230);
    uVar923 = (int)x - 1;
    x = (secp256k1_fe *)(ulong)uVar923;
  } while (uVar923 != 0);
  psVar925 = (secp256k1_gej *)auStack_230;
  uStack_358._0_4_ = 0x14e9d2;
  uStack_358._4_4_ = 0;
  secp256k1_fe_mul((secp256k1_fe *)psVar925,(secp256k1_fe *)psVar925,&sStack_138);
  psStack_310 = psStack_210;
  uStack_308 = uStack_208;
  stack0xfffffffffffffce0 = stack0xfffffffffffffde0;
  auStack_330._0_8_ = auStack_230._0_8_;
  auStack_330._8_8_ = auStack_230._8_8_;
  x = (secp256k1_fe *)0x17;
  do {
    r = (secp256k1_ge *)auStack_330;
    uStack_358._0_4_ = 0x14e9fc;
    uStack_358._4_4_ = 0;
    psVar919 = (secp256k1_gej *)r;
    secp256k1_fe_verify((secp256k1_fe *)r);
    psVar924 = psVar925;
    if (8 < (int)uStack_308) goto LAB_0014f68f;
    unaff_R12 = auStack_330._16_8_;
    unaff_R13 = uStack_318;
    auVar241._8_8_ = 0;
    auVar241._0_8_ = auStack_330._0_8_ * 2;
    auVar613._8_8_ = 0;
    auVar613._0_8_ = uStack_318;
    auVar242._8_8_ = 0;
    auVar242._0_8_ = auStack_330._8_8_ * 2;
    auVar614._8_8_ = 0;
    auVar614._0_8_ = auStack_330._16_8_;
    auVar243._8_8_ = 0;
    auVar243._0_8_ = psStack_310;
    auVar615._8_8_ = 0;
    auVar615._0_8_ = psStack_310;
    uVar917 = SUB168(auVar243 * auVar615,0);
    auVar244._8_8_ = 0;
    auVar244._0_8_ = uVar917 & 0xfffffffffffff;
    auVar1 = auVar242 * auVar614 + auVar241 * auVar613 + auVar244 * ZEXT816(0x1000003d10);
    uVar933 = auVar1._0_8_;
    psStack_350 = (secp256k1_gej *)(uVar933 & 0xfffffffffffff);
    auVar841._8_8_ = 0;
    auVar841._0_8_ = uVar933 >> 0x34 | auVar1._8_8_ << 0xc;
    unaff_R14 = (secp256k1_gej *)((long)psStack_310 * 2);
    auVar245._8_8_ = 0;
    auVar245._0_8_ = auStack_330._0_8_;
    auVar616._8_8_ = 0;
    auVar616._0_8_ = unaff_R14;
    auVar246._8_8_ = 0;
    auVar246._0_8_ = auStack_330._8_8_ * 2;
    auVar617._8_8_ = 0;
    auVar617._0_8_ = uStack_318;
    auVar247._8_8_ = 0;
    auVar247._0_8_ = auStack_330._16_8_;
    auVar618._8_8_ = 0;
    auVar618._0_8_ = auStack_330._16_8_;
    auVar248._8_8_ = 0;
    auVar248._0_8_ = uVar917 >> 0x34 | SUB168(auVar243 * auVar615,8) << 0xc;
    auVar1 = auVar245 * auVar616 + auVar841 + auVar246 * auVar617 + auVar247 * auVar618 +
             auVar248 * ZEXT816(0x1000003d10);
    uVar917 = auVar1._0_8_;
    auVar842._8_8_ = 0;
    auVar842._0_8_ = uVar917 >> 0x34 | auVar1._8_8_ << 0xc;
    uStack_340 = (uVar917 & 0xfffffffffffff) >> 0x30;
    psVar925 = (secp256k1_gej *)(uVar917 & 0xffffffffffff);
    auVar249._8_8_ = 0;
    auVar249._0_8_ = auStack_330._0_8_;
    auVar619._8_8_ = 0;
    auVar619._0_8_ = auStack_330._0_8_;
    auVar250._8_8_ = 0;
    auVar250._0_8_ = auStack_330._8_8_;
    auVar620._8_8_ = 0;
    auVar620._0_8_ = unaff_R14;
    auVar251._8_8_ = 0;
    auVar251._0_8_ = auStack_330._16_8_ * 2;
    auVar621._8_8_ = 0;
    auVar621._0_8_ = uStack_318;
    auVar1 = auVar250 * auVar620 + auVar842 + auVar251 * auVar621;
    uVar917 = auVar1._0_8_;
    auVar844._8_8_ = 0;
    auVar844._0_8_ = uVar917 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar622._8_8_ = 0;
    auVar622._0_8_ = (uVar917 & 0xfffffffffffff) << 4 | uStack_340;
    auVar1 = auVar249 * auVar619 + ZEXT816(0x1000003d1) * auVar622;
    uVar933 = auVar1._0_8_;
    auVar843._8_8_ = 0;
    auVar843._0_8_ = uVar933 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar252._8_8_ = 0;
    auVar252._0_8_ = auStack_330._0_8_ * 2;
    auVar623._8_8_ = 0;
    auVar623._0_8_ = auStack_330._8_8_;
    auVar253._8_8_ = 0;
    auVar253._0_8_ = auStack_330._16_8_;
    auVar624._8_8_ = 0;
    auVar624._0_8_ = unaff_R14;
    auVar254._8_8_ = 0;
    auVar254._0_8_ = uStack_318;
    auVar625._8_8_ = 0;
    auVar625._0_8_ = uStack_318;
    auVar2 = auVar253 * auVar624 + auVar844 + auVar254 * auVar625;
    uVar917 = auVar2._0_8_;
    auVar255._8_8_ = 0;
    auVar255._0_8_ = uVar917 & 0xfffffffffffff;
    auVar1 = auVar252 * auVar623 + auVar843 + auVar255 * ZEXT816(0x1000003d10);
    uVar934 = auVar1._0_8_;
    auVar846._8_8_ = 0;
    auVar846._0_8_ = uVar917 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar845._8_8_ = 0;
    auVar845._0_8_ = uVar934 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar256._8_8_ = 0;
    auVar256._0_8_ = auStack_330._0_8_ * 2;
    auVar626._8_8_ = 0;
    auVar626._0_8_ = auStack_330._16_8_;
    auVar257._8_8_ = 0;
    auVar257._0_8_ = auStack_330._8_8_;
    auVar627._8_8_ = 0;
    auVar627._0_8_ = auStack_330._8_8_;
    auVar258._8_8_ = 0;
    auVar258._0_8_ = uStack_318;
    auVar628._8_8_ = 0;
    auVar628._0_8_ = unaff_R14;
    auVar846 = auVar258 * auVar628 + auVar846;
    uVar917 = auVar846._0_8_;
    in_RCX = auVar846._8_8_;
    auVar259._8_8_ = 0;
    auVar259._0_8_ = uVar917 & 0xfffffffffffff;
    auVar1 = auVar256 * auVar626 + auVar845 + auVar257 * auVar627 + auVar259 * ZEXT816(0x1000003d10)
    ;
    uVar935 = auVar1._0_8_;
    auVar847._8_8_ = 0;
    auVar847._0_8_ = (long)(psStack_350->x).n + (uVar935 >> 0x34 | auVar1._8_8_ << 0xc);
    auVar260._8_8_ = 0;
    auVar260._0_8_ = uVar917 >> 0x34 | (long)in_RCX << 0xc;
    auVar847 = auVar260 * ZEXT816(0x1000003d10) + auVar847;
    uVar917 = auVar847._0_8_;
    in_R9 = auVar847._8_8_;
    uStack_318 = uVar917 & 0xfffffffffffff;
    auStack_330._16_8_ = uVar935 & 0xfffffffffffff;
    in_R8 = (secp256k1_gej *)((long)(psVar925->x).n + (uVar917 >> 0x34 | (long)in_R9 << 0xc));
    psVar924 = (secp256k1_gej *)auStack_330;
    uStack_308 = 1;
    uStack_358._0_4_ = 0x14ec46;
    uStack_358._4_4_ = 0;
    psStack_348 = psVar925;
    auStack_330._0_8_ = (secp256k1_gej *)(uVar933 & 0xfffffffffffff);
    auStack_330._8_8_ = uVar934 & 0xfffffffffffff;
    psStack_310 = in_R8;
    secp256k1_fe_verify((secp256k1_fe *)psVar924);
    uVar923 = (int)x - 1;
    x = (secp256k1_fe *)(ulong)uVar923;
  } while (uVar923 != 0);
  uStack_358._0_4_ = 0x14ec61;
  uStack_358._4_4_ = 0;
  secp256k1_fe_mul((secp256k1_fe *)psVar924,(secp256k1_fe *)psVar924,(secp256k1_fe *)auStack_2c0);
  x = (secp256k1_fe *)0x6;
  do {
    r = (secp256k1_ge *)auStack_330;
    uStack_358._0_4_ = 0x14ec6e;
    uStack_358._4_4_ = 0;
    psVar919 = (secp256k1_gej *)r;
    secp256k1_fe_verify((secp256k1_fe *)r);
    if (8 < (int)uStack_308) goto LAB_0014f694;
    unaff_R12 = auStack_330._16_8_;
    unaff_R13 = uStack_318;
    unaff_R15 = (secp256k1_gej *)0xfffffffffffff;
    auVar261._8_8_ = 0;
    auVar261._0_8_ = auStack_330._0_8_ * 2;
    auVar629._8_8_ = 0;
    auVar629._0_8_ = uStack_318;
    auVar262._8_8_ = 0;
    auVar262._0_8_ = auStack_330._8_8_ * 2;
    auVar630._8_8_ = 0;
    auVar630._0_8_ = auStack_330._16_8_;
    auVar263._8_8_ = 0;
    auVar263._0_8_ = psStack_310;
    auVar631._8_8_ = 0;
    auVar631._0_8_ = psStack_310;
    uVar917 = SUB168(auVar263 * auVar631,0);
    auVar264._8_8_ = 0;
    auVar264._0_8_ = uVar917 & 0xfffffffffffff;
    auVar1 = auVar262 * auVar630 + auVar261 * auVar629 + auVar264 * ZEXT816(0x1000003d10);
    uVar933 = auVar1._0_8_;
    psStack_350 = (secp256k1_gej *)(uVar933 & 0xfffffffffffff);
    auVar848._8_8_ = 0;
    auVar848._0_8_ = uVar933 >> 0x34 | auVar1._8_8_ << 0xc;
    unaff_R14 = (secp256k1_gej *)((long)psStack_310 * 2);
    auVar265._8_8_ = 0;
    auVar265._0_8_ = auStack_330._0_8_;
    auVar632._8_8_ = 0;
    auVar632._0_8_ = unaff_R14;
    auVar266._8_8_ = 0;
    auVar266._0_8_ = auStack_330._8_8_ * 2;
    auVar633._8_8_ = 0;
    auVar633._0_8_ = uStack_318;
    auVar267._8_8_ = 0;
    auVar267._0_8_ = auStack_330._16_8_;
    auVar634._8_8_ = 0;
    auVar634._0_8_ = auStack_330._16_8_;
    auVar268._8_8_ = 0;
    auVar268._0_8_ = uVar917 >> 0x34 | SUB168(auVar263 * auVar631,8) << 0xc;
    auVar1 = auVar265 * auVar632 + auVar848 + auVar266 * auVar633 + auVar267 * auVar634 +
             auVar268 * ZEXT816(0x1000003d10);
    uVar917 = auVar1._0_8_;
    auVar849._8_8_ = 0;
    auVar849._0_8_ = uVar917 >> 0x34 | auVar1._8_8_ << 0xc;
    uStack_340 = (uVar917 & 0xfffffffffffff) >> 0x30;
    psVar924 = (secp256k1_gej *)(uVar917 & 0xffffffffffff);
    auVar269._8_8_ = 0;
    auVar269._0_8_ = auStack_330._0_8_;
    auVar635._8_8_ = 0;
    auVar635._0_8_ = auStack_330._0_8_;
    auVar270._8_8_ = 0;
    auVar270._0_8_ = auStack_330._8_8_;
    auVar636._8_8_ = 0;
    auVar636._0_8_ = unaff_R14;
    auVar271._8_8_ = 0;
    auVar271._0_8_ = auStack_330._16_8_ * 2;
    auVar637._8_8_ = 0;
    auVar637._0_8_ = uStack_318;
    auVar1 = auVar270 * auVar636 + auVar849 + auVar271 * auVar637;
    uVar917 = auVar1._0_8_;
    auVar851._8_8_ = 0;
    auVar851._0_8_ = uVar917 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar638._8_8_ = 0;
    auVar638._0_8_ = (uVar917 & 0xfffffffffffff) << 4 | uStack_340;
    auVar1 = auVar269 * auVar635 + ZEXT816(0x1000003d1) * auVar638;
    uVar933 = auVar1._0_8_;
    auVar850._8_8_ = 0;
    auVar850._0_8_ = uVar933 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar272._8_8_ = 0;
    auVar272._0_8_ = auStack_330._0_8_ * 2;
    auVar639._8_8_ = 0;
    auVar639._0_8_ = auStack_330._8_8_;
    auVar273._8_8_ = 0;
    auVar273._0_8_ = auStack_330._16_8_;
    auVar640._8_8_ = 0;
    auVar640._0_8_ = unaff_R14;
    auVar274._8_8_ = 0;
    auVar274._0_8_ = uStack_318;
    auVar641._8_8_ = 0;
    auVar641._0_8_ = uStack_318;
    auVar2 = auVar273 * auVar640 + auVar851 + auVar274 * auVar641;
    uVar917 = auVar2._0_8_;
    auVar275._8_8_ = 0;
    auVar275._0_8_ = uVar917 & 0xfffffffffffff;
    auVar1 = auVar272 * auVar639 + auVar850 + auVar275 * ZEXT816(0x1000003d10);
    uVar934 = auVar1._0_8_;
    auVar853._8_8_ = 0;
    auVar853._0_8_ = uVar917 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar852._8_8_ = 0;
    auVar852._0_8_ = uVar934 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar276._8_8_ = 0;
    auVar276._0_8_ = auStack_330._0_8_ * 2;
    auVar642._8_8_ = 0;
    auVar642._0_8_ = auStack_330._16_8_;
    auVar277._8_8_ = 0;
    auVar277._0_8_ = auStack_330._8_8_;
    auVar643._8_8_ = 0;
    auVar643._0_8_ = auStack_330._8_8_;
    auVar278._8_8_ = 0;
    auVar278._0_8_ = uStack_318;
    auVar644._8_8_ = 0;
    auVar644._0_8_ = unaff_R14;
    auVar853 = auVar278 * auVar644 + auVar853;
    uVar917 = auVar853._0_8_;
    in_RCX = auVar853._8_8_;
    auVar279._8_8_ = 0;
    auVar279._0_8_ = uVar917 & 0xfffffffffffff;
    auVar1 = auVar276 * auVar642 + auVar852 + auVar277 * auVar643 + auVar279 * ZEXT816(0x1000003d10)
    ;
    uVar935 = auVar1._0_8_;
    auVar854._8_8_ = 0;
    auVar854._0_8_ = (long)(psStack_350->x).n + (uVar935 >> 0x34 | auVar1._8_8_ << 0xc);
    auVar280._8_8_ = 0;
    auVar280._0_8_ = uVar917 >> 0x34 | (long)in_RCX << 0xc;
    auVar854 = auVar280 * ZEXT816(0x1000003d10) + auVar854;
    uVar917 = auVar854._0_8_;
    in_R9 = auVar854._8_8_;
    uStack_318 = uVar917 & 0xfffffffffffff;
    auStack_330._16_8_ = uVar935 & 0xfffffffffffff;
    in_R8 = (secp256k1_gej *)((long)(psVar924->x).n + (uVar917 >> 0x34 | (long)in_R9 << 0xc));
    r = (secp256k1_ge *)auStack_330;
    uStack_308 = 1;
    uStack_358._0_4_ = 0x14eeb8;
    uStack_358._4_4_ = 0;
    psStack_348 = psVar924;
    auStack_330._0_8_ = (secp256k1_gej *)(uVar933 & 0xfffffffffffff);
    auStack_330._8_8_ = uVar934 & 0xfffffffffffff;
    psStack_310 = in_R8;
    secp256k1_fe_verify((secp256k1_fe *)r);
    uVar923 = (int)x - 1;
    x = (secp256k1_fe *)(ulong)uVar923;
  } while (uVar923 != 0);
  x = (secp256k1_fe *)auStack_330;
  uStack_358._0_4_ = 0x14eed8;
  uStack_358._4_4_ = 0;
  psVar925 = (secp256k1_gej *)x;
  secp256k1_fe_mul(x,x,&sStack_108);
  uStack_358._0_4_ = 0x14eee0;
  uStack_358._4_4_ = 0;
  psVar910 = (secp256k1_gej *)x;
  secp256k1_fe_verify(x);
  if (8 < (int)uStack_308) goto LAB_0014f6ad;
  unaff_R12 = auStack_330._16_8_;
  unaff_R13 = uStack_318;
  unaff_R15 = (secp256k1_gej *)0xfffffffffffff;
  auVar281._8_8_ = 0;
  auVar281._0_8_ = auStack_330._0_8_ * 2;
  auVar645._8_8_ = 0;
  auVar645._0_8_ = uStack_318;
  auVar282._8_8_ = 0;
  auVar282._0_8_ = auStack_330._8_8_ * 2;
  auVar646._8_8_ = 0;
  auVar646._0_8_ = auStack_330._16_8_;
  auVar283._8_8_ = 0;
  auVar283._0_8_ = psStack_310;
  auVar647._8_8_ = 0;
  auVar647._0_8_ = psStack_310;
  uVar917 = SUB168(auVar283 * auVar647,0);
  auVar284._8_8_ = 0;
  auVar284._0_8_ = uVar917 & 0xfffffffffffff;
  auVar1 = auVar282 * auVar646 + auVar281 * auVar645 + auVar284 * ZEXT816(0x1000003d10);
  uVar933 = auVar1._0_8_;
  psStack_350 = (secp256k1_gej *)(uVar933 & 0xfffffffffffff);
  auVar855._8_8_ = 0;
  auVar855._0_8_ = uVar933 >> 0x34 | auVar1._8_8_ << 0xc;
  unaff_R14 = (secp256k1_gej *)((long)psStack_310 * 2);
  auVar285._8_8_ = 0;
  auVar285._0_8_ = auStack_330._0_8_;
  auVar648._8_8_ = 0;
  auVar648._0_8_ = unaff_R14;
  auVar286._8_8_ = 0;
  auVar286._0_8_ = auStack_330._8_8_ * 2;
  auVar649._8_8_ = 0;
  auVar649._0_8_ = uStack_318;
  auVar287._8_8_ = 0;
  auVar287._0_8_ = auStack_330._16_8_;
  auVar650._8_8_ = 0;
  auVar650._0_8_ = auStack_330._16_8_;
  auVar288._8_8_ = 0;
  auVar288._0_8_ = uVar917 >> 0x34 | SUB168(auVar283 * auVar647,8) << 0xc;
  auVar1 = auVar285 * auVar648 + auVar855 + auVar286 * auVar649 + auVar287 * auVar650 +
           auVar288 * ZEXT816(0x1000003d10);
  uVar917 = auVar1._0_8_;
  auVar856._8_8_ = 0;
  auVar856._0_8_ = uVar917 >> 0x34 | auVar1._8_8_ << 0xc;
  uStack_340 = (uVar917 & 0xfffffffffffff) >> 0x30;
  psVar925 = (secp256k1_gej *)(uVar917 & 0xffffffffffff);
  auVar289._8_8_ = 0;
  auVar289._0_8_ = auStack_330._0_8_;
  auVar651._8_8_ = 0;
  auVar651._0_8_ = auStack_330._0_8_;
  auVar290._8_8_ = 0;
  auVar290._0_8_ = auStack_330._8_8_;
  auVar652._8_8_ = 0;
  auVar652._0_8_ = unaff_R14;
  auVar291._8_8_ = 0;
  auVar291._0_8_ = auStack_330._16_8_ * 2;
  auVar653._8_8_ = 0;
  auVar653._0_8_ = uStack_318;
  auVar1 = auVar290 * auVar652 + auVar856 + auVar291 * auVar653;
  uVar917 = auVar1._0_8_;
  auVar858._8_8_ = 0;
  auVar858._0_8_ = uVar917 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar654._8_8_ = 0;
  auVar654._0_8_ = (uVar917 & 0xfffffffffffff) << 4 | uStack_340;
  auVar1 = auVar289 * auVar651 + ZEXT816(0x1000003d1) * auVar654;
  uVar933 = auVar1._0_8_;
  auVar857._8_8_ = 0;
  auVar857._0_8_ = uVar933 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar292._8_8_ = 0;
  auVar292._0_8_ = auStack_330._0_8_ * 2;
  auVar655._8_8_ = 0;
  auVar655._0_8_ = auStack_330._8_8_;
  auVar293._8_8_ = 0;
  auVar293._0_8_ = auStack_330._16_8_;
  auVar656._8_8_ = 0;
  auVar656._0_8_ = unaff_R14;
  auVar294._8_8_ = 0;
  auVar294._0_8_ = uStack_318;
  auVar657._8_8_ = 0;
  auVar657._0_8_ = uStack_318;
  auVar2 = auVar293 * auVar656 + auVar858 + auVar294 * auVar657;
  uVar917 = auVar2._0_8_;
  auVar295._8_8_ = 0;
  auVar295._0_8_ = uVar917 & 0xfffffffffffff;
  auVar1 = auVar292 * auVar655 + auVar857 + auVar295 * ZEXT816(0x1000003d10);
  uVar934 = auVar1._0_8_;
  auVar860._8_8_ = 0;
  auVar860._0_8_ = uVar917 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar859._8_8_ = 0;
  auVar859._0_8_ = uVar934 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar296._8_8_ = 0;
  auVar296._0_8_ = auStack_330._0_8_ * 2;
  auVar658._8_8_ = 0;
  auVar658._0_8_ = auStack_330._16_8_;
  auVar297._8_8_ = 0;
  auVar297._0_8_ = auStack_330._8_8_;
  auVar659._8_8_ = 0;
  auVar659._0_8_ = auStack_330._8_8_;
  auVar298._8_8_ = 0;
  auVar298._0_8_ = uStack_318;
  auVar660._8_8_ = 0;
  auVar660._0_8_ = unaff_R14;
  auVar860 = auVar298 * auVar660 + auVar860;
  uVar917 = auVar860._0_8_;
  in_RCX = auVar860._8_8_;
  auVar299._8_8_ = 0;
  auVar299._0_8_ = uVar917 & 0xfffffffffffff;
  auVar1 = auVar296 * auVar658 + auVar859 + auVar297 * auVar659 + auVar299 * ZEXT816(0x1000003d10);
  uVar935 = auVar1._0_8_;
  r = (secp256k1_ge *)(uVar917 >> 0x34 | (long)in_RCX << 0xc);
  auVar861._8_8_ = 0;
  auVar861._0_8_ = (long)(psStack_350->x).n + (uVar935 >> 0x34 | auVar1._8_8_ << 0xc);
  auVar300._8_8_ = 0;
  auVar300._0_8_ = r;
  auVar861 = auVar300 * ZEXT816(0x1000003d10) + auVar861;
  uVar917 = auVar861._0_8_;
  in_R9 = auVar861._8_8_;
  uStack_318 = uVar917 & 0xfffffffffffff;
  auStack_330._16_8_ = uVar935 & 0xfffffffffffff;
  in_R8 = (secp256k1_gej *)((long)(psVar925->x).n + (uVar917 >> 0x34 | (long)in_R9 << 0xc));
  uStack_308 = 1;
  uStack_358._0_4_ = 0x14f121;
  uStack_358._4_4_ = 0;
  psStack_348 = psVar925;
  auStack_330._0_8_ = (secp256k1_gej *)(uVar933 & 0xfffffffffffff);
  auStack_330._8_8_ = uVar934 & 0xfffffffffffff;
  psStack_310 = in_R8;
  secp256k1_fe_verify(x);
  uStack_358._0_4_ = 0x14f129;
  uStack_358._4_4_ = 0;
  psVar910 = (secp256k1_gej *)x;
  secp256k1_fe_verify(x);
  psVar924 = psStack_2f8;
  if (8 < (int)uStack_308) goto LAB_0014f6b2;
  unaff_R12 = auStack_330._16_8_;
  unaff_R13 = uStack_318;
  unaff_R15 = (secp256k1_gej *)0xfffffffffffff;
  auVar301._8_8_ = 0;
  auVar301._0_8_ = auStack_330._0_8_ * 2;
  auVar661._8_8_ = 0;
  auVar661._0_8_ = uStack_318;
  auVar302._8_8_ = 0;
  auVar302._0_8_ = auStack_330._8_8_ * 2;
  auVar662._8_8_ = 0;
  auVar662._0_8_ = auStack_330._16_8_;
  auVar303._8_8_ = 0;
  auVar303._0_8_ = psStack_310;
  auVar663._8_8_ = 0;
  auVar663._0_8_ = psStack_310;
  uVar917 = SUB168(auVar303 * auVar663,0);
  auVar304._8_8_ = 0;
  auVar304._0_8_ = uVar917 & 0xfffffffffffff;
  auVar1 = auVar302 * auVar662 + auVar301 * auVar661 + auVar304 * ZEXT816(0x1000003d10);
  uVar933 = auVar1._0_8_;
  psStack_350 = (secp256k1_gej *)(uVar933 & 0xfffffffffffff);
  auVar862._8_8_ = 0;
  auVar862._0_8_ = uVar933 >> 0x34 | auVar1._8_8_ << 0xc;
  unaff_R14 = (secp256k1_gej *)((long)psStack_310 * 2);
  auVar305._8_8_ = 0;
  auVar305._0_8_ = auStack_330._0_8_;
  auVar664._8_8_ = 0;
  auVar664._0_8_ = unaff_R14;
  auVar306._8_8_ = 0;
  auVar306._0_8_ = auStack_330._8_8_ * 2;
  auVar665._8_8_ = 0;
  auVar665._0_8_ = uStack_318;
  auVar307._8_8_ = 0;
  auVar307._0_8_ = auStack_330._16_8_;
  auVar666._8_8_ = 0;
  auVar666._0_8_ = auStack_330._16_8_;
  auVar308._8_8_ = 0;
  auVar308._0_8_ = uVar917 >> 0x34 | SUB168(auVar303 * auVar663,8) << 0xc;
  auVar1 = auVar305 * auVar664 + auVar862 + auVar306 * auVar665 + auVar307 * auVar666 +
           auVar308 * ZEXT816(0x1000003d10);
  uVar917 = auVar1._0_8_;
  auVar863._8_8_ = 0;
  auVar863._0_8_ = uVar917 >> 0x34 | auVar1._8_8_ << 0xc;
  uStack_340 = (uVar917 & 0xfffffffffffff) >> 0x30;
  psVar925 = (secp256k1_gej *)(uVar917 & 0xffffffffffff);
  auVar309._8_8_ = 0;
  auVar309._0_8_ = auStack_330._0_8_;
  auVar667._8_8_ = 0;
  auVar667._0_8_ = auStack_330._0_8_;
  auVar310._8_8_ = 0;
  auVar310._0_8_ = auStack_330._8_8_;
  auVar668._8_8_ = 0;
  auVar668._0_8_ = unaff_R14;
  auVar311._8_8_ = 0;
  auVar311._0_8_ = auStack_330._16_8_ * 2;
  auVar669._8_8_ = 0;
  auVar669._0_8_ = uStack_318;
  auVar1 = auVar310 * auVar668 + auVar863 + auVar311 * auVar669;
  uVar917 = auVar1._0_8_;
  auVar865._8_8_ = 0;
  auVar865._0_8_ = uVar917 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar670._8_8_ = 0;
  auVar670._0_8_ = (uVar917 & 0xfffffffffffff) << 4 | uStack_340;
  auVar1 = auVar309 * auVar667 + ZEXT816(0x1000003d1) * auVar670;
  uVar917 = auVar1._0_8_;
  (psStack_2f8->x).n[0] = uVar917 & 0xfffffffffffff;
  auVar864._8_8_ = 0;
  auVar864._0_8_ = uVar917 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar312._8_8_ = 0;
  auVar312._0_8_ = auStack_330._0_8_ * 2;
  auVar671._8_8_ = 0;
  auVar671._0_8_ = auStack_330._8_8_;
  auVar313._8_8_ = 0;
  auVar313._0_8_ = auStack_330._16_8_;
  auVar672._8_8_ = 0;
  auVar672._0_8_ = unaff_R14;
  auVar314._8_8_ = 0;
  auVar314._0_8_ = uStack_318;
  auVar673._8_8_ = 0;
  auVar673._0_8_ = uStack_318;
  auVar2 = auVar313 * auVar672 + auVar865 + auVar314 * auVar673;
  uVar917 = auVar2._0_8_;
  auVar315._8_8_ = 0;
  auVar315._0_8_ = uVar917 & 0xfffffffffffff;
  auVar1 = auVar312 * auVar671 + auVar864 + auVar315 * ZEXT816(0x1000003d10);
  uVar933 = auVar1._0_8_;
  auVar867._8_8_ = 0;
  auVar867._0_8_ = uVar917 >> 0x34 | auVar2._8_8_ << 0xc;
  (psStack_2f8->x).n[1] = uVar933 & 0xfffffffffffff;
  auVar866._8_8_ = 0;
  auVar866._0_8_ = uVar933 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar316._8_8_ = 0;
  auVar316._0_8_ = auStack_330._0_8_ * 2;
  auVar674._8_8_ = 0;
  auVar674._0_8_ = auStack_330._16_8_;
  auVar317._8_8_ = 0;
  auVar317._0_8_ = auStack_330._8_8_;
  auVar675._8_8_ = 0;
  auVar675._0_8_ = auStack_330._8_8_;
  auVar318._8_8_ = 0;
  auVar318._0_8_ = uStack_318;
  auVar676._8_8_ = 0;
  auVar676._0_8_ = unaff_R14;
  auVar867 = auVar318 * auVar676 + auVar867;
  uVar917 = auVar867._0_8_;
  in_RCX = auVar867._8_8_;
  auVar319._8_8_ = 0;
  auVar319._0_8_ = uVar917 & 0xfffffffffffff;
  auVar1 = auVar316 * auVar674 + auVar866 + auVar317 * auVar675 + auVar319 * ZEXT816(0x1000003d10);
  uVar933 = auVar1._0_8_;
  (psStack_2f8->x).n[2] = uVar933 & 0xfffffffffffff;
  auVar868._8_8_ = 0;
  auVar868._0_8_ = (long)(psStack_350->x).n + (uVar933 >> 0x34 | auVar1._8_8_ << 0xc);
  auVar320._8_8_ = 0;
  auVar320._0_8_ = uVar917 >> 0x34 | (long)in_RCX << 0xc;
  auVar868 = auVar320 * ZEXT816(0x1000003d10) + auVar868;
  uVar917 = auVar868._0_8_;
  in_R9 = auVar868._8_8_;
  (psStack_2f8->x).n[3] = uVar917 & 0xfffffffffffff;
  in_R8 = (secp256k1_gej *)((long)(psVar925->x).n + (uVar917 >> 0x34 | (long)in_R9 << 0xc));
  (psStack_2f8->x).n[4] = (uint64_t)in_R8;
  (psStack_2f8->x).magnitude = 1;
  (psStack_2f8->x).normalized = 0;
  uStack_358._0_4_ = 0x14f36f;
  uStack_358._4_4_ = 0;
  psStack_348 = psVar925;
  secp256k1_fe_verify(&psStack_2f8->x);
  uStack_358._0_4_ = 0x14f377;
  uStack_358._4_4_ = 0;
  psVar910 = psVar924;
  secp256k1_fe_verify(&psVar924->x);
  if (8 < (psVar924->x).magnitude) goto LAB_0014f6b7;
  x = (secp256k1_fe *)auStack_330;
  uVar917 = (psVar924->x).n[0];
  uVar933 = (psVar924->x).n[1];
  unaff_R12 = (psVar924->x).n[2];
  unaff_R13 = (psVar924->x).n[3];
  uVar934 = (psVar924->x).n[4];
  auVar321._8_8_ = 0;
  auVar321._0_8_ = uVar917 * 2;
  auVar677._8_8_ = 0;
  auVar677._0_8_ = unaff_R13;
  auVar322._8_8_ = 0;
  auVar322._0_8_ = uVar933 * 2;
  auVar678._8_8_ = 0;
  auVar678._0_8_ = unaff_R12;
  auVar323._8_8_ = 0;
  auVar323._0_8_ = uVar934;
  auVar679._8_8_ = 0;
  auVar679._0_8_ = uVar934;
  uVar935 = SUB168(auVar323 * auVar679,0);
  auVar324._8_8_ = 0;
  auVar324._0_8_ = uVar935 & 0xfffffffffffff;
  auVar1 = auVar322 * auVar678 + auVar321 * auVar677 + auVar324 * ZEXT816(0x1000003d10);
  uVar918 = auVar1._0_8_;
  psStack_350 = (secp256k1_gej *)(uVar918 & 0xfffffffffffff);
  auVar869._8_8_ = 0;
  auVar869._0_8_ = uVar918 >> 0x34 | auVar1._8_8_ << 0xc;
  uVar934 = uVar934 * 2;
  auVar325._8_8_ = 0;
  auVar325._0_8_ = uVar917;
  auVar680._8_8_ = 0;
  auVar680._0_8_ = uVar934;
  auVar326._8_8_ = 0;
  auVar326._0_8_ = uVar933 * 2;
  auVar681._8_8_ = 0;
  auVar681._0_8_ = unaff_R13;
  auVar327._8_8_ = 0;
  auVar327._0_8_ = unaff_R12;
  auVar682._8_8_ = 0;
  auVar682._0_8_ = unaff_R12;
  auVar328._8_8_ = 0;
  auVar328._0_8_ = uVar935 >> 0x34 | SUB168(auVar323 * auVar679,8) << 0xc;
  auVar1 = auVar325 * auVar680 + auVar869 + auVar326 * auVar681 + auVar327 * auVar682 +
           auVar328 * ZEXT816(0x1000003d10);
  uVar935 = auVar1._0_8_;
  auVar870._8_8_ = 0;
  auVar870._0_8_ = uVar935 >> 0x34 | auVar1._8_8_ << 0xc;
  uStack_340 = (uVar935 & 0xfffffffffffff) >> 0x30;
  psStack_348 = (secp256k1_gej *)(uVar935 & 0xffffffffffff);
  auVar329._8_8_ = 0;
  auVar329._0_8_ = uVar917;
  auVar683._8_8_ = 0;
  auVar683._0_8_ = uVar917;
  auVar330._8_8_ = 0;
  auVar330._0_8_ = uVar933;
  auVar684._8_8_ = 0;
  auVar684._0_8_ = uVar934;
  auVar331._8_8_ = 0;
  auVar331._0_8_ = unaff_R12 * 2;
  auVar685._8_8_ = 0;
  auVar685._0_8_ = unaff_R13;
  auVar1 = auVar330 * auVar684 + auVar870 + auVar331 * auVar685;
  uVar935 = auVar1._0_8_;
  auVar872._8_8_ = 0;
  auVar872._0_8_ = uVar935 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar686._8_8_ = 0;
  auVar686._0_8_ = (uVar935 & 0xfffffffffffff) << 4 | uStack_340;
  auVar1 = auVar329 * auVar683 + ZEXT816(0x1000003d1) * auVar686;
  uVar935 = auVar1._0_8_;
  auStack_330._0_8_ = uVar935 & 0xfffffffffffff;
  auVar871._8_8_ = 0;
  auVar871._0_8_ = uVar935 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar332._8_8_ = 0;
  auVar332._0_8_ = uVar917 * 2;
  auVar687._8_8_ = 0;
  auVar687._0_8_ = uVar933;
  auVar333._8_8_ = 0;
  auVar333._0_8_ = unaff_R12;
  auVar688._8_8_ = 0;
  auVar688._0_8_ = uVar934;
  auVar334._8_8_ = 0;
  auVar334._0_8_ = unaff_R13;
  auVar689._8_8_ = 0;
  auVar689._0_8_ = unaff_R13;
  auVar2 = auVar333 * auVar688 + auVar872 + auVar334 * auVar689;
  uVar935 = auVar2._0_8_;
  auVar335._8_8_ = 0;
  auVar335._0_8_ = uVar935 & 0xfffffffffffff;
  auVar1 = auVar332 * auVar687 + auVar871 + auVar335 * ZEXT816(0x1000003d10);
  uVar918 = auVar1._0_8_;
  auVar874._8_8_ = 0;
  auVar874._0_8_ = uVar935 >> 0x34 | auVar2._8_8_ << 0xc;
  auStack_330._8_8_ = uVar918 & 0xfffffffffffff;
  auVar873._8_8_ = 0;
  auVar873._0_8_ = uVar918 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar336._8_8_ = 0;
  auVar336._0_8_ = uVar917 * 2;
  auVar690._8_8_ = 0;
  auVar690._0_8_ = unaff_R12;
  auVar337._8_8_ = 0;
  auVar337._0_8_ = uVar933;
  auVar691._8_8_ = 0;
  auVar691._0_8_ = uVar933;
  auVar338._8_8_ = 0;
  auVar338._0_8_ = unaff_R13;
  auVar692._8_8_ = 0;
  auVar692._0_8_ = uVar934;
  auVar874 = auVar338 * auVar692 + auVar874;
  uVar917 = auVar874._0_8_;
  in_RCX = auVar874._8_8_;
  auVar339._8_8_ = 0;
  auVar339._0_8_ = uVar917 & 0xfffffffffffff;
  auVar1 = auVar336 * auVar690 + auVar873 + auVar337 * auVar691 + auVar339 * ZEXT816(0x1000003d10);
  uVar933 = auVar1._0_8_;
  auVar875._8_8_ = 0;
  auVar875._0_8_ = (long)(psStack_350->x).n + (uVar933 >> 0x34 | auVar1._8_8_ << 0xc);
  auVar340._8_8_ = 0;
  auVar340._0_8_ = uVar917 >> 0x34 | (long)in_RCX << 0xc;
  auVar875 = auVar340 * ZEXT816(0x1000003d10) + auVar875;
  uVar917 = auVar875._0_8_;
  in_R9 = auVar875._8_8_;
  uStack_318 = uVar917 & 0xfffffffffffff;
  auStack_330._16_8_ = uVar933 & 0xfffffffffffff;
  in_R8 = (secp256k1_gej *)((long)(psStack_348->x).n + (uVar917 >> 0x34 | (long)in_R9 << 0xc));
  uStack_308 = 1;
  uStack_358._0_4_ = 0x14f5bc;
  uStack_358._4_4_ = 0;
  psStack_310 = in_R8;
  secp256k1_fe_verify(x);
  unaff_R15 = psStack_338;
  uStack_358._0_4_ = 0x14f5cc;
  uStack_358._4_4_ = 0;
  psVar925 = psStack_338;
  uVar923 = secp256k1_fe_equal(x,&psStack_338->x);
  psVar924 = (secp256k1_gej *)(ulong)uVar923;
  if (uVar923 != 0) {
    return uVar923;
  }
  unaff_R14 = (secp256k1_gej *)auStack_330;
  uStack_358._0_4_ = 0x14f5df;
  uStack_358._4_4_ = 0;
  psVar910 = unaff_R14;
  secp256k1_fe_verify((secp256k1_fe *)unaff_R14);
  if (1 < (int)uStack_308) goto LAB_0014f6bc;
  unaff_R14 = (secp256k1_gej *)auStack_330;
  auStack_330._0_8_ = 0x3ffffbfffff0bc - auStack_330._0_8_;
  auStack_330._8_8_ = 0x3ffffffffffffc - auStack_330._8_8_;
  uStack_318 = 0x3ffffffffffffc - uStack_318;
  auStack_330._16_8_ = 0x3ffffffffffffc - auStack_330._16_8_;
  psStack_310 = (secp256k1_gej *)(0x3fffffffffffc - (long)psStack_310);
  uStack_308 = 2;
  uStack_358._0_4_ = 0x14f637;
  uStack_358._4_4_ = 0;
  secp256k1_fe_verify((secp256k1_fe *)unaff_R14);
  uStack_358._0_4_ = 0x14f63f;
  uStack_358._4_4_ = 0;
  secp256k1_fe_normalize_var((secp256k1_fe *)unaff_R14);
  uStack_358._0_4_ = 0x14f64a;
  uStack_358._4_4_ = 0;
  psVar925 = unaff_R15;
  psVar910 = unaff_R14;
  iVar904 = secp256k1_fe_equal_var((secp256k1_fe *)unaff_R14,&unaff_R15->x);
  if (iVar904 != 0) {
    return 0;
  }
  goto LAB_0014f6c1;
LAB_0014ffb4:
  psStack_938 = (secp256k1_gej *)0x14ffb9;
  secp256k1_ecmult_strauss_wnaf_cold_2();
LAB_0014ffb9:
  psStack_938 = (secp256k1_gej *)secp256k1_ecmult_wnaf;
  secp256k1_ecmult_strauss_wnaf_cold_1();
  psStack_990 = psVar927;
  auStack_988._40_8_ = psVar919;
  psStack_958 = in_R8;
  psStack_950 = in_RCX;
  psStack_948 = psVar924;
  psStack_940 = psVar910;
  psStack_938 = psVar925;
  if (psVar927 == (secp256k1_gej *)0x0) {
LAB_00150112:
    psStack_9a0 = (secp256k1_gej *)0x150117;
    secp256k1_ecmult_wnaf_cold_5();
    psVar914 = psVar913;
LAB_00150117:
    psStack_9a0 = (secp256k1_gej *)0x15011c;
    secp256k1_ecmult_wnaf_cold_4();
LAB_0015011c:
    psStack_9a0 = (secp256k1_gej *)0x150121;
    secp256k1_ecmult_wnaf_cold_3();
  }
  else {
    psVar914 = psVar913;
    in_R8 = extraout_RDX_00;
    if (extraout_RDX_00 == (secp256k1_gej *)0x0) goto LAB_00150117;
    uVar923 = (uint)psVar913;
    psVar919 = (secp256k1_gej *)((ulong)psVar913 & 0xffffffff);
    in_R8 = extraout_RDX_00;
    if ((int)uVar923 < 2) goto LAB_0015011c;
    iVar904 = (int)a_00;
    psVar925 = (secp256k1_gej *)((ulong)a_00 & 0xffffffff);
    uVar917 = (ulong)a_00 & 0xffffffff;
    a_00 = (secp256k1_gej *)0x0;
    psStack_9a0 = (secp256k1_gej *)0x150008;
    memset(psVar927,0,uVar917 << 2);
    auStack_988._24_8_ = (extraout_RDX_00->x).n[3];
    auStack_988._16_8_ = (extraout_RDX_00->x).n[2];
    auStack_988._0_8_ = (extraout_RDX_00->x).n[0];
    auStack_988._8_8_ = (extraout_RDX_00->x).n[1];
    iStack_994 = 1;
    if ((long)auStack_988._24_8_ < 0) {
      a_00 = (secp256k1_gej *)auStack_988;
      psStack_9a0 = (secp256k1_gej *)0x15003a;
      psVar927 = a_00;
      secp256k1_scalar_negate((secp256k1_scalar *)a_00,(secp256k1_scalar *)a_00);
      iStack_994 = -1;
    }
    iVar908 = 0;
    in_R8 = extraout_RDX_00;
    psVar910 = (secp256k1_gej *)0x0;
    if (iVar904 < 1) {
LAB_001500e1:
      while( true ) {
        psVar913 = *(secp256k1_gej **)(auStack_988 + ((ulong)psVar910 >> 6) * 8);
        if (((ulong)psVar913 >> ((ulong)psVar910 & 0x3f) & 1) != 0) break;
        uVar923 = (int)psVar910 + 1;
        psVar910 = (secp256k1_gej *)(ulong)uVar923;
        if (uVar923 == 0x100) {
          return iVar908;
        }
      }
      psStack_9a0 = (secp256k1_gej *)0x150112;
      secp256k1_ecmult_wnaf_cold_2();
      goto LAB_00150112;
    }
    psVar924 = (secp256k1_gej *)(ulong)(uVar923 - 1);
    in_R8 = (secp256k1_gej *)0x0;
    psVar910 = (secp256k1_gej *)0xffffffff;
    in_RCX = (secp256k1_gej *)0x0;
    do {
      psVar911 = in_RCX;
      uVar905 = (uint)psVar911;
      psVar914 = *(secp256k1_gej **)(auStack_988 + ((ulong)psVar911 >> 6) * 8);
      if ((uint)(((ulong)psVar914 >> ((ulong)psVar911 & 0x3f) & 1) != 0) == (uint)in_R8) {
        uVar905 = uVar905 + 1;
        psVar911 = psVar910;
      }
      else {
        uVar906 = iVar904 - uVar905;
        if ((int)uVar923 <= (int)(iVar904 - uVar905)) {
          uVar906 = uVar923;
        }
        psVar927 = (secp256k1_gej *)auStack_988;
        psStack_9a0 = (secp256k1_gej *)0x15009c;
        a_00 = psVar911;
        uVar907 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)psVar927,uVar905,uVar906);
        uVar907 = uVar907 + (uint)in_R8;
        bVar939 = (uVar907 >> (uVar923 - 1 & 0x1f) & 1) != 0;
        in_R8 = (secp256k1_gej *)(ulong)bVar939;
        psVar914 = (secp256k1_gej *)(long)(int)uVar905;
        *(uint *)((long)(psStack_990->x).n + (long)psVar914 * 4) =
             (uVar907 - ((uint)bVar939 << ((byte)psVar913 & 0x1f))) * iStack_994;
        uVar905 = uVar906 + uVar905;
      }
      in_RCX = (secp256k1_gej *)(ulong)uVar905;
      psVar910 = psVar911;
    } while ((int)uVar905 < iVar904);
    psVar910 = in_RCX;
    if ((int)in_R8 == 0) {
      iVar908 = (int)psVar911 + 1;
      if (0xff < (int)uVar905) {
        return iVar908;
      }
      goto LAB_001500e1;
    }
  }
  psStack_9a0 = (secp256k1_gej *)secp256k1_ecmult_table_get_ge_storage;
  secp256k1_ecmult_wnaf_cold_1();
  psStack_9a8 = psVar919;
  psStack_9a0 = psVar924;
  if ((extraout_RDX_01 & 1) == 0) {
    psStack_9b8 = (secp256k1_gej *)0x1501eb;
    secp256k1_ecmult_table_get_ge_storage_cold_4();
    psVar913 = psVar927;
LAB_001501eb:
    psStack_9b8 = (secp256k1_gej *)0x1501f0;
    secp256k1_ecmult_table_get_ge_storage_cold_1();
LAB_001501f0:
    psStack_9b8 = (secp256k1_gej *)0x1501f5;
    secp256k1_ecmult_table_get_ge_storage_cold_3();
  }
  else {
    uVar923 = (uint)extraout_RDX_01;
    psVar913 = psVar927;
    if ((int)uVar923 < -0x3fff) goto LAB_001501eb;
    if (0x3fff < (int)uVar923) goto LAB_001501f0;
    if (0 < (int)uVar923) {
      secp256k1_ge_from_storage
                ((secp256k1_ge *)psVar927,
                 (secp256k1_ge_storage *)((long)&a_00->x + (ulong)(uVar923 - 1 >> 1) * 0x40));
      return extraout_EAX_04;
    }
    a_00 = (secp256k1_gej *)((long)&a_00->x + (ulong)(~uVar923 >> 1) * 0x40);
    psStack_9b8 = (secp256k1_gej *)0x15017f;
    secp256k1_ge_from_storage((secp256k1_ge *)psVar927,(secp256k1_ge_storage *)a_00);
    psVar924 = (secp256k1_gej *)&psVar927->y;
    psStack_9b8 = (secp256k1_gej *)0x15018b;
    psVar913 = psVar924;
    secp256k1_fe_verify((secp256k1_fe *)psVar924);
    psVar919 = psVar927;
    if ((psVar927->y).magnitude < 2) {
      uVar915 = (psVar927->y).n[1];
      uVar936 = (psVar927->y).n[2];
      uVar938 = (psVar927->y).n[3];
      (psVar927->y).n[0] = 0x3ffffbfffff0bc - (psVar927->y).n[0];
      (psVar927->y).n[1] = 0x3ffffffffffffc - uVar915;
      (psVar927->y).n[2] = 0x3ffffffffffffc - uVar936;
      (psVar927->y).n[3] = 0x3ffffffffffffc - uVar938;
      (psVar927->y).n[4] = 0x3fffffffffffc - (psVar927->y).n[4];
      (psVar927->y).magnitude = 2;
      (psVar927->y).normalized = 0;
      secp256k1_fe_verify((secp256k1_fe *)psVar924);
      return extraout_EAX_05;
    }
  }
  psStack_9b8 = (secp256k1_gej *)secp256k1_gej_add_zinv_var;
  secp256k1_ecmult_table_get_ge_storage_cold_2();
  psVar927 = a_00;
  psStack_9e0 = psVar919;
  psStack_9d8 = in_R8;
  psStack_9d0 = in_RCX;
  psStack_9c8 = psVar924;
  psStack_9c0 = psVar910;
  psStack_9b8 = psVar925;
  secp256k1_ge_verify(a);
  secp256k1_fe_verify(&psVar914->x);
  if (a_00->infinity == 0) {
    if (a->infinity != 0) {
      pvVar912 = memcpy(psVar913,a_00,0x98);
      return (int)pvVar912;
    }
    psVar924 = (secp256k1_gej *)&a_00->z;
    psVar919 = (secp256k1_gej *)auStack_a48;
    psVar927 = psVar924;
    secp256k1_fe_mul((secp256k1_fe *)psVar919,(secp256k1_fe *)psVar924,&psVar914->x);
    secp256k1_fe_verify((secp256k1_fe *)psVar919);
    if (8 < (int)auStack_a48._40_4_) goto LAB_0015150d;
    auVar361._8_8_ = 0;
    auVar361._0_8_ = auStack_a48._0_8_ * 2;
    auVar709._8_8_ = 0;
    auVar709._0_8_ = auStack_a48._24_8_;
    auVar362._8_8_ = 0;
    auVar362._0_8_ = auStack_a48._8_8_ * 2;
    auVar710._8_8_ = 0;
    auVar710._0_8_ = auStack_a48._16_8_;
    auVar363._8_8_ = 0;
    auVar363._0_8_ = auStack_a48._32_8_;
    auVar711._8_8_ = 0;
    auVar711._0_8_ = auStack_a48._32_8_;
    uVar933 = SUB168(auVar363 * auVar711,0);
    auVar364._8_8_ = 0;
    auVar364._0_8_ = uVar933 & 0xfffffffffffff;
    auVar1 = auVar362 * auVar710 + auVar361 * auVar709 + auVar364 * ZEXT816(0x1000003d10);
    uVar917 = auVar1._0_8_;
    auStack_b38._144_8_ = uVar917 & 0xfffffffffffff;
    auVar883._8_8_ = 0;
    auVar883._0_8_ = uVar917 >> 0x34 | auVar1._8_8_ << 0xc;
    uVar917 = auStack_a48._32_8_ * 2;
    auVar365._8_8_ = 0;
    auVar365._0_8_ = auStack_a48._0_8_;
    auVar712._8_8_ = 0;
    auVar712._0_8_ = uVar917;
    auVar366._8_8_ = 0;
    auVar366._0_8_ = auStack_a48._8_8_ * 2;
    auVar713._8_8_ = 0;
    auVar713._0_8_ = auStack_a48._24_8_;
    auVar367._8_8_ = 0;
    auVar367._0_8_ = auStack_a48._16_8_;
    auVar714._8_8_ = 0;
    auVar714._0_8_ = auStack_a48._16_8_;
    auVar368._8_8_ = 0;
    auVar368._0_8_ = uVar933 >> 0x34 | SUB168(auVar363 * auVar711,8) << 0xc;
    auVar1 = auVar365 * auVar712 + auVar883 + auVar366 * auVar713 + auVar367 * auVar714 +
             auVar368 * ZEXT816(0x1000003d10);
    auStack_c08._48_8_ = auVar1._0_8_;
    auVar884._8_8_ = 0;
    auVar884._0_8_ = (ulong)auStack_c08._48_8_ >> 0x34 | auVar1._8_8_ << 0xc;
    auStack_b38._96_8_ = (auStack_c08._48_8_ & 0xfffffffffffff) >> 0x30;
    auStack_c08._48_8_ = auStack_c08._48_8_ & 0xffffffffffff;
    auVar369._8_8_ = 0;
    auVar369._0_8_ = auStack_a48._0_8_;
    auVar715._8_8_ = 0;
    auVar715._0_8_ = auStack_a48._0_8_;
    auVar370._8_8_ = 0;
    auVar370._0_8_ = auStack_a48._8_8_;
    auVar716._8_8_ = 0;
    auVar716._0_8_ = uVar917;
    auVar371._8_8_ = 0;
    auVar371._0_8_ = auStack_a48._16_8_ * 2;
    auVar717._8_8_ = 0;
    auVar717._0_8_ = auStack_a48._24_8_;
    auVar1 = auVar370 * auVar716 + auVar884 + auVar371 * auVar717;
    uVar933 = auVar1._0_8_;
    auVar886._8_8_ = 0;
    auVar886._0_8_ = uVar933 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar718._8_8_ = 0;
    auVar718._0_8_ = (uVar933 & 0xfffffffffffff) << 4 | auStack_b38._96_8_;
    auVar1 = auVar369 * auVar715 + ZEXT816(0x1000003d1) * auVar718;
    uVar933 = auVar1._0_8_;
    auStack_b38._48_8_ = uVar933 & 0xfffffffffffff;
    auVar885._8_8_ = 0;
    auVar885._0_8_ = uVar933 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar372._8_8_ = 0;
    auVar372._0_8_ = auStack_a48._0_8_ * 2;
    auVar719._8_8_ = 0;
    auVar719._0_8_ = auStack_a48._8_8_;
    auVar373._8_8_ = 0;
    auVar373._0_8_ = auStack_a48._16_8_;
    auVar720._8_8_ = 0;
    auVar720._0_8_ = uVar917;
    auVar374._8_8_ = 0;
    auVar374._0_8_ = auStack_a48._24_8_;
    auVar721._8_8_ = 0;
    auVar721._0_8_ = auStack_a48._24_8_;
    auVar2 = auVar373 * auVar720 + auVar886 + auVar374 * auVar721;
    uVar933 = auVar2._0_8_;
    auVar375._8_8_ = 0;
    auVar375._0_8_ = uVar933 & 0xfffffffffffff;
    auVar1 = auVar372 * auVar719 + auVar885 + auVar375 * ZEXT816(0x1000003d10);
    uVar934 = auVar1._0_8_;
    auVar888._8_8_ = 0;
    auVar888._0_8_ = uVar933 >> 0x34 | auVar2._8_8_ << 0xc;
    auStack_b38._56_8_ = uVar934 & 0xfffffffffffff;
    auVar887._8_8_ = 0;
    auVar887._0_8_ = uVar934 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar376._8_8_ = 0;
    auVar376._0_8_ = auStack_a48._0_8_ * 2;
    auVar722._8_8_ = 0;
    auVar722._0_8_ = auStack_a48._16_8_;
    auVar377._8_8_ = 0;
    auVar377._0_8_ = auStack_a48._8_8_;
    auVar723._8_8_ = 0;
    auVar723._0_8_ = auStack_a48._8_8_;
    auVar378._8_8_ = 0;
    auVar378._0_8_ = auStack_a48._24_8_;
    auVar724._8_8_ = 0;
    auVar724._0_8_ = uVar917;
    auVar888 = auVar378 * auVar724 + auVar888;
    uVar917 = auVar888._0_8_;
    auVar379._8_8_ = 0;
    auVar379._0_8_ = uVar917 & 0xfffffffffffff;
    auVar1 = auVar376 * auVar722 + auVar887 + auVar377 * auVar723 + auVar379 * ZEXT816(0x1000003d10)
    ;
    uVar933 = auVar1._0_8_;
    auStack_b38._64_8_ = uVar933 & 0xfffffffffffff;
    auVar889._8_8_ = 0;
    auVar889._0_8_ = (uVar933 >> 0x34 | auVar1._8_8_ << 0xc) + auStack_b38._144_8_;
    auVar380._8_8_ = 0;
    auVar380._0_8_ = uVar917 >> 0x34 | auVar888._8_8_ << 0xc;
    auVar889 = auVar380 * ZEXT816(0x1000003d10) + auVar889;
    uVar917 = auVar889._0_8_;
    auStack_b38._72_8_ = uVar917 & 0xfffffffffffff;
    auStack_b38._80_8_ = (uVar917 >> 0x34 | auVar889._8_8_ << 0xc) + auStack_c08._48_8_;
    auStack_b38._88_4_ = 1;
    auStack_b38._92_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_b38 + 0x30));
    auStack_b38._144_8_ = (a_00->x).n[0];
    uStack_aa0 = (a_00->x).n[1];
    uStack_a98 = (a_00->x).n[2];
    uStack_a90 = (a_00->x).n[3];
    uStack_a88 = (a_00->x).n[4];
    uStack_a80._0_4_ = (a_00->x).magnitude;
    uStack_a80._4_4_ = (a_00->x).normalized;
    psVar929 = (secp256k1_fe *)(auStack_b38 + 0x90);
    secp256k1_fe_verify(psVar929);
    uVar933 = (uStack_a88 >> 0x30) * 0x1000003d1 + auStack_b38._144_8_;
    uVar917 = (uVar933 >> 0x34) + uStack_aa0;
    uVar918 = (uVar917 >> 0x34) + uStack_a98;
    uVar934 = (uVar918 >> 0x34) + uStack_a90;
    uVar935 = uVar934 & 0xfffffffffffff;
    lVar937 = (uVar934 >> 0x34) + (uStack_a88 & 0xffffffffffff);
    uVar918 = uVar918 & 0xfffffffffffff;
    uVar917 = uVar917 & 0xfffffffffffff;
    uVar933 = uVar933 & 0xfffffffffffff;
    uStack_a80 = CONCAT44(uStack_a80._4_4_,1);
    auStack_b38._144_8_ = uVar933;
    uStack_aa0 = uVar917;
    uStack_a98 = uVar918;
    uStack_a90 = uVar935;
    uStack_a88 = lVar937;
    secp256k1_fe_verify(psVar929);
    secp256k1_fe_mul((secp256k1_fe *)(auStack_c08 + 0x30),&a->x,(secp256k1_fe *)(auStack_b38 + 0x30)
                    );
    auStack_b38._96_8_ = (a_00->y).n[0];
    auStack_b38._104_8_ = (a_00->y).n[1];
    auStack_b38._112_8_ = (a_00->y).n[2];
    auStack_b38._120_8_ = (a_00->y).n[3];
    auStack_b38._128_8_ = (a_00->y).n[4];
    auStack_b38._136_4_ = (a_00->y).magnitude;
    auStack_b38._140_4_ = (a_00->y).normalized;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_b38 + 0x60));
    uVar934 = ((ulong)auStack_b38._128_8_ >> 0x30) * 0x1000003d1 + auStack_b38._96_8_;
    uVar928 = (uVar934 >> 0x34) + auStack_b38._104_8_;
    uVar909 = (uVar928 >> 0x34) + auStack_b38._112_8_;
    uVar916 = (uVar909 >> 0x34) + auStack_b38._120_8_;
    uVar932 = uVar916 & 0xfffffffffffff;
    uVar915 = (uVar916 >> 0x34) + (auStack_b38._128_8_ & 0xffffffffffff);
    uVar909 = uVar909 & 0xfffffffffffff;
    uVar928 = uVar928 & 0xfffffffffffff;
    uVar934 = uVar934 & 0xfffffffffffff;
    auStack_b38._136_4_ = 1;
    auStack_b38._96_8_ = uVar934;
    auStack_b38._104_8_ = uVar928;
    auStack_b38._112_8_ = uVar909;
    auStack_b38._120_8_ = uVar932;
    auStack_b38._128_8_ = uVar915;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_b38 + 0x60));
    psVar927 = (secp256k1_gej *)auStack_ba8;
    secp256k1_fe_mul((secp256k1_fe *)psVar927,&a->y,(secp256k1_fe *)(auStack_b38 + 0x30));
    secp256k1_fe_mul((secp256k1_fe *)psVar927,(secp256k1_fe *)psVar927,(secp256k1_fe *)auStack_a48);
    secp256k1_fe_verify(psVar929);
    uVar933 = 0x3ffffbfffff0bc - uVar933;
    uVar917 = 0x3ffffffffffffc - uVar917;
    uVar918 = 0x3ffffffffffffc - uVar918;
    uVar935 = 0x3ffffffffffffc - uVar935;
    uVar916 = 0x3fffffffffffc - lVar937;
    auStack_b38._40_8_ = 2;
    auStack_b38._0_8_ = uVar933;
    auStack_b38._8_8_ = uVar917;
    auStack_b38._16_8_ = uVar918;
    auStack_b38._24_8_ = uVar935;
    auStack_b38._32_8_ = uVar916;
    secp256k1_fe_verify((secp256k1_fe *)auStack_b38);
    secp256k1_fe_verify((secp256k1_fe *)auStack_b38);
    psVar919 = (secp256k1_gej *)(auStack_c08 + 0x30);
    secp256k1_fe_verify((secp256k1_fe *)psVar919);
    if (0x1e < iStack_bb0) goto LAB_00151512;
    uVar933 = uVar933 + auStack_c08._48_8_;
    uVar917 = uVar917 + uStack_bd0;
    uVar918 = uVar918 + uStack_bc8;
    uVar935 = uVar935 + uStack_bc0;
    uVar916 = uVar916 + uStack_bb8;
    auStack_b38._44_4_ = 0;
    auStack_b38._40_4_ = iStack_bb0 + 2;
    auStack_b38._0_8_ = uVar933;
    auStack_b38._8_8_ = uVar917;
    auStack_b38._16_8_ = uVar918;
    auStack_b38._24_8_ = uVar935;
    auStack_b38._32_8_ = uVar916;
    secp256k1_fe_verify((secp256k1_fe *)auStack_b38);
    psVar919 = (secp256k1_gej *)auStack_ba8;
    secp256k1_fe_verify((secp256k1_fe *)psVar919);
    if (1 < (int)auStack_ba8._40_4_) goto LAB_00151517;
    sStack_a78.magnitude = 2;
    sStack_a78.normalized = 0;
    sStack_a78.n[0] = 0x3ffffbfffff0bc - auStack_ba8._0_8_;
    sStack_a78.n[1] = 0x3ffffffffffffc - auStack_ba8._8_8_;
    sStack_a78.n[2] = 0x3ffffffffffffc - auStack_ba8._16_8_;
    sStack_a78.n[3] = 0x3ffffffffffffc - auStack_ba8._24_8_;
    sStack_a78.n[4] = 0x3fffffffffffc - auStack_ba8._32_8_;
    secp256k1_fe_verify(&sStack_a78);
    secp256k1_fe_verify(&sStack_a78);
    secp256k1_fe_verify((secp256k1_fe *)(auStack_b38 + 0x60));
    uVar934 = (0x3ffffbfffff0bc - auStack_ba8._0_8_) + uVar934;
    uVar928 = (0x3ffffffffffffc - auStack_ba8._8_8_) + uVar928;
    uVar909 = (0x3ffffffffffffc - auStack_ba8._16_8_) + uVar909;
    uVar932 = (0x3ffffffffffffc - auStack_ba8._24_8_) + uVar932;
    uVar921 = (0x3fffffffffffc - auStack_ba8._32_8_) + uVar915;
    sStack_a78.magnitude = 3;
    sStack_a78.normalized = 0;
    sStack_a78.n[0] = uVar934;
    sStack_a78.n[1] = uVar928;
    sStack_a78.n[2] = uVar909;
    sStack_a78.n[3] = uVar932;
    sStack_a78.n[4] = uVar921;
    secp256k1_fe_verify(&sStack_a78);
    secp256k1_fe_verify((secp256k1_fe *)auStack_b38);
    uVar933 = (uVar916 >> 0x30) * 0x1000003d1 + uVar933;
    if (((uVar933 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar933 & 0xfffffffffffff) == 0)) {
      uVar917 = uVar917 + (uVar933 >> 0x34);
      uVar918 = (uVar917 >> 0x34) + uVar918;
      uVar935 = (uVar918 >> 0x34) + uVar935;
      uVar916 = (uVar935 >> 0x34) + (uVar916 & 0xffffffffffff);
      if ((((uVar917 | uVar933 | uVar918 | uVar935) & 0xfffffffffffff) == 0 && uVar916 == 0) ||
         ((uVar933 + 0x1000003d0 & uVar917 & uVar918 & uVar935 & (uVar916 ^ 0xf000000000000)) ==
          0xfffffffffffff)) {
        secp256k1_fe_verify(&sStack_a78);
        uVar934 = (uVar921 >> 0x30) * 0x1000003d1 + uVar934;
        if (((uVar934 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar934 & 0xfffffffffffff) == 0))
        {
          uVar928 = uVar928 + (uVar934 >> 0x34);
          uVar909 = (uVar928 >> 0x34) + uVar909;
          uVar932 = (uVar909 >> 0x34) + uVar932;
          uVar917 = (uVar932 >> 0x34) + (uVar921 & 0xffffffffffff);
          if ((((uVar928 | uVar934 | uVar909 | uVar932) & 0xfffffffffffff) == 0 && uVar917 == 0) ||
             ((uVar934 + 0x1000003d0 & uVar928 & uVar909 & uVar932 & (uVar917 ^ 0xf000000000000)) ==
              0xfffffffffffff)) {
            secp256k1_gej_double_var(psVar913,a_00,(secp256k1_fe *)0x0);
            return extraout_EAX_09;
          }
        }
        secp256k1_gej_set_infinity(psVar913);
        return extraout_EAX_08;
      }
    }
    psVar913->infinity = 0;
    psVar919 = (secp256k1_gej *)auStack_b38;
    secp256k1_fe_mul(&psVar913->z,(secp256k1_fe *)psVar924,(secp256k1_fe *)psVar919);
    secp256k1_fe_verify((secp256k1_fe *)psVar919);
    if (8 < (int)auStack_b38._40_4_) goto LAB_0015151c;
    psVar919 = (secp256k1_gej *)(auStack_a48 + 0x30);
    auVar381._8_8_ = 0;
    auVar381._0_8_ = auStack_b38._0_8_ * 2;
    auVar725._8_8_ = 0;
    auVar725._0_8_ = auStack_b38._24_8_;
    auVar382._8_8_ = 0;
    auVar382._0_8_ = auStack_b38._8_8_ * 2;
    auVar726._8_8_ = 0;
    auVar726._0_8_ = auStack_b38._16_8_;
    auVar383._8_8_ = 0;
    auVar383._0_8_ = auStack_b38._32_8_;
    auVar727._8_8_ = 0;
    auVar727._0_8_ = auStack_b38._32_8_;
    uVar933 = SUB168(auVar383 * auVar727,0);
    auVar384._8_8_ = 0;
    auVar384._0_8_ = uVar933 & 0xfffffffffffff;
    auVar1 = auVar382 * auVar726 + auVar381 * auVar725 + auVar384 * ZEXT816(0x1000003d10);
    uVar917 = auVar1._0_8_;
    auStack_c08._0_8_ = uVar917 & 0xfffffffffffff;
    auVar890._8_8_ = 0;
    auVar890._0_8_ = uVar917 >> 0x34 | auVar1._8_8_ << 0xc;
    uVar917 = auStack_b38._32_8_ * 2;
    auVar385._8_8_ = 0;
    auVar385._0_8_ = auStack_b38._0_8_;
    auVar728._8_8_ = 0;
    auVar728._0_8_ = uVar917;
    auVar386._8_8_ = 0;
    auVar386._0_8_ = auStack_b38._8_8_ * 2;
    auVar729._8_8_ = 0;
    auVar729._0_8_ = auStack_b38._24_8_;
    auVar387._8_8_ = 0;
    auVar387._0_8_ = auStack_b38._16_8_;
    auVar730._8_8_ = 0;
    auVar730._0_8_ = auStack_b38._16_8_;
    auVar388._8_8_ = 0;
    auVar388._0_8_ = uVar933 >> 0x34 | SUB168(auVar383 * auVar727,8) << 0xc;
    auVar1 = auVar385 * auVar728 + auVar890 + auVar386 * auVar729 + auVar387 * auVar730 +
             auVar388 * ZEXT816(0x1000003d10);
    uVar933 = auVar1._0_8_;
    auVar891._8_8_ = 0;
    auVar891._0_8_ = uVar933 >> 0x34 | auVar1._8_8_ << 0xc;
    psVar924 = (secp256k1_gej *)(uVar933 & 0xffffffffffff);
    auVar389._8_8_ = 0;
    auVar389._0_8_ = auStack_b38._0_8_;
    auVar731._8_8_ = 0;
    auVar731._0_8_ = auStack_b38._0_8_;
    auVar390._8_8_ = 0;
    auVar390._0_8_ = auStack_b38._8_8_;
    auVar732._8_8_ = 0;
    auVar732._0_8_ = uVar917;
    auVar391._8_8_ = 0;
    auVar391._0_8_ = auStack_b38._16_8_ * 2;
    auVar733._8_8_ = 0;
    auVar733._0_8_ = auStack_b38._24_8_;
    auVar1 = auVar390 * auVar732 + auVar891 + auVar391 * auVar733;
    uVar934 = auVar1._0_8_;
    auVar893._8_8_ = 0;
    auVar893._0_8_ = uVar934 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar734._8_8_ = 0;
    auVar734._0_8_ = (uVar934 & 0xfffffffffffff) << 4 | (uVar933 & 0xfffffffffffff) >> 0x30;
    auVar1 = auVar389 * auVar731 + ZEXT816(0x1000003d1) * auVar734;
    uVar933 = auVar1._0_8_;
    auStack_a48._48_8_ = uVar933 & 0xfffffffffffff;
    auVar892._8_8_ = 0;
    auVar892._0_8_ = uVar933 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar392._8_8_ = 0;
    auVar392._0_8_ = auStack_b38._0_8_ * 2;
    auVar735._8_8_ = 0;
    auVar735._0_8_ = auStack_b38._8_8_;
    auVar393._8_8_ = 0;
    auVar393._0_8_ = auStack_b38._16_8_;
    auVar736._8_8_ = 0;
    auVar736._0_8_ = uVar917;
    auVar394._8_8_ = 0;
    auVar394._0_8_ = auStack_b38._24_8_;
    auVar737._8_8_ = 0;
    auVar737._0_8_ = auStack_b38._24_8_;
    auVar2 = auVar393 * auVar736 + auVar893 + auVar394 * auVar737;
    uVar933 = auVar2._0_8_;
    auVar395._8_8_ = 0;
    auVar395._0_8_ = uVar933 & 0xfffffffffffff;
    auVar1 = auVar392 * auVar735 + auVar892 + auVar395 * ZEXT816(0x1000003d10);
    uVar934 = auVar1._0_8_;
    auVar895._8_8_ = 0;
    auVar895._0_8_ = uVar933 >> 0x34 | auVar2._8_8_ << 0xc;
    uStack_a10 = uVar934 & 0xfffffffffffff;
    auVar894._8_8_ = 0;
    auVar894._0_8_ = uVar934 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar396._8_8_ = 0;
    auVar396._0_8_ = auStack_b38._0_8_ * 2;
    auVar738._8_8_ = 0;
    auVar738._0_8_ = auStack_b38._16_8_;
    auVar397._8_8_ = 0;
    auVar397._0_8_ = auStack_b38._8_8_;
    auVar739._8_8_ = 0;
    auVar739._0_8_ = auStack_b38._8_8_;
    auVar398._8_8_ = 0;
    auVar398._0_8_ = auStack_b38._24_8_;
    auVar740._8_8_ = 0;
    auVar740._0_8_ = uVar917;
    auVar895 = auVar398 * auVar740 + auVar895;
    uVar917 = auVar895._0_8_;
    auVar399._8_8_ = 0;
    auVar399._0_8_ = uVar917 & 0xfffffffffffff;
    auVar1 = auVar396 * auVar738 + auVar894 + auVar397 * auVar739 + auVar399 * ZEXT816(0x1000003d10)
    ;
    uVar933 = auVar1._0_8_;
    uStack_a08 = uVar933 & 0xfffffffffffff;
    auVar896._8_8_ = 0;
    auVar896._0_8_ = (uVar933 >> 0x34 | auVar1._8_8_ << 0xc) + auStack_c08._0_8_;
    auVar400._8_8_ = 0;
    auVar400._0_8_ = uVar917 >> 0x34 | auVar895._8_8_ << 0xc;
    auVar896 = auVar400 * ZEXT816(0x1000003d10) + auVar896;
    uVar917 = auVar896._0_8_;
    uStack_a00 = uVar917 & 0xfffffffffffff;
    uStack_9f8 = (long)(psVar924->x).n + (uVar917 >> 0x34 | auVar896._8_8_ << 0xc);
    uStack_9f0._0_4_ = 1;
    uStack_9f0._4_4_ = 0;
    auStack_ba8._48_8_ = psVar924;
    secp256k1_fe_verify((secp256k1_fe *)psVar919);
    secp256k1_fe_verify((secp256k1_fe *)psVar919);
    if (1 < (int)uStack_9f0) goto LAB_00151521;
    psVar929 = (secp256k1_fe *)(auStack_a48 + 0x30);
    auStack_a48._48_8_ = 0x3ffffbfffff0bc - auStack_a48._48_8_;
    uStack_a10 = 0x3ffffffffffffc - uStack_a10;
    uStack_a08 = 0x3ffffffffffffc - uStack_a08;
    uStack_a00 = 0x3ffffffffffffc - uStack_a00;
    uStack_9f8 = 0x3fffffffffffc - uStack_9f8;
    uStack_9f0._0_4_ = 2;
    uStack_9f0._4_4_ = 0;
    secp256k1_fe_verify(psVar929);
    psVar919 = (secp256k1_gej *)auStack_c08;
    secp256k1_fe_mul((secp256k1_fe *)psVar919,psVar929,(secp256k1_fe *)auStack_b38);
    secp256k1_fe_mul((secp256k1_fe *)(auStack_ba8 + 0x30),(secp256k1_fe *)(auStack_b38 + 0x90),
                     psVar929);
    secp256k1_fe_verify(&sStack_a78);
    auVar401._8_8_ = 0;
    auVar401._0_8_ = sStack_a78.n[0] * 2;
    auVar741._8_8_ = 0;
    auVar741._0_8_ = sStack_a78.n[3];
    auVar402._8_8_ = 0;
    auVar402._0_8_ = sStack_a78.n[1] * 2;
    auVar742._8_8_ = 0;
    auVar742._0_8_ = sStack_a78.n[2];
    auVar403._8_8_ = 0;
    auVar403._0_8_ = sStack_a78.n[4];
    auVar743._8_8_ = 0;
    auVar743._0_8_ = sStack_a78.n[4];
    uVar933 = SUB168(auVar403 * auVar743,0);
    auVar404._8_8_ = 0;
    auVar404._0_8_ = uVar933 & 0xfffffffffffff;
    auVar1 = auVar402 * auVar742 + auVar401 * auVar741 + auVar404 * ZEXT816(0x1000003d10);
    uVar934 = auVar1._0_8_;
    auVar897._8_8_ = 0;
    auVar897._0_8_ = uVar934 >> 0x34 | auVar1._8_8_ << 0xc;
    uVar917 = sStack_a78.n[4] * 2;
    auVar405._8_8_ = 0;
    auVar405._0_8_ = sStack_a78.n[0];
    auVar744._8_8_ = 0;
    auVar744._0_8_ = uVar917;
    auVar406._8_8_ = 0;
    auVar406._0_8_ = sStack_a78.n[1] * 2;
    auVar745._8_8_ = 0;
    auVar745._0_8_ = sStack_a78.n[3];
    auVar407._8_8_ = 0;
    auVar407._0_8_ = sStack_a78.n[2];
    auVar746._8_8_ = 0;
    auVar746._0_8_ = sStack_a78.n[2];
    auVar408._8_8_ = 0;
    auVar408._0_8_ = uVar933 >> 0x34 | SUB168(auVar403 * auVar743,8) << 0xc;
    auVar1 = auVar405 * auVar744 + auVar897 + auVar406 * auVar745 + auVar407 * auVar746 +
             auVar408 * ZEXT816(0x1000003d10);
    uVar933 = auVar1._0_8_;
    auVar898._8_8_ = 0;
    auVar898._0_8_ = uVar933 >> 0x34 | auVar1._8_8_ << 0xc;
    uStack_b48 = (uVar933 & 0xfffffffffffff) >> 0x30;
    psVar924 = (secp256k1_gej *)(uVar933 & 0xffffffffffff);
    auVar409._8_8_ = 0;
    auVar409._0_8_ = sStack_a78.n[0];
    auVar747._8_8_ = 0;
    auVar747._0_8_ = sStack_a78.n[0];
    auVar410._8_8_ = 0;
    auVar410._0_8_ = sStack_a78.n[1];
    auVar748._8_8_ = 0;
    auVar748._0_8_ = uVar917;
    auVar411._8_8_ = 0;
    auVar411._0_8_ = sStack_a78.n[2] * 2;
    auVar749._8_8_ = 0;
    auVar749._0_8_ = sStack_a78.n[3];
    auVar1 = auVar410 * auVar748 + auVar898 + auVar411 * auVar749;
    uVar933 = auVar1._0_8_;
    auVar900._8_8_ = 0;
    auVar900._0_8_ = uVar933 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar750._8_8_ = 0;
    auVar750._0_8_ = (uVar933 & 0xfffffffffffff) << 4 | uStack_b48;
    auVar1 = auVar409 * auVar747 + ZEXT816(0x1000003d1) * auVar750;
    uVar933 = auVar1._0_8_;
    (psVar913->x).n[0] = uVar933 & 0xfffffffffffff;
    auVar899._8_8_ = 0;
    auVar899._0_8_ = uVar933 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar412._8_8_ = 0;
    auVar412._0_8_ = sStack_a78.n[0] * 2;
    auVar751._8_8_ = 0;
    auVar751._0_8_ = sStack_a78.n[1];
    auVar413._8_8_ = 0;
    auVar413._0_8_ = sStack_a78.n[2];
    auVar752._8_8_ = 0;
    auVar752._0_8_ = uVar917;
    auVar414._8_8_ = 0;
    auVar414._0_8_ = sStack_a78.n[3];
    auVar753._8_8_ = 0;
    auVar753._0_8_ = sStack_a78.n[3];
    auVar2 = auVar413 * auVar752 + auVar900 + auVar414 * auVar753;
    uVar933 = auVar2._0_8_;
    auVar415._8_8_ = 0;
    auVar415._0_8_ = uVar933 & 0xfffffffffffff;
    auVar1 = auVar412 * auVar751 + auVar899 + auVar415 * ZEXT816(0x1000003d10);
    uVar935 = auVar1._0_8_;
    auVar902._8_8_ = 0;
    auVar902._0_8_ = uVar933 >> 0x34 | auVar2._8_8_ << 0xc;
    (psVar913->x).n[1] = uVar935 & 0xfffffffffffff;
    auVar901._8_8_ = 0;
    auVar901._0_8_ = uVar935 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar416._8_8_ = 0;
    auVar416._0_8_ = sStack_a78.n[0] * 2;
    auVar754._8_8_ = 0;
    auVar754._0_8_ = sStack_a78.n[2];
    auVar417._8_8_ = 0;
    auVar417._0_8_ = sStack_a78.n[1];
    auVar755._8_8_ = 0;
    auVar755._0_8_ = sStack_a78.n[1];
    auVar418._8_8_ = 0;
    auVar418._0_8_ = sStack_a78.n[3];
    auVar756._8_8_ = 0;
    auVar756._0_8_ = uVar917;
    auVar902 = auVar418 * auVar756 + auVar902;
    uVar917 = auVar902._0_8_;
    auVar419._8_8_ = 0;
    auVar419._0_8_ = uVar917 & 0xfffffffffffff;
    auVar1 = auVar416 * auVar754 + auVar901 + auVar417 * auVar755 + auVar419 * ZEXT816(0x1000003d10)
    ;
    uVar933 = auVar1._0_8_;
    (psVar913->x).n[2] = uVar933 & 0xfffffffffffff;
    auVar903._8_8_ = 0;
    auVar903._0_8_ = (uVar933 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar934 & 0xfffffffffffff);
    auVar420._8_8_ = 0;
    auVar420._0_8_ = uVar917 >> 0x34 | auVar902._8_8_ << 0xc;
    auVar903 = auVar420 * ZEXT816(0x1000003d10) + auVar903;
    uVar917 = auVar903._0_8_;
    (psVar913->x).n[3] = uVar917 & 0xfffffffffffff;
    (psVar913->x).n[4] = (long)(psVar924->x).n + (uVar917 >> 0x34 | auVar903._8_8_ << 0xc);
    (psVar913->x).magnitude = 1;
    (psVar913->x).normalized = 0;
    psStack_b40 = psVar924;
    secp256k1_fe_verify(&psVar913->x);
    secp256k1_fe_verify(&psVar913->x);
    secp256k1_fe_verify((secp256k1_fe *)psVar919);
    iVar904 = auStack_c08._40_4_ + (psVar913->x).magnitude;
    if (0x20 < iVar904) goto LAB_00151526;
    uVar915 = (psVar913->x).n[1];
    uVar936 = (psVar913->x).n[2];
    uVar938 = (psVar913->x).n[3];
    (psVar913->x).n[0] = (psVar913->x).n[0] + auStack_c08._0_8_;
    (psVar913->x).n[1] = uVar915 + auStack_c08._8_8_;
    (psVar913->x).n[2] = uVar936 + auStack_c08._16_8_;
    (psVar913->x).n[3] = uVar938 + auStack_c08._24_8_;
    puVar931 = (psVar913->x).n + 4;
    *puVar931 = *puVar931 + auStack_c08._32_8_;
    (psVar913->x).magnitude = iVar904;
    (psVar913->x).normalized = 0;
    secp256k1_fe_verify(&psVar913->x);
    secp256k1_fe_verify(&psVar913->x);
    psVar919 = (secp256k1_gej *)(auStack_ba8 + 0x30);
    secp256k1_fe_verify((secp256k1_fe *)psVar919);
    iVar904 = iStack_b50 + (psVar913->x).magnitude;
    if (0x20 < iVar904) goto LAB_0015152b;
    uVar915 = (psVar913->x).n[1];
    uVar936 = (psVar913->x).n[2];
    uVar938 = (psVar913->x).n[3];
    psVar919 = (secp256k1_gej *)(auStack_ba8 + 0x30);
    (psVar913->x).n[0] = (long)((secp256k1_fe *)auStack_ba8._48_8_)->n + (psVar913->x).n[0];
    (psVar913->x).n[1] = uVar915 + uStack_b70;
    (psVar913->x).n[2] = uVar936 + uStack_b68;
    (psVar913->x).n[3] = uVar938 + uStack_b60;
    puVar931 = (psVar913->x).n + 4;
    *puVar931 = *puVar931 + uStack_b58;
    (psVar913->x).magnitude = iVar904;
    (psVar913->x).normalized = 0;
    secp256k1_fe_verify(&psVar913->x);
    secp256k1_fe_verify(&psVar913->x);
    secp256k1_fe_verify((secp256k1_fe *)psVar919);
    iVar904 = iStack_b50 + (psVar913->x).magnitude;
    if (0x20 < iVar904) goto LAB_00151530;
    uVar915 = (psVar913->x).n[1];
    uVar936 = (psVar913->x).n[2];
    uVar938 = (psVar913->x).n[3];
    (psVar913->x).n[0] = (long)((secp256k1_fe *)auStack_ba8._48_8_)->n + (psVar913->x).n[0];
    (psVar913->x).n[1] = uVar915 + uStack_b70;
    (psVar913->x).n[2] = uVar936 + uStack_b68;
    (psVar913->x).n[3] = uVar938 + uStack_b60;
    puVar931 = (psVar913->x).n + 4;
    *puVar931 = *puVar931 + uStack_b58;
    (psVar913->x).magnitude = iVar904;
    (psVar913->x).normalized = 0;
    secp256k1_fe_verify(&psVar913->x);
    secp256k1_fe_verify((secp256k1_fe *)(auStack_ba8 + 0x30));
    psVar919 = psVar913;
    secp256k1_fe_verify(&psVar913->x);
    iVar904 = (psVar913->x).magnitude + iStack_b50;
    if (0x20 < iVar904) goto LAB_00151535;
    auStack_ba8._48_8_ = (long)((secp256k1_fe *)auStack_ba8._48_8_)->n + (psVar913->x).n[0];
    uStack_b70 = (psVar913->x).n[1] + uStack_b70;
    uStack_b68 = (psVar913->x).n[2] + uStack_b68;
    uStack_b60 = (psVar913->x).n[3] + uStack_b60;
    uStack_b58 = uStack_b58 + (psVar913->x).n[4];
    iStack_b4c = 0;
    iStack_b50 = iVar904;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_ba8 + 0x30));
    psVar929 = &psVar913->y;
    secp256k1_fe_mul(psVar929,(secp256k1_fe *)(auStack_ba8 + 0x30),&sStack_a78);
    psVar919 = (secp256k1_gej *)auStack_c08;
    psVar924 = psVar919;
    secp256k1_fe_mul((secp256k1_fe *)psVar919,(secp256k1_fe *)psVar919,
                     (secp256k1_fe *)(auStack_b38 + 0x60));
    secp256k1_fe_verify(psVar929);
    secp256k1_fe_verify((secp256k1_fe *)psVar919);
    iVar904 = auStack_c08._40_4_ + (psVar913->y).magnitude;
    if (iVar904 < 0x21) {
      uVar915 = (psVar913->y).n[1];
      uVar936 = (psVar913->y).n[2];
      uVar938 = (psVar913->y).n[3];
      (psVar913->y).n[0] = (psVar913->y).n[0] + auStack_c08._0_8_;
      (psVar913->y).n[1] = uVar915 + auStack_c08._8_8_;
      (psVar913->y).n[2] = uVar936 + auStack_c08._16_8_;
      (psVar913->y).n[3] = uVar938 + auStack_c08._24_8_;
      puVar931 = (psVar913->y).n + 4;
      *puVar931 = *puVar931 + auStack_c08._32_8_;
      (psVar913->y).magnitude = iVar904;
      (psVar913->y).normalized = 0;
      secp256k1_fe_verify(psVar929);
      secp256k1_gej_verify(psVar913);
      return extraout_EAX_07;
    }
  }
  else {
    psVar913->infinity = a->infinity;
    psVar919 = psVar914;
    secp256k1_fe_verify(&psVar914->x);
    if ((psVar914->x).magnitude < 9) {
      uVar917 = (psVar914->x).n[0];
      uVar933 = (psVar914->x).n[1];
      uVar934 = (psVar914->x).n[2];
      uVar935 = (psVar914->x).n[3];
      uVar918 = (psVar914->x).n[4];
      auVar341._8_8_ = 0;
      auVar341._0_8_ = uVar917 * 2;
      auVar693._8_8_ = 0;
      auVar693._0_8_ = uVar935;
      auVar342._8_8_ = 0;
      auVar342._0_8_ = uVar933 * 2;
      auVar694._8_8_ = 0;
      auVar694._0_8_ = uVar934;
      auVar343._8_8_ = 0;
      auVar343._0_8_ = uVar918;
      auVar695._8_8_ = 0;
      auVar695._0_8_ = uVar918;
      uVar909 = SUB168(auVar343 * auVar695,0);
      auVar344._8_8_ = 0;
      auVar344._0_8_ = uVar909 & 0xfffffffffffff;
      auVar1 = auVar342 * auVar694 + auVar341 * auVar693 + auVar344 * ZEXT816(0x1000003d10);
      uVar916 = auVar1._0_8_;
      auStack_b38._48_8_ = uVar916 & 0xfffffffffffff;
      auVar876._8_8_ = 0;
      auVar876._0_8_ = uVar916 >> 0x34 | auVar1._8_8_ << 0xc;
      uVar918 = uVar918 * 2;
      auVar345._8_8_ = 0;
      auVar345._0_8_ = uVar917;
      auVar696._8_8_ = 0;
      auVar696._0_8_ = uVar918;
      auVar346._8_8_ = 0;
      auVar346._0_8_ = uVar933 * 2;
      auVar697._8_8_ = 0;
      auVar697._0_8_ = uVar935;
      auVar347._8_8_ = 0;
      auVar347._0_8_ = uVar934;
      auVar698._8_8_ = 0;
      auVar698._0_8_ = uVar934;
      auVar348._8_8_ = 0;
      auVar348._0_8_ = uVar909 >> 0x34 | SUB168(auVar343 * auVar695,8) << 0xc;
      auVar1 = auVar345 * auVar696 + auVar876 + auVar346 * auVar697 + auVar347 * auVar698 +
               auVar348 * ZEXT816(0x1000003d10);
      uVar909 = auVar1._0_8_;
      auVar877._8_8_ = 0;
      auVar877._0_8_ = uVar909 >> 0x34 | auVar1._8_8_ << 0xc;
      auStack_c08._48_8_ = (uVar909 & 0xfffffffffffff) >> 0x30;
      auStack_b38._144_8_ = uVar909 & 0xffffffffffff;
      auVar349._8_8_ = 0;
      auVar349._0_8_ = uVar917;
      auVar699._8_8_ = 0;
      auVar699._0_8_ = uVar917;
      auVar350._8_8_ = 0;
      auVar350._0_8_ = uVar933;
      auVar700._8_8_ = 0;
      auVar700._0_8_ = uVar918;
      auVar351._8_8_ = 0;
      auVar351._0_8_ = uVar934 * 2;
      auVar701._8_8_ = 0;
      auVar701._0_8_ = uVar935;
      auVar1 = auVar350 * auVar700 + auVar877 + auVar351 * auVar701;
      uVar909 = auVar1._0_8_;
      auVar879._8_8_ = 0;
      auVar879._0_8_ = uVar909 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar702._8_8_ = 0;
      auVar702._0_8_ = (uVar909 & 0xfffffffffffff) << 4 | auStack_c08._48_8_;
      auVar1 = auVar349 * auVar699 + ZEXT816(0x1000003d1) * auVar702;
      uVar909 = auVar1._0_8_;
      auStack_a48._0_8_ = uVar909 & 0xfffffffffffff;
      auVar878._8_8_ = 0;
      auVar878._0_8_ = uVar909 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar352._8_8_ = 0;
      auVar352._0_8_ = uVar917 * 2;
      auVar703._8_8_ = 0;
      auVar703._0_8_ = uVar933;
      auVar353._8_8_ = 0;
      auVar353._0_8_ = uVar934;
      auVar704._8_8_ = 0;
      auVar704._0_8_ = uVar918;
      auVar354._8_8_ = 0;
      auVar354._0_8_ = uVar935;
      auVar705._8_8_ = 0;
      auVar705._0_8_ = uVar935;
      auVar2 = auVar353 * auVar704 + auVar879 + auVar354 * auVar705;
      uVar909 = auVar2._0_8_;
      auVar355._8_8_ = 0;
      auVar355._0_8_ = uVar909 & 0xfffffffffffff;
      auVar1 = auVar352 * auVar703 + auVar878 + auVar355 * ZEXT816(0x1000003d10);
      uVar916 = auVar1._0_8_;
      auVar881._8_8_ = 0;
      auVar881._0_8_ = uVar909 >> 0x34 | auVar2._8_8_ << 0xc;
      auStack_a48._8_8_ = uVar916 & 0xfffffffffffff;
      auVar880._8_8_ = 0;
      auVar880._0_8_ = uVar916 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar356._8_8_ = 0;
      auVar356._0_8_ = uVar917 * 2;
      auVar706._8_8_ = 0;
      auVar706._0_8_ = uVar934;
      auVar357._8_8_ = 0;
      auVar357._0_8_ = uVar933;
      auVar707._8_8_ = 0;
      auVar707._0_8_ = uVar933;
      auVar358._8_8_ = 0;
      auVar358._0_8_ = uVar935;
      auVar708._8_8_ = 0;
      auVar708._0_8_ = uVar918;
      auVar881 = auVar358 * auVar708 + auVar881;
      uVar917 = auVar881._0_8_;
      auVar359._8_8_ = 0;
      auVar359._0_8_ = uVar917 & 0xfffffffffffff;
      auVar1 = auVar356 * auVar706 + auVar880 + auVar357 * auVar707 +
               auVar359 * ZEXT816(0x1000003d10);
      uVar933 = auVar1._0_8_;
      auStack_a48._16_8_ = uVar933 & 0xfffffffffffff;
      auVar882._8_8_ = 0;
      auVar882._0_8_ = (uVar933 >> 0x34 | auVar1._8_8_ << 0xc) + auStack_b38._48_8_;
      auVar360._8_8_ = 0;
      auVar360._0_8_ = uVar917 >> 0x34 | auVar881._8_8_ << 0xc;
      auVar882 = auVar360 * ZEXT816(0x1000003d10) + auVar882;
      uVar917 = auVar882._0_8_;
      auStack_a48._24_8_ = uVar917 & 0xfffffffffffff;
      auStack_a48._32_8_ = (uVar917 >> 0x34 | auVar882._8_8_ << 0xc) + auStack_b38._144_8_;
      auStack_a48._40_4_ = 1;
      auStack_a48._44_4_ = 0;
      secp256k1_fe_verify((secp256k1_fe *)auStack_a48);
      secp256k1_fe_mul((secp256k1_fe *)(auStack_b38 + 0x30),(secp256k1_fe *)auStack_a48,&psVar914->x
                      );
      secp256k1_fe_mul(&psVar913->x,&a->x,(secp256k1_fe *)auStack_a48);
      secp256k1_fe_mul(&psVar913->y,&a->y,(secp256k1_fe *)(auStack_b38 + 0x30));
      (psVar913->z).n[0] = 1;
      (psVar913->z).n[1] = 0;
      (psVar913->z).n[2] = 0;
      (psVar913->z).n[3] = 0;
      (psVar913->z).n[4] = 0;
      (psVar913->z).magnitude = 1;
      (psVar913->z).normalized = 1;
      secp256k1_fe_verify(&psVar913->z);
      return extraout_EAX_06;
    }
    secp256k1_gej_add_zinv_var_cold_1();
LAB_0015150d:
    secp256k1_gej_add_zinv_var_cold_11();
LAB_00151512:
    secp256k1_gej_add_zinv_var_cold_10();
LAB_00151517:
    psVar924 = psVar927;
    secp256k1_gej_add_zinv_var_cold_9();
LAB_0015151c:
    secp256k1_gej_add_zinv_var_cold_8();
LAB_00151521:
    secp256k1_gej_add_zinv_var_cold_7();
LAB_00151526:
    secp256k1_gej_add_zinv_var_cold_6();
LAB_0015152b:
    secp256k1_gej_add_zinv_var_cold_5();
LAB_00151530:
    secp256k1_gej_add_zinv_var_cold_4();
LAB_00151535:
    secp256k1_gej_add_zinv_var_cold_3();
  }
  secp256k1_gej_add_zinv_var_cold_2();
  if (extraout_EDX < 0x20) {
    uVar923 = extraout_EDX + (uint)psVar924;
    if (uVar923 < 0x101) {
      uVar923 = uVar923 - 1 >> 6;
      uVar917 = (ulong)psVar924 >> 6 & 0x3ffffff;
      if (uVar923 == (uint)uVar917) {
        uVar923 = (uint)((psVar919->x).n[uVar923] >> ((byte)psVar924 & 0x3f));
LAB_00151583:
        return uVar923 & ~(uint)(-1L << ((byte)extraout_EDX & 0x3f));
      }
      if ((uint)psVar924 < 0xc0) {
        bVar940 = (byte)psVar924 & 0x3f;
        uVar923 = (uint)((psVar919->x).n[uVar917] >> bVar940) |
                  (uint)((psVar919->x).n[uVar917 + 1] << 0x40 - bVar940);
        goto LAB_00151583;
      }
      goto LAB_0015159f;
    }
  }
  else {
    secp256k1_scalar_get_bits_var_cold_3();
  }
  secp256k1_scalar_get_bits_var_cold_2();
LAB_0015159f:
  secp256k1_scalar_get_bits_var_cold_1();
  *(undefined4 *)(psVar919->z).n = 1;
  (psVar919->x).magnitude = 0;
  (psVar919->x).normalized = 1;
  (psVar919->x).n[0] = 0;
  (psVar919->x).n[1] = 0;
  (psVar919->x).n[2] = 0;
  (psVar919->x).n[3] = 0;
  (psVar919->x).n[4] = 0;
  secp256k1_fe_verify(&psVar919->x);
  (psVar919->y).magnitude = 0;
  (psVar919->y).normalized = 1;
  (psVar919->y).n[0] = 0;
  (psVar919->y).n[1] = 0;
  (psVar919->y).n[2] = 0;
  (psVar919->y).n[3] = 0;
  (psVar919->y).n[4] = 0;
  secp256k1_fe_verify(&psVar919->y);
  secp256k1_ge_verify((secp256k1_ge *)psVar919);
  return extraout_EAX_10;
LAB_0014f667:
  uStack_358._0_4_ = 0x14f66c;
  uStack_358._4_4_ = 0;
  secp256k1_fe_sqrt_cold_15();
LAB_0014f66c:
  uStack_358._0_4_ = 0x14f671;
  uStack_358._4_4_ = 0;
  secp256k1_fe_sqrt_cold_14();
LAB_0014f671:
  uStack_358._0_4_ = 0x14f676;
  uStack_358._4_4_ = 0;
  secp256k1_fe_sqrt_cold_13();
LAB_0014f676:
  uStack_358._0_4_ = 0x14f67b;
  uStack_358._4_4_ = 0;
  secp256k1_fe_sqrt_cold_12();
LAB_0014f67b:
  uStack_358._0_4_ = 0x14f680;
  uStack_358._4_4_ = 0;
  secp256k1_fe_sqrt_cold_11();
LAB_0014f680:
  uStack_358._0_4_ = 0x14f685;
  uStack_358._4_4_ = 0;
  secp256k1_fe_sqrt_cold_10();
LAB_0014f685:
  uStack_358._0_4_ = 0x14f68a;
  uStack_358._4_4_ = 0;
  secp256k1_fe_sqrt_cold_9();
LAB_0014f68a:
  uStack_358._0_4_ = 0x14f68f;
  uStack_358._4_4_ = 0;
  secp256k1_fe_sqrt_cold_8();
LAB_0014f68f:
  uStack_358._0_4_ = 0x14f694;
  uStack_358._4_4_ = 0;
  secp256k1_fe_sqrt_cold_7();
LAB_0014f694:
  unaff_R15 = (secp256k1_gej *)0xfffffffffffff;
  uStack_358._0_4_ = 0x14f699;
  uStack_358._4_4_ = 0;
  secp256k1_fe_sqrt_cold_6();
LAB_0014f699:
  uStack_358._0_4_ = 0x14f69e;
  uStack_358._4_4_ = 0;
  secp256k1_fe_sqrt_cold_20();
  psVar925 = psVar924;
  psVar910 = psVar919;
LAB_0014f69e:
  uStack_358._0_4_ = 0x14f6a3;
  uStack_358._4_4_ = 0;
  secp256k1_fe_sqrt_cold_19();
LAB_0014f6a3:
  uStack_358._0_4_ = 0x14f6a8;
  uStack_358._4_4_ = 0;
  secp256k1_fe_sqrt_cold_18();
  uVar934 = unaff_R12;
  uVar935 = unaff_R13;
LAB_0014f6a8:
  unaff_R13 = uVar935;
  unaff_R12 = uVar934;
  uStack_358._0_4_ = 0x14f6ad;
  uStack_358._4_4_ = 0;
  secp256k1_fe_sqrt_cold_17();
LAB_0014f6ad:
  uStack_358._0_4_ = 0x14f6b2;
  uStack_358._4_4_ = 0;
  secp256k1_fe_sqrt_cold_5();
LAB_0014f6b2:
  psVar924 = (secp256k1_gej *)r;
  uStack_358._0_4_ = 0x14f6b7;
  uStack_358._4_4_ = 0;
  secp256k1_fe_sqrt_cold_4();
LAB_0014f6b7:
  uStack_358._0_4_ = 0x14f6bc;
  uStack_358._4_4_ = 0;
  secp256k1_fe_sqrt_cold_3();
LAB_0014f6bc:
  uStack_358._0_4_ = 0x14f6c1;
  uStack_358._4_4_ = 0;
  secp256k1_fe_sqrt_cold_2();
LAB_0014f6c1:
  uStack_358 = secp256k1_fe_equal;
  secp256k1_fe_sqrt_cold_1();
  psStack_3d0 = (secp256k1_gej *)0x14f6df;
  psVar919 = psVar925;
  auStack_3b0._48_8_ = psVar924;
  auStack_3b0._56_8_ = unaff_R12;
  auStack_3b0._64_8_ = unaff_R13;
  auStack_3b0._72_8_ = unaff_R14;
  auStack_3b0._80_8_ = unaff_R15;
  uStack_358 = (code *)x;
  secp256k1_fe_verify(&psVar910->x);
  psStack_3d0 = (secp256k1_gej *)0x14f6e7;
  psVar924 = psVar925;
  secp256k1_fe_verify(&psVar925->x);
  if ((psVar910->x).magnitude < 2) {
    if (0x1f < (psVar925->x).magnitude) goto LAB_0014f88e;
    psStack_3d0 = (secp256k1_gej *)0x14f704;
    psVar924 = psVar910;
    secp256k1_fe_verify(&psVar910->x);
    if (1 < (psVar910->x).magnitude) goto LAB_0014f893;
    uStack_3b8 = 0x3ffffbfffff0bc - (psVar910->x).n[0];
    unaff_R15 = (secp256k1_gej *)auStack_3b0;
    auStack_3b0._0_8_ = uStack_3b8;
    unaff_R12 = 0x3ffffffffffffc - (psVar910->x).n[1];
    auStack_3b0._8_8_ = unaff_R12;
    x = (secp256k1_fe *)(0x3ffffffffffffc - (psVar910->x).n[2]);
    auStack_3b0._16_8_ = x;
    uStack_3c0 = 0x3ffffffffffffc - (psVar910->x).n[3];
    auStack_3b0._24_8_ = uStack_3c0;
    unaff_R13 = 0x3fffffffffffc - (psVar910->x).n[4];
    auStack_3b0._40_4_ = 2;
    auStack_3b0._44_4_ = 0;
    psStack_3d0 = (secp256k1_gej *)0x14f778;
    auStack_3b0._32_8_ = unaff_R13;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R15);
    psStack_3d0 = (secp256k1_gej *)0x14f780;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R15);
    psStack_3d0 = (secp256k1_gej *)0x14f788;
    psVar924 = psVar925;
    secp256k1_fe_verify(&psVar925->x);
    iVar904 = (psVar925->x).magnitude;
    if (iVar904 < 0x1f) {
      uVar938 = uStack_3b8 + (psVar925->x).n[0];
      auStack_3b0._0_8_ = uVar938;
      uVar936 = unaff_R12 + (psVar925->x).n[1];
      auStack_3b0._8_8_ = uVar936;
      uVar915 = (long)(((secp256k1_gej *)x)->x).n + (psVar925->x).n[2];
      auStack_3b0._16_8_ = uVar915;
      uStack_3c0 = uStack_3c0 + (psVar925->x).n[3];
      auStack_3b0._24_8_ = uStack_3c0;
      uVar918 = unaff_R13 + (psVar925->x).n[4];
      auStack_3b0._44_4_ = 0;
      auStack_3b0._40_4_ = iVar904 + 2;
      psStack_3d0 = (secp256k1_gej *)0x14f7e5;
      auStack_3b0._32_8_ = uVar918;
      secp256k1_fe_verify((secp256k1_fe *)auStack_3b0);
      psStack_3d0 = (secp256k1_gej *)0x14f7ed;
      secp256k1_fe_verify((secp256k1_fe *)auStack_3b0);
      uVar933 = (uVar918 >> 0x30) * 0x1000003d1 + uVar938;
      uVar917 = (uVar933 >> 0x34) + uVar936;
      uVar934 = (uVar917 >> 0x34) + uVar915;
      uVar935 = (uVar934 >> 0x34) + uStack_3c0;
      uVar918 = (uVar935 >> 0x34) + (uVar918 & 0xffffffffffff);
      return (int)(((uVar933 ^ 0x1000003d0) & uVar917 & uVar934 & uVar935 &
                   (uVar918 ^ 0xf000000000000)) == 0xfffffffffffff ||
                  ((uVar917 | uVar933 | uVar934 | uVar935) & 0xfffffffffffff) == 0 && uVar918 == 0);
    }
  }
  else {
    psStack_3d0 = (secp256k1_gej *)0x14f88e;
    secp256k1_fe_equal_cold_4();
LAB_0014f88e:
    psStack_3d0 = (secp256k1_gej *)0x14f893;
    secp256k1_fe_equal_cold_3();
LAB_0014f893:
    psStack_3d0 = (secp256k1_gej *)0x14f898;
    secp256k1_fe_equal_cold_2();
  }
  psStack_3d0 = (secp256k1_gej *)secp256k1_ecmult_strauss_wnaf;
  secp256k1_fe_equal_cold_1();
  auStack_880._0_8_ = 1;
  auStack_880._8_16_ = (undefined1  [16])0x0;
  auStack_868 = (undefined1  [16])0x0;
  uStack_858._0_4_ = 1;
  uStack_858._4_4_ = 1;
  psStack_938 = (secp256k1_gej *)0x14f8f4;
  psVar913 = in_RCX;
  psVar914 = in_R8;
  puStack_908 = in_R9;
  psStack_900 = psVar919;
  psStack_3f8 = psVar925;
  uStack_3f0 = unaff_R12;
  uStack_3e8 = unaff_R13;
  psStack_3e0 = psVar910;
  psStack_3d8 = unaff_R15;
  psStack_3d0 = (secp256k1_gej *)x;
  secp256k1_fe_verify((secp256k1_fe *)auStack_880);
  bStack_921 = true;
  if (extraout_RDX == (secp256k1_gej *)0x0) {
    psStack_920 = (secp256k1_gej *)0x0;
  }
  else {
    psVar919 = (secp256k1_gej *)0x0;
    psStack_920 = (secp256k1_gej *)0x0;
    uVar917 = extraout_RAX;
    psVar925 = extraout_RDX;
    do {
      psVar910 = asStack_600;
      auVar941._0_4_ = -(uint)((int)(in_R8->x).n[2] == 0 && (int)(in_R8->x).n[0] == 0);
      auVar941._4_4_ =
           -(uint)(*(int *)((long)(in_R8->x).n + 0x14) == 0 && *(int *)((long)(in_R8->x).n + 4) == 0
                  );
      auVar941._8_4_ = -(uint)((int)(in_R8->x).n[3] == 0 && (int)(in_R8->x).n[1] == 0);
      auVar941._12_4_ =
           -(uint)(*(int *)((long)(in_R8->x).n + 0x1c) == 0 &&
                  *(int *)((long)(in_R8->x).n + 0xc) == 0);
      uVar923 = movmskps((int)uVar917,auVar941);
      uVar917 = (ulong)(uVar923 ^ 0xf);
      if ((uVar923 ^ 0xf) != 0) {
        psStack_938 = (secp256k1_gej *)0x14f942;
        secp256k1_gej_verify(in_RCX);
        uVar917 = extraout_RAX_00;
        if (in_RCX->infinity == 0) {
          psStack_938 = (secp256k1_gej *)0x14f965;
          secp256k1_scalar_split_lambda
                    (asStack_810,(secp256k1_scalar *)auStack_8e8,(secp256k1_scalar *)in_R8);
          psStack_910 = psVar919;
          psVar919 = (secp256k1_gej *)((long)psVar919 * 0x410);
          psStack_938 = (secp256k1_gej *)0x14f98f;
          iVar904 = secp256k1_ecmult_wnaf
                              ((int *)((long)(psVar919->x).n + (psVar924->x).n[2]),0x81,asStack_810,
                               5);
          uVar915 = (psVar924->x).n[2];
          psVar927 = (secp256k1_gej *)((long)psVar919[3].y.n + uVar915 + 0xc);
          *(int *)((long)psVar919[6].z.n + uVar915 + 0x18) = iVar904;
          a_00 = (secp256k1_gej *)0x81;
          psStack_938 = (secp256k1_gej *)0x14f9b8;
          uVar905 = secp256k1_ecmult_wnaf((int *)psVar927,0x81,(secp256k1_scalar *)auStack_8e8,5);
          uVar915 = (psVar924->x).n[2];
          *(uint *)((long)psVar919[6].z.n + uVar915 + 0x1c) = uVar905;
          uVar923 = *(uint *)((long)psVar919[6].z.n + uVar915 + 0x18);
          psVar913 = (secp256k1_gej *)(ulong)uVar923;
          if (0x81 < (int)uVar923) goto LAB_0014ffb4;
          if (0x81 < (int)uVar905) goto LAB_0014ffb9;
          if ((int)uVar923 <= (int)psStack_920) {
            psVar913 = (secp256k1_gej *)((ulong)psStack_920 & 0xffffffff);
          }
          if ((int)psVar913 < (int)uVar905) {
            psVar913 = (secp256k1_gej *)(ulong)uVar905;
          }
          psStack_938 = (secp256k1_gej *)0x14fa06;
          psStack_920 = psVar913;
          memcpy(psVar910,in_RCX,0x98);
          psVar919 = psStack_910;
          if (psStack_910 != (secp256k1_gej *)0x0) {
            psStack_938 = (secp256k1_gej *)0x14fa26;
            secp256k1_gej_rescale(psVar910,(secp256k1_fe *)auStack_880);
          }
          psVar913 = asStack_600;
          psStack_938 = (secp256k1_gej *)0x14fa52;
          secp256k1_ecmult_odd_multiples_table
                    ((int)psVar919 * 0x340 + (int)(psVar924->x).n[1],
                     (secp256k1_ge *)((long)psVar919 * 0x180 + (psVar924->x).n[0]),
                     (secp256k1_fe *)auStack_880,&psVar913->x,psVar914);
          uVar917 = extraout_RAX_01;
          if (psVar919 != (secp256k1_gej *)0x0) {
            psVar929 = (secp256k1_fe *)((long)psVar919 * 0x180 + (psVar924->x).n[0]);
            psStack_938 = (secp256k1_gej *)0x14fa76;
            secp256k1_fe_mul(psVar929,psVar929,&in_RCX->z);
            uVar917 = extraout_RAX_02;
          }
          psVar919 = (secp256k1_gej *)((long)(psVar919->x).n + 1);
        }
      }
      in_RCX = in_RCX + 1;
      in_R8 = (secp256k1_gej *)((in_R8->x).n + 4);
      psVar925 = (secp256k1_gej *)&psVar925[-1].field_0x97;
    } while (psVar925 != (secp256k1_gej *)0x0);
    if (psVar919 != (secp256k1_gej *)0x0) {
      bStack_921 = psVar919 == (secp256k1_gej *)0x0;
      psStack_938 = (secp256k1_gej *)0x14fab1;
      secp256k1_ge_table_set_globalz
                ((long)psVar919 * 8,(secp256k1_ge *)(psVar924->x).n[1],
                 (secp256k1_fe *)(psVar924->x).n[0]);
      lVar937 = 0;
      psVar910 = (secp256k1_gej *)0x0;
      psVar925 = (secp256k1_gej *)0x0;
      psStack_910 = psVar919;
      do {
        lVar920 = 0;
        psStack_918 = psVar910;
        do {
          psStack_938 = (secp256k1_gej *)0x14fae4;
          secp256k1_fe_mul((secp256k1_fe *)((psVar924->x).n[0] + lVar937 + lVar920),
                           (secp256k1_fe *)((long)(psVar910->x).n + (psVar924->x).n[1]),
                           &secp256k1_const_beta);
          psVar910 = (secp256k1_gej *)((psVar910->z).n + 1);
          lVar920 = lVar920 + 0x30;
        } while (lVar920 != 0x180);
        psVar925 = (secp256k1_gej *)((long)(psVar925->x).n + 1);
        psVar910 = (secp256k1_gej *)(psStack_918[5].y.n + 3);
        lVar937 = lVar937 + 0x180;
      } while (psVar925 != psStack_910);
      goto LAB_0014fb22;
    }
  }
  psStack_910 = (secp256k1_gej *)0x0;
LAB_0014fb22:
  psVar927 = psStack_900;
  if (puStack_908 == (uint64_t *)0x0) {
    puStack_908 = (uint64_t *)0x0;
    lStack_8f8 = 0;
    uVar923 = (uint)psStack_920;
  }
  else {
    auStack_830._0_8_ = *puStack_908;
    auStack_830._8_8_ = puStack_908[1];
    auStack_830._16_16_ = (undefined1  [16])0x0;
    auStack_850 = *(undefined1 (*) [16])(puStack_908 + 2);
    auStack_840 = (undefined1  [16])0x0;
    psStack_938 = (secp256k1_gej *)0x14fb80;
    uVar905 = secp256k1_ecmult_wnaf((int *)asStack_600,0x81,(secp256k1_scalar *)auStack_830,0xf);
    psVar913 = (secp256k1_gej *)0xf;
    psStack_938 = (secp256k1_gej *)0x14fb9c;
    uVar906 = secp256k1_ecmult_wnaf((int *)asStack_810,0x81,(secp256k1_scalar *)auStack_850,0xf);
    uVar923 = (uint)psStack_920;
    if ((int)(uint)psStack_920 < (int)uVar905) {
      uVar923 = uVar905;
    }
    if ((int)uVar923 < (int)uVar906) {
      uVar923 = uVar906;
    }
    lStack_8f8 = (long)(int)uVar906;
    puStack_908 = (uint64_t *)(long)(int)uVar905;
  }
  psStack_938 = (secp256k1_gej *)0x14fbdb;
  secp256k1_gej_set_infinity(psVar927);
  iVar904 = extraout_EAX;
  if (0 < (int)uVar923) {
    psVar919 = (secp256k1_gej *)(ulong)uVar923;
    psStack_920 = (secp256k1_gej *)((long)psVar919 * 4 + -4);
    psStack_8f0 = psVar924;
    do {
      psStack_938 = (secp256k1_gej *)0x14fc04;
      secp256k1_gej_double_var(psVar927,psVar927,(secp256k1_fe *)0x0);
      psStack_918 = psVar919;
      a_00 = psVar919;
      iVar904 = extraout_EAX_00;
      if (bStack_921 == false) {
        in_R8 = (secp256k1_gej *)0x40c;
        in_RCX = (secp256k1_gej *)0x30;
        psVar919 = (secp256k1_gej *)0x0;
        psVar925 = psStack_920;
        psVar910 = psStack_910;
        do {
          psVar913 = (secp256k1_gej *)(psVar924->x).n[2];
          if (((long)a_00 <= (long)*(int *)(&psVar913[-1].field_0x94 + (long)in_R8)) &&
             (uVar923 = *(uint *)((long)(psVar913->x).n + (long)(psVar925->x).n), uVar923 != 0)) {
            if ((uVar923 & 1) == 0) {
              psStack_938 = (secp256k1_gej *)0x14ff91;
              secp256k1_ecmult_strauss_wnaf_cold_6();
LAB_0014ff91:
              psStack_938 = (secp256k1_gej *)0x14ff96;
              secp256k1_ecmult_strauss_wnaf_cold_3();
LAB_0014ff96:
              psStack_938 = (secp256k1_gej *)0x14ff9b;
              secp256k1_ecmult_strauss_wnaf_cold_10();
LAB_0014ff9b:
              psStack_938 = (secp256k1_gej *)0x14ffa0;
              secp256k1_ecmult_strauss_wnaf_cold_5();
LAB_0014ffa0:
              psStack_938 = (secp256k1_gej *)0x14ffa5;
              secp256k1_ecmult_strauss_wnaf_cold_7();
LAB_0014ffa5:
              psStack_938 = (secp256k1_gej *)0x14ffaa;
              secp256k1_ecmult_strauss_wnaf_cold_9();
            }
            else {
              if ((int)uVar923 < -0xf) goto LAB_0014ff91;
              if (0xf < (int)uVar923) goto LAB_0014ff9b;
              uVar915 = (psVar924->x).n[1];
              if (0 < (int)uVar923) {
                puVar926 = (undefined8 *)
                           ((long)&in_RCX->x + uVar915 + (ulong)(uVar923 - 1 >> 1) * 0x68 + -0x30);
                puVar930 = (undefined8 *)auStack_8e8;
                for (lVar937 = 0xd; lVar937 != 0; lVar937 = lVar937 + -1) {
                  *puVar930 = *puVar926;
                  puVar926 = puVar926 + (ulong)bVar940 * -2 + 1;
                  puVar930 = puVar930 + (ulong)bVar940 * -2 + 1;
                }
LAB_0014fd3f:
                psStack_938 = (secp256k1_gej *)0x14fd51;
                psVar927 = psStack_900;
                secp256k1_gej_add_ge_var
                          (psStack_900,psStack_900,(secp256k1_ge *)auStack_8e8,(secp256k1_fe *)0x0);
                psVar913 = (secp256k1_gej *)(psVar924->x).n[2];
                a_00 = psStack_918;
                goto LAB_0014fd5a;
              }
              a_00 = (secp256k1_gej *)
                     ((long)&in_RCX->x + uVar915 + (ulong)(~uVar923 >> 1) * 0x68 + -0x30);
              puVar931 = (uint64_t *)auStack_8e8;
              for (psVar913 = (secp256k1_gej *)0xd; psVar913 != (secp256k1_gej *)0x0;
                  psVar913 = (secp256k1_gej *)&psVar913[-1].field_0x97) {
                *puVar931 = (a_00->x).n[0];
                a_00 = (secp256k1_gej *)((long)a_00 + (ulong)bVar940 * -0x10 + 8);
                puVar931 = puVar931 + (ulong)bVar940 * -2 + 1;
              }
              psVar924 = (secp256k1_gej *)(auStack_8e8 + 0x30);
              psStack_938 = (secp256k1_gej *)0x14fcc3;
              psVar927 = psVar924;
              secp256k1_fe_verify((secp256k1_fe *)psVar924);
              if ((int)uStack_890 < 2) {
                auStack_8e8._48_8_ = 0x3ffffbfffff0bc - auStack_8e8._48_8_;
                uStack_8b0 = 0x3ffffffffffffc - uStack_8b0;
                uStack_8a8 = 0x3ffffffffffffc - uStack_8a8;
                uStack_8a0 = 0x3ffffffffffffc - uStack_8a0;
                uStack_898 = 0x3fffffffffffc - uStack_898;
                uStack_890._0_4_ = 2;
                uStack_890._4_4_ = 0;
                psStack_938 = (secp256k1_gej *)0x14fd35;
                secp256k1_fe_verify((secp256k1_fe *)psVar924);
                psVar924 = psStack_8f0;
                goto LAB_0014fd3f;
              }
            }
            psStack_938 = (secp256k1_gej *)0x14ffaf;
            secp256k1_ecmult_strauss_wnaf_cold_4();
LAB_0014ffaf:
            psStack_938 = (secp256k1_gej *)0x14ffb4;
            secp256k1_ecmult_strauss_wnaf_cold_8();
            goto LAB_0014ffb4;
          }
LAB_0014fd5a:
          if (((long)a_00 <= (long)*(int *)((long)(psVar913->x).n + (long)(in_R8->x).n)) &&
             (uVar923 = *(uint *)((undefined1 *)((long)psVar913[3].y.n + 0xc) + (long)psVar925),
             uVar923 != 0)) {
            if ((uVar923 & 1) == 0) goto LAB_0014ff96;
            if ((int)uVar923 < -0xf) goto LAB_0014ffa0;
            if (0xf < (int)uVar923) goto LAB_0014ffa5;
            uVar915 = (psVar924->x).n[0];
            uVar936 = (psVar924->x).n[1];
            if (0 < (int)uVar923) {
              uVar917 = (ulong)(uVar923 - 1 >> 1);
              psStack_938 = (secp256k1_gej *)0x14fdc4;
              secp256k1_ge_set_xy((secp256k1_ge *)auStack_8e8,
                                  (secp256k1_fe *)((long)(&psVar919->x)[uVar917].n + uVar915),
                                  (secp256k1_fe *)((long)&in_RCX->x + uVar917 * 0x68 + uVar936));
LAB_0014fe73:
              psVar913 = (secp256k1_gej *)0x0;
              psStack_938 = (secp256k1_gej *)0x14fe85;
              psVar927 = psStack_900;
              secp256k1_gej_add_ge_var
                        (psStack_900,psStack_900,(secp256k1_ge *)auStack_8e8,(secp256k1_fe *)0x0);
              a_00 = psStack_918;
              psVar924 = psStack_8f0;
              goto LAB_0014fe8f;
            }
            psVar913 = (secp256k1_gej *)((ulong)(~uVar923 >> 1) * 0x30);
            a_00 = (secp256k1_gej *)((long)(psVar913->x).n + (long)(psVar919->x).n + uVar915);
            psStack_938 = (secp256k1_gej *)0x14fdef;
            secp256k1_ge_set_xy((secp256k1_ge *)auStack_8e8,(secp256k1_fe *)a_00,
                                (secp256k1_fe *)
                                ((long)&in_RCX->x + (ulong)(~uVar923 >> 1) * 0x68 + uVar936));
            psVar924 = (secp256k1_gej *)(auStack_8e8 + 0x30);
            psStack_938 = (secp256k1_gej *)0x14fdfc;
            psVar927 = psVar924;
            secp256k1_fe_verify((secp256k1_fe *)psVar924);
            if ((int)uStack_890 < 2) {
              auStack_8e8._48_8_ = 0x3ffffbfffff0bc - auStack_8e8._48_8_;
              uStack_8b0 = 0x3ffffffffffffc - uStack_8b0;
              uStack_8a8 = 0x3ffffffffffffc - uStack_8a8;
              uStack_8a0 = 0x3ffffffffffffc - uStack_8a0;
              uStack_898 = 0x3fffffffffffc - uStack_898;
              uStack_890._0_4_ = 2;
              uStack_890._4_4_ = 0;
              psStack_938 = (secp256k1_gej *)0x14fe6e;
              secp256k1_fe_verify((secp256k1_fe *)psVar924);
              goto LAB_0014fe73;
            }
            goto LAB_0014ffaf;
          }
LAB_0014fe8f:
          iVar904 = 0x410;
          psVar925 = (secp256k1_gej *)(psVar925[6].z.n + 4);
          in_R8 = (secp256k1_gej *)(in_R8[6].z.n + 4);
          in_RCX = (secp256k1_gej *)(in_RCX[5].y.n + 3);
          psVar919 = (secp256k1_gej *)(psVar919[2].y.n + 4);
          psVar910 = (secp256k1_gej *)&psVar910[-1].field_0x97;
        } while (psVar910 != (secp256k1_gej *)0x0);
      }
      psVar927 = psStack_900;
      psVar919 = (secp256k1_gej *)&a_00[-1].field_0x97;
      if (((long)a_00 <= (long)puStack_908) &&
         (iVar908 = *(int *)((long)asStack_600[0].x.n + (long)psVar919 * 4), iVar908 != 0)) {
        psStack_938 = (secp256k1_gej *)0x14fee3;
        secp256k1_ecmult_table_get_ge_storage
                  ((secp256k1_ge *)auStack_8e8,secp256k1_pre_g,iVar908,(int)psVar913);
        psVar913 = (secp256k1_gej *)auStack_880;
        psStack_938 = (secp256k1_gej *)0x14fefc;
        secp256k1_gej_add_zinv_var
                  (psVar927,psVar927,(secp256k1_ge *)auStack_8e8,(secp256k1_fe *)psVar913);
        a_00 = psStack_918;
        iVar904 = extraout_EAX_01;
      }
      if (((long)a_00 <= lStack_8f8) &&
         (iVar908 = *(int *)((long)asStack_810[0].d + (long)psVar919 * 4), iVar908 != 0)) {
        psStack_938 = (secp256k1_gej *)0x14ff2a;
        secp256k1_ecmult_table_get_ge_storage
                  ((secp256k1_ge *)auStack_8e8,secp256k1_pre_g_128,iVar908,(int)psVar913);
        psVar913 = (secp256k1_gej *)auStack_880;
        psStack_938 = (secp256k1_gej *)0x14ff43;
        secp256k1_gej_add_zinv_var
                  (psVar927,psVar927,(secp256k1_ge *)auStack_8e8,(secp256k1_fe *)psVar913);
        a_00 = psStack_918;
        iVar904 = extraout_EAX_02;
      }
      psStack_920 = (secp256k1_gej *)&psStack_920[-1].field_0x94;
    } while (1 < (long)a_00);
  }
  if (psVar927->infinity == 0) {
    psStack_938 = (secp256k1_gej *)0x14ff7a;
    secp256k1_fe_mul(&psVar927->z,&psVar927->z,(secp256k1_fe *)auStack_880);
    iVar904 = extraout_EAX_03;
  }
  return iVar904;
}

Assistant:

static int secp256k1_ge_set_xquad(secp256k1_ge *r, const secp256k1_fe *x) {
    secp256k1_fe x2, x3;
    secp256k1_fe_verify(x);
    r->x = *x;
    secp256k1_fe_sqr(&x2, x);
    secp256k1_fe_mul(&x3, x, &x2);
    r->infinity = 0;
    secp256k1_fe_add_int(&x3, SECP256K1_B);
    return secp256k1_fe_sqrt(&r->y, &x3);
}